

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [12];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  uint uVar126;
  int iVar127;
  RTCIntersectArguments *pRVar128;
  ulong uVar129;
  uint uVar130;
  ulong uVar131;
  long lVar132;
  long lVar133;
  ulong uVar134;
  long lVar135;
  float fVar136;
  float fVar149;
  float fVar150;
  vint4 bi_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar151;
  float fVar155;
  float fVar156;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar157;
  vint4 bi_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar176;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar177;
  float fVar188;
  float fVar190;
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar192;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar189;
  float fVar191;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [32];
  float fVar195;
  float fVar196;
  float fVar211;
  float fVar214;
  vint4 ai_1;
  undefined1 auVar197 [16];
  float fVar215;
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar213;
  float fVar217;
  undefined1 auVar202 [16];
  undefined1 auVar199 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar212;
  float fVar216;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  float fVar222;
  float fVar233;
  float fVar235;
  vint4 ai_2;
  undefined1 auVar224 [16];
  float fVar237;
  undefined1 auVar225 [16];
  float fVar223;
  undefined1 auVar227 [16];
  undefined1 auVar243 [16];
  undefined1 auVar226 [16];
  float fVar234;
  float fVar236;
  undefined1 auVar228 [32];
  float fVar238;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar239;
  float fVar240;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar241;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [16];
  float fVar253;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar254;
  float fVar255;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar263;
  undefined1 auVar262 [32];
  float fVar264;
  float fVar265;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  vint4 ai;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar283;
  undefined4 uVar284;
  float fVar291;
  float fVar294;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  float fVar292;
  undefined1 auVar289 [32];
  float fVar293;
  float fVar295;
  undefined1 auVar290 [32];
  float fVar296;
  float fVar303;
  float fVar304;
  undefined1 auVar297 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  float fVar309;
  undefined1 auVar310 [16];
  float fVar313;
  float fVar314;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar315;
  float fVar319;
  float fVar320;
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar318 [64];
  float fVar325;
  float fVar331;
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar335;
  float fVar336;
  undefined1 auVar332 [16];
  float fVar337;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar340;
  float fVar341;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_86d;
  uint local_860;
  undefined4 uStack_85c;
  undefined8 local_840;
  undefined8 uStack_838;
  ulong local_828;
  undefined1 local_820 [8];
  undefined8 uStack_818;
  undefined1 auStack_810 [8];
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 (*local_6a0) [16];
  Precalculations *local_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined1 auStack_650 [8];
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  RTCHitN local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar166 [24];
  
  PVar12 = prim[1];
  uVar129 = (ulong)(byte)PVar12;
  lVar20 = uVar129 * 0x25;
  auVar243 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar243 = vinsertps_avx(auVar243,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar181 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar181 = vinsertps_avx(auVar181,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar309 = *(float *)(prim + lVar20 + 0x12);
  auVar243 = vsubps_avx(auVar243,*(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar158._0_4_ = fVar309 * auVar243._0_4_;
  auVar158._4_4_ = fVar309 * auVar243._4_4_;
  auVar158._8_4_ = fVar309 * auVar243._8_4_;
  auVar158._12_4_ = fVar309 * auVar243._12_4_;
  auVar266._0_4_ = fVar309 * auVar181._0_4_;
  auVar266._4_4_ = fVar309 * auVar181._4_4_;
  auVar266._8_4_ = fVar309 * auVar181._8_4_;
  auVar266._12_4_ = fVar309 * auVar181._12_4_;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 4 + 6)));
  auVar243 = vcvtdq2ps_avx(auVar243);
  auVar181 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 5 + 6)));
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 6 + 6)));
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0xf + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar129 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vshufps_avx(auVar266,auVar266,0);
  auVar28 = vshufps_avx(auVar266,auVar266,0x55);
  auVar29 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar309 = auVar29._0_4_;
  fVar175 = auVar29._4_4_;
  fVar192 = auVar29._8_4_;
  fVar254 = auVar29._12_4_;
  fVar222 = auVar28._0_4_;
  fVar233 = auVar28._4_4_;
  fVar235 = auVar28._8_4_;
  fVar237 = auVar28._12_4_;
  fVar196 = auVar27._0_4_;
  fVar211 = auVar27._4_4_;
  fVar214 = auVar27._8_4_;
  fVar215 = auVar27._12_4_;
  auVar326._0_4_ = fVar196 * auVar243._0_4_ + fVar222 * auVar181._0_4_ + fVar309 * auVar227._0_4_;
  auVar326._4_4_ = fVar211 * auVar243._4_4_ + fVar233 * auVar181._4_4_ + fVar175 * auVar227._4_4_;
  auVar326._8_4_ = fVar214 * auVar243._8_4_ + fVar235 * auVar181._8_4_ + fVar192 * auVar227._8_4_;
  auVar326._12_4_ =
       fVar215 * auVar243._12_4_ + fVar237 * auVar181._12_4_ + fVar254 * auVar227._12_4_;
  auVar332._0_4_ = fVar196 * auVar202._0_4_ + fVar222 * auVar200._0_4_ + auVar23._0_4_ * fVar309;
  auVar332._4_4_ = fVar211 * auVar202._4_4_ + fVar233 * auVar200._4_4_ + auVar23._4_4_ * fVar175;
  auVar332._8_4_ = fVar214 * auVar202._8_4_ + fVar235 * auVar200._8_4_ + auVar23._8_4_ * fVar192;
  auVar332._12_4_ = fVar215 * auVar202._12_4_ + fVar237 * auVar200._12_4_ + auVar23._12_4_ * fVar254
  ;
  auVar267._0_4_ = fVar196 * auVar24._0_4_ + fVar222 * auVar25._0_4_ + auVar26._0_4_ * fVar309;
  auVar267._4_4_ = fVar211 * auVar24._4_4_ + fVar233 * auVar25._4_4_ + auVar26._4_4_ * fVar175;
  auVar267._8_4_ = fVar214 * auVar24._8_4_ + fVar235 * auVar25._8_4_ + auVar26._8_4_ * fVar192;
  auVar267._12_4_ = fVar215 * auVar24._12_4_ + fVar237 * auVar25._12_4_ + auVar26._12_4_ * fVar254;
  auVar27 = vshufps_avx(auVar158,auVar158,0);
  auVar28 = vshufps_avx(auVar158,auVar158,0x55);
  auVar29 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar309 = auVar29._0_4_;
  fVar175 = auVar29._4_4_;
  fVar192 = auVar29._8_4_;
  fVar254 = auVar29._12_4_;
  fVar222 = auVar28._0_4_;
  fVar233 = auVar28._4_4_;
  fVar235 = auVar28._8_4_;
  fVar237 = auVar28._12_4_;
  fVar196 = auVar27._0_4_;
  fVar211 = auVar27._4_4_;
  fVar214 = auVar27._8_4_;
  fVar215 = auVar27._12_4_;
  auVar178._0_4_ = fVar196 * auVar243._0_4_ + fVar222 * auVar181._0_4_ + fVar309 * auVar227._0_4_;
  auVar178._4_4_ = fVar211 * auVar243._4_4_ + fVar233 * auVar181._4_4_ + fVar175 * auVar227._4_4_;
  auVar178._8_4_ = fVar214 * auVar243._8_4_ + fVar235 * auVar181._8_4_ + fVar192 * auVar227._8_4_;
  auVar178._12_4_ =
       fVar215 * auVar243._12_4_ + fVar237 * auVar181._12_4_ + fVar254 * auVar227._12_4_;
  auVar159._0_4_ = fVar196 * auVar202._0_4_ + auVar23._0_4_ * fVar309 + fVar222 * auVar200._0_4_;
  auVar159._4_4_ = fVar211 * auVar202._4_4_ + auVar23._4_4_ * fVar175 + fVar233 * auVar200._4_4_;
  auVar159._8_4_ = fVar214 * auVar202._8_4_ + auVar23._8_4_ * fVar192 + fVar235 * auVar200._8_4_;
  auVar159._12_4_ = fVar215 * auVar202._12_4_ + auVar23._12_4_ * fVar254 + fVar237 * auVar200._12_4_
  ;
  auVar137._0_4_ = fVar196 * auVar24._0_4_ + fVar222 * auVar25._0_4_ + auVar26._0_4_ * fVar309;
  auVar137._4_4_ = fVar211 * auVar24._4_4_ + fVar233 * auVar25._4_4_ + auVar26._4_4_ * fVar175;
  auVar137._8_4_ = fVar214 * auVar24._8_4_ + fVar235 * auVar25._8_4_ + auVar26._8_4_ * fVar192;
  auVar137._12_4_ = fVar215 * auVar24._12_4_ + fVar237 * auVar25._12_4_ + auVar26._12_4_ * fVar254;
  auVar256._8_4_ = 0x7fffffff;
  auVar256._0_8_ = 0x7fffffff7fffffff;
  auVar256._12_4_ = 0x7fffffff;
  auVar243 = vandps_avx(auVar326,auVar256);
  auVar224._8_4_ = 0x219392ef;
  auVar224._0_8_ = 0x219392ef219392ef;
  auVar224._12_4_ = 0x219392ef;
  auVar243 = vcmpps_avx(auVar243,auVar224,1);
  auVar181 = vblendvps_avx(auVar326,auVar224,auVar243);
  auVar243 = vandps_avx(auVar332,auVar256);
  auVar243 = vcmpps_avx(auVar243,auVar224,1);
  auVar227 = vblendvps_avx(auVar332,auVar224,auVar243);
  auVar243 = vandps_avx(auVar267,auVar256);
  auVar243 = vcmpps_avx(auVar243,auVar224,1);
  auVar243 = vblendvps_avx(auVar267,auVar224,auVar243);
  auVar202 = vrcpps_avx(auVar181);
  fVar196 = auVar202._0_4_;
  auVar197._0_4_ = fVar196 * auVar181._0_4_;
  fVar211 = auVar202._4_4_;
  auVar197._4_4_ = fVar211 * auVar181._4_4_;
  fVar214 = auVar202._8_4_;
  auVar197._8_4_ = fVar214 * auVar181._8_4_;
  fVar215 = auVar202._12_4_;
  auVar197._12_4_ = fVar215 * auVar181._12_4_;
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar181 = vsubps_avx(auVar268,auVar197);
  fVar196 = fVar196 + fVar196 * auVar181._0_4_;
  fVar211 = fVar211 + fVar211 * auVar181._4_4_;
  fVar214 = fVar214 + fVar214 * auVar181._8_4_;
  fVar215 = fVar215 + fVar215 * auVar181._12_4_;
  auVar181 = vrcpps_avx(auVar227);
  fVar222 = auVar181._0_4_;
  auVar242._0_4_ = fVar222 * auVar227._0_4_;
  fVar233 = auVar181._4_4_;
  auVar242._4_4_ = fVar233 * auVar227._4_4_;
  fVar235 = auVar181._8_4_;
  auVar242._8_4_ = fVar235 * auVar227._8_4_;
  fVar237 = auVar181._12_4_;
  auVar242._12_4_ = fVar237 * auVar227._12_4_;
  auVar181 = vsubps_avx(auVar268,auVar242);
  fVar222 = fVar222 + fVar222 * auVar181._0_4_;
  fVar233 = fVar233 + fVar233 * auVar181._4_4_;
  fVar235 = fVar235 + fVar235 * auVar181._8_4_;
  fVar237 = fVar237 + fVar237 * auVar181._12_4_;
  auVar181 = vrcpps_avx(auVar243);
  fVar241 = auVar181._0_4_;
  auVar257._0_4_ = fVar241 * auVar243._0_4_;
  fVar251 = auVar181._4_4_;
  auVar257._4_4_ = fVar251 * auVar243._4_4_;
  fVar252 = auVar181._8_4_;
  auVar257._8_4_ = fVar252 * auVar243._8_4_;
  fVar253 = auVar181._12_4_;
  auVar257._12_4_ = fVar253 * auVar243._12_4_;
  auVar243 = vsubps_avx(auVar268,auVar257);
  fVar241 = fVar241 + fVar241 * auVar243._0_4_;
  fVar251 = fVar251 + fVar251 * auVar243._4_4_;
  fVar252 = fVar252 + fVar252 * auVar243._8_4_;
  fVar253 = fVar253 + fVar253 * auVar243._12_4_;
  auVar243 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar20 + 0x16)) *
                           *(float *)(prim + lVar20 + 0x1a)));
  auVar227 = vshufps_avx(auVar243,auVar243,0);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar129 * 7 + 6);
  auVar243 = vpmovsxwd_avx(auVar243);
  auVar243 = vcvtdq2ps_avx(auVar243);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar129 * 0xb + 6);
  auVar181 = vpmovsxwd_avx(auVar181);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar243);
  fVar309 = auVar227._0_4_;
  fVar175 = auVar227._4_4_;
  fVar192 = auVar227._8_4_;
  fVar254 = auVar227._12_4_;
  auVar269._0_4_ = auVar181._0_4_ * fVar309 + auVar243._0_4_;
  auVar269._4_4_ = auVar181._4_4_ * fVar175 + auVar243._4_4_;
  auVar269._8_4_ = auVar181._8_4_ * fVar192 + auVar243._8_4_;
  auVar269._12_4_ = auVar181._12_4_ * fVar254 + auVar243._12_4_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar129 * 9 + 6);
  auVar243 = vpmovsxwd_avx(auVar227);
  auVar243 = vcvtdq2ps_avx(auVar243);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar129 * 0xd + 6);
  auVar181 = vpmovsxwd_avx(auVar202);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar243);
  auVar285._0_4_ = auVar181._0_4_ * fVar309 + auVar243._0_4_;
  auVar285._4_4_ = auVar181._4_4_ * fVar175 + auVar243._4_4_;
  auVar285._8_4_ = auVar181._8_4_ * fVar192 + auVar243._8_4_;
  auVar285._12_4_ = auVar181._12_4_ * fVar254 + auVar243._12_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar129 * 0x12 + 6);
  auVar243 = vpmovsxwd_avx(auVar200);
  auVar243 = vcvtdq2ps_avx(auVar243);
  uVar131 = (ulong)(uint)((int)(uVar129 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar129 * 2 + uVar131 + 6);
  auVar181 = vpmovsxwd_avx(auVar23);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar243);
  auVar297._0_4_ = auVar181._0_4_ * fVar309 + auVar243._0_4_;
  auVar297._4_4_ = auVar181._4_4_ * fVar175 + auVar243._4_4_;
  auVar297._8_4_ = auVar181._8_4_ * fVar192 + auVar243._8_4_;
  auVar297._12_4_ = auVar181._12_4_ * fVar254 + auVar243._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar131 + 6);
  auVar243 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar129 * 0x18 + 6);
  auVar181 = vpmovsxwd_avx(auVar25);
  auVar243 = vcvtdq2ps_avx(auVar243);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar181 = vsubps_avx(auVar181,auVar243);
  auVar310._0_4_ = auVar181._0_4_ * fVar309 + auVar243._0_4_;
  auVar310._4_4_ = auVar181._4_4_ * fVar175 + auVar243._4_4_;
  auVar310._8_4_ = auVar181._8_4_ * fVar192 + auVar243._8_4_;
  auVar310._12_4_ = auVar181._12_4_ * fVar254 + auVar243._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar129 * 0x1d + 6);
  auVar243 = vpmovsxwd_avx(auVar26);
  auVar243 = vcvtdq2ps_avx(auVar243);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar129 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar181 = vpmovsxwd_avx(auVar27);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar227 = vsubps_avx(auVar181,auVar243);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar129) + 6);
  auVar181 = vpmovsxwd_avx(auVar28);
  auVar316._0_4_ = auVar227._0_4_ * fVar309 + auVar243._0_4_;
  auVar316._4_4_ = auVar227._4_4_ * fVar175 + auVar243._4_4_;
  auVar316._8_4_ = auVar227._8_4_ * fVar192 + auVar243._8_4_;
  auVar316._12_4_ = auVar227._12_4_ * fVar254 + auVar243._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar129 * 0x23 + 6);
  auVar227 = vpmovsxwd_avx(auVar29);
  auVar243 = vcvtdq2ps_avx(auVar181);
  auVar181 = vcvtdq2ps_avx(auVar227);
  auVar181 = vsubps_avx(auVar181,auVar243);
  auVar258._0_4_ = auVar243._0_4_ + auVar181._0_4_ * fVar309;
  auVar258._4_4_ = auVar243._4_4_ + auVar181._4_4_ * fVar175;
  auVar258._8_4_ = auVar243._8_4_ + auVar181._8_4_ * fVar192;
  auVar258._12_4_ = auVar243._12_4_ + auVar181._12_4_ * fVar254;
  auVar243 = vsubps_avx(auVar269,auVar178);
  auVar270._0_4_ = fVar196 * auVar243._0_4_;
  auVar270._4_4_ = fVar211 * auVar243._4_4_;
  auVar270._8_4_ = fVar214 * auVar243._8_4_;
  auVar270._12_4_ = fVar215 * auVar243._12_4_;
  auVar243 = vsubps_avx(auVar285,auVar178);
  auVar179._0_4_ = fVar196 * auVar243._0_4_;
  auVar179._4_4_ = fVar211 * auVar243._4_4_;
  auVar179._8_4_ = fVar214 * auVar243._8_4_;
  auVar179._12_4_ = fVar215 * auVar243._12_4_;
  auVar243 = vsubps_avx(auVar297,auVar159);
  auVar198._0_4_ = fVar222 * auVar243._0_4_;
  auVar198._4_4_ = fVar233 * auVar243._4_4_;
  auVar198._8_4_ = fVar235 * auVar243._8_4_;
  auVar198._12_4_ = fVar237 * auVar243._12_4_;
  auVar243 = vsubps_avx(auVar310,auVar159);
  auVar160._0_4_ = fVar222 * auVar243._0_4_;
  auVar160._4_4_ = fVar233 * auVar243._4_4_;
  auVar160._8_4_ = fVar235 * auVar243._8_4_;
  auVar160._12_4_ = fVar237 * auVar243._12_4_;
  auVar243 = vsubps_avx(auVar316,auVar137);
  auVar225._0_4_ = fVar241 * auVar243._0_4_;
  auVar225._4_4_ = fVar251 * auVar243._4_4_;
  auVar225._8_4_ = fVar252 * auVar243._8_4_;
  auVar225._12_4_ = fVar253 * auVar243._12_4_;
  auVar243 = vsubps_avx(auVar258,auVar137);
  auVar138._0_4_ = fVar241 * auVar243._0_4_;
  auVar138._4_4_ = fVar251 * auVar243._4_4_;
  auVar138._8_4_ = fVar252 * auVar243._8_4_;
  auVar138._12_4_ = fVar253 * auVar243._12_4_;
  auVar243 = vpminsd_avx(auVar270,auVar179);
  auVar181 = vpminsd_avx(auVar198,auVar160);
  auVar243 = vmaxps_avx(auVar243,auVar181);
  auVar181 = vpminsd_avx(auVar225,auVar138);
  uVar284 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar286._4_4_ = uVar284;
  auVar286._0_4_ = uVar284;
  auVar286._8_4_ = uVar284;
  auVar286._12_4_ = uVar284;
  auVar181 = vmaxps_avx(auVar181,auVar286);
  auVar243 = vmaxps_avx(auVar243,auVar181);
  local_310._0_4_ = auVar243._0_4_ * 0.99999964;
  local_310._4_4_ = auVar243._4_4_ * 0.99999964;
  local_310._8_4_ = auVar243._8_4_ * 0.99999964;
  local_310._12_4_ = auVar243._12_4_ * 0.99999964;
  auVar243 = vpmaxsd_avx(auVar270,auVar179);
  auVar181 = vpmaxsd_avx(auVar198,auVar160);
  auVar243 = vminps_avx(auVar243,auVar181);
  auVar181 = vpmaxsd_avx(auVar225,auVar138);
  uVar284 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar180._4_4_ = uVar284;
  auVar180._0_4_ = uVar284;
  auVar180._8_4_ = uVar284;
  auVar180._12_4_ = uVar284;
  auVar181 = vminps_avx(auVar181,auVar180);
  auVar243 = vminps_avx(auVar243,auVar181);
  auVar139._0_4_ = auVar243._0_4_ * 1.0000004;
  auVar139._4_4_ = auVar243._4_4_ * 1.0000004;
  auVar139._8_4_ = auVar243._8_4_ * 1.0000004;
  auVar139._12_4_ = auVar243._12_4_ * 1.0000004;
  auVar243 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar181 = vpcmpgtd_avx(auVar243,_DAT_01ff0cf0);
  auVar243 = vcmpps_avx(local_310,auVar139,2);
  auVar243 = vandps_avx(auVar243,auVar181);
  uVar126 = vmovmskps_avx(auVar243);
  local_86d = uVar126 != 0;
  if (local_86d) {
    uVar126 = uVar126 & 0xff;
    local_520 = mm_lookupmask_ps._16_8_;
    uStack_518 = mm_lookupmask_ps._24_8_;
    uStack_510 = mm_lookupmask_ps._16_8_;
    uStack_508 = mm_lookupmask_ps._24_8_;
    local_530 = pre->ray_space + k;
    local_6a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_698 = pre;
    local_528 = prim;
    do {
      lVar20 = 0;
      if (uVar126 != 0) {
        for (; (uVar126 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar13 = *(uint *)(local_528 + 2);
      local_828 = (ulong)uVar13;
      uVar14 = *(uint *)(local_528 + lVar20 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[local_828].ptr;
      local_5d0._0_8_ = CONCAT44(0,uVar14);
      uVar131 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,uVar14) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar309 = (pGVar16->time_range).lower;
      fVar309 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar309) /
                ((pGVar16->time_range).upper - fVar309));
      auVar243 = vroundss_avx(ZEXT416((uint)fVar309),ZEXT416((uint)fVar309),9);
      auVar243 = vminss_avx(auVar243,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar243 = vmaxss_avx(ZEXT816(0) << 0x20,auVar243);
      fVar309 = fVar309 - auVar243._0_4_;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar132 = (long)(int)auVar243._0_4_ * 0x38;
      lVar20 = *(long *)(_Var17 + 0x10 + lVar132);
      uVar129 = uVar131 + 3;
      lVar135 = *(long *)(_Var17 + 0x38 + lVar132);
      lVar18 = *(long *)(_Var17 + 0x48 + lVar132);
      auVar243 = vshufps_avx(ZEXT416((uint)fVar309),ZEXT416((uint)fVar309),0);
      pfVar1 = (float *)(lVar135 + uVar131 * lVar18);
      fVar175 = auVar243._0_4_;
      fVar192 = auVar243._4_4_;
      fVar254 = auVar243._8_4_;
      fVar196 = auVar243._12_4_;
      pfVar2 = (float *)(lVar135 + (uVar131 + 1) * lVar18);
      lVar133 = (uVar131 + 2) * lVar18;
      pfVar3 = (float *)(lVar135 + lVar133);
      pfVar4 = (float *)(lVar135 + lVar18 * uVar129);
      lVar135 = *(long *)(_Var17 + lVar132);
      auVar243 = vshufps_avx(ZEXT416((uint)(1.0 - fVar309)),ZEXT416((uint)(1.0 - fVar309)),0);
      pfVar5 = (float *)(lVar135 + lVar20 * uVar131);
      fVar309 = auVar243._0_4_;
      fVar211 = auVar243._4_4_;
      fVar214 = auVar243._8_4_;
      fVar215 = auVar243._12_4_;
      pfVar6 = (float *)(lVar135 + lVar20 * (uVar131 + 1));
      pfVar7 = (float *)(lVar135 + lVar20 * (uVar131 + 2));
      pfVar8 = (float *)(lVar135 + lVar20 * uVar129);
      uVar15 = (uint)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar15 * 0x44;
      local_6b0 = (undefined1  [8])
                  CONCAT44(fVar192 * pfVar1[1] + fVar211 * pfVar5[1],
                           fVar175 * *pfVar1 + fVar309 * *pfVar5);
      uStack_6a8._0_4_ = fVar254 * pfVar1[2] + fVar214 * pfVar5[2];
      uStack_6a8._4_4_ = fVar196 * pfVar1[3] + fVar215 * pfVar5[3];
      local_540._0_8_ =
           CONCAT44(fVar211 * pfVar6[1] + fVar192 * pfVar2[1],fVar309 * *pfVar6 + fVar175 * *pfVar2)
      ;
      local_540._8_4_ = fVar214 * pfVar6[2] + fVar254 * pfVar2[2];
      local_540._12_4_ = fVar215 * pfVar6[3] + fVar196 * pfVar2[3];
      local_4d0._0_8_ =
           CONCAT44(fVar211 * pfVar7[1] + fVar192 * pfVar3[1],fVar309 * *pfVar7 + fVar175 * *pfVar3)
      ;
      local_4d0._8_4_ = fVar214 * pfVar7[2] + fVar254 * pfVar3[2];
      local_4d0._12_4_ = fVar215 * pfVar7[3] + fVar196 * pfVar3[3];
      local_4e0._0_8_ =
           CONCAT44(fVar211 * pfVar8[1] + fVar192 * pfVar4[1],fVar309 * *pfVar8 + fVar175 * *pfVar4)
      ;
      local_4e0._8_4_ = fVar214 * pfVar8[2] + fVar254 * pfVar4[2];
      local_4e0._12_4_ = fVar215 * pfVar8[3] + fVar196 * pfVar4[3];
      auVar243 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar202 = vinsertps_avx(auVar243,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar227 = vsubps_avx(_local_6b0,auVar202);
      auVar243 = vshufps_avx(auVar227,auVar227,0);
      auVar181 = vshufps_avx(auVar227,auVar227,0x55);
      auVar227 = vshufps_avx(auVar227,auVar227,0xaa);
      fVar309 = (local_530->vx).field_0.m128[0];
      fVar175 = (local_530->vx).field_0.m128[1];
      fVar192 = (local_530->vx).field_0.m128[2];
      fVar254 = (local_530->vx).field_0.m128[3];
      fVar196 = (local_530->vy).field_0.m128[0];
      fVar211 = (local_530->vy).field_0.m128[1];
      fVar214 = (local_530->vy).field_0.m128[2];
      fVar215 = (local_530->vy).field_0.m128[3];
      fVar222 = (local_530->vz).field_0.m128[0];
      fVar233 = (local_530->vz).field_0.m128[1];
      fVar235 = (local_530->vz).field_0.m128[2];
      fVar237 = (local_530->vz).field_0.m128[3];
      auVar199._0_8_ =
           CONCAT44(auVar243._4_4_ * fVar175 + auVar181._4_4_ * fVar211 + fVar233 * auVar227._4_4_,
                    auVar243._0_4_ * fVar309 + auVar181._0_4_ * fVar196 + fVar222 * auVar227._0_4_);
      auVar199._8_4_ =
           auVar243._8_4_ * fVar192 + auVar181._8_4_ * fVar214 + fVar235 * auVar227._8_4_;
      auVar199._12_4_ =
           auVar243._12_4_ * fVar254 + auVar181._12_4_ * fVar215 + fVar237 * auVar227._12_4_;
      auVar243 = vblendps_avx(auVar199,_local_6b0,8);
      auVar200 = vsubps_avx(local_540,auVar202);
      auVar181 = vshufps_avx(auVar200,auVar200,0);
      auVar227 = vshufps_avx(auVar200,auVar200,0x55);
      auVar200 = vshufps_avx(auVar200,auVar200,0xaa);
      auVar271._0_4_ =
           auVar181._0_4_ * fVar309 + auVar227._0_4_ * fVar196 + fVar222 * auVar200._0_4_;
      auVar271._4_4_ =
           auVar181._4_4_ * fVar175 + auVar227._4_4_ * fVar211 + fVar233 * auVar200._4_4_;
      auVar271._8_4_ =
           auVar181._8_4_ * fVar192 + auVar227._8_4_ * fVar214 + fVar235 * auVar200._8_4_;
      auVar271._12_4_ =
           auVar181._12_4_ * fVar254 + auVar227._12_4_ * fVar215 + fVar237 * auVar200._12_4_;
      auVar181 = vblendps_avx(auVar271,local_540,8);
      auVar23 = vsubps_avx(local_4d0,auVar202);
      auVar227 = vshufps_avx(auVar23,auVar23,0);
      auVar200 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar287._0_4_ = auVar227._0_4_ * fVar309 + auVar200._0_4_ * fVar196 + auVar23._0_4_ * fVar222
      ;
      auVar287._4_4_ = auVar227._4_4_ * fVar175 + auVar200._4_4_ * fVar211 + auVar23._4_4_ * fVar233
      ;
      auVar287._8_4_ = auVar227._8_4_ * fVar192 + auVar200._8_4_ * fVar214 + auVar23._8_4_ * fVar235
      ;
      auVar287._12_4_ =
           auVar227._12_4_ * fVar254 + auVar200._12_4_ * fVar215 + auVar23._12_4_ * fVar237;
      auVar227 = vblendps_avx(auVar287,local_4d0,8);
      auVar23 = vsubps_avx(local_4e0,auVar202);
      auVar202 = vshufps_avx(auVar23,auVar23,0);
      auVar200 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar161._0_4_ = auVar202._0_4_ * fVar309 + auVar200._0_4_ * fVar196 + fVar222 * auVar23._0_4_
      ;
      auVar161._4_4_ = auVar202._4_4_ * fVar175 + auVar200._4_4_ * fVar211 + fVar233 * auVar23._4_4_
      ;
      auVar161._8_4_ = auVar202._8_4_ * fVar192 + auVar200._8_4_ * fVar214 + fVar235 * auVar23._8_4_
      ;
      auVar161._12_4_ =
           auVar202._12_4_ * fVar254 + auVar200._12_4_ * fVar215 + fVar237 * auVar23._12_4_;
      auVar202 = vblendps_avx(auVar161,local_4e0,8);
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
      auVar243 = vandps_avx(auVar243,auVar226);
      auVar181 = vandps_avx(auVar181,auVar226);
      auVar200 = vmaxps_avx(auVar243,auVar181);
      auVar243 = vandps_avx(auVar227,auVar226);
      auVar181 = vandps_avx(auVar202,auVar226);
      auVar243 = vmaxps_avx(auVar243,auVar181);
      auVar243 = vmaxps_avx(auVar200,auVar243);
      auVar181 = vmovshdup_avx(auVar243);
      auVar181 = vmaxss_avx(auVar181,auVar243);
      auVar243 = vshufpd_avx(auVar243,auVar243,1);
      auVar243 = vmaxss_avx(auVar243,auVar181);
      fVar215 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0x908);
      fVar222 = *(float *)(bspline_basis0 + lVar20 + 0x90c);
      fVar235 = *(float *)(bspline_basis0 + lVar20 + 0x910);
      fVar237 = *(float *)(bspline_basis0 + lVar20 + 0x914);
      fVar241 = *(float *)(bspline_basis0 + lVar20 + 0x918);
      fVar251 = *(float *)(bspline_basis0 + lVar20 + 0x91c);
      fVar252 = *(float *)(bspline_basis0 + lVar20 + 0x920);
      auVar119 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0x908);
      auVar181 = vshufps_avx(auVar287,auVar287,0);
      register0x00001250 = auVar181;
      _local_620 = auVar181;
      auVar227 = vshufps_avx(auVar287,auVar287,0x55);
      register0x00001290 = auVar227;
      _local_600 = auVar227;
      fVar253 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      fVar313 = *(float *)(bspline_basis0 + lVar20 + 0xd90);
      fVar340 = *(float *)(bspline_basis0 + lVar20 + 0xd94);
      fVar341 = *(float *)(bspline_basis0 + lVar20 + 0xd98);
      fVar218 = *(float *)(bspline_basis0 + lVar20 + 0xd9c);
      fVar314 = *(float *)(bspline_basis0 + lVar20 + 0xda0);
      fVar315 = *(float *)(bspline_basis0 + lVar20 + 0xda4);
      auVar118 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0xd8c);
      auVar202 = vshufps_avx(auVar161,auVar161,0);
      register0x00001550 = auVar202;
      _local_4a0 = auVar202;
      fVar263 = auVar202._0_4_;
      fVar335 = auVar202._4_4_;
      fVar336 = auVar202._8_4_;
      fVar337 = auVar202._12_4_;
      fVar157 = auVar181._0_4_;
      fVar155 = auVar181._4_4_;
      fVar195 = auVar181._8_4_;
      fVar174 = auVar181._12_4_;
      auVar181 = vshufps_avx(auVar161,auVar161,0x55);
      register0x00001250 = auVar181;
      _local_7a0 = auVar181;
      fVar309 = auVar181._0_4_;
      fVar254 = auVar181._4_4_;
      fVar214 = auVar181._8_4_;
      fVar233 = auVar181._12_4_;
      fVar239 = auVar227._0_4_;
      fVar188 = auVar227._4_4_;
      fVar190 = auVar227._8_4_;
      fVar193 = auVar227._12_4_;
      auVar181 = vshufps_avx(local_4d0,local_4d0,0xff);
      register0x00001310 = auVar181;
      _local_160 = auVar181;
      auVar227 = vshufps_avx(local_4e0,local_4e0,0xff);
      register0x00001390 = auVar227;
      _local_80 = auVar227;
      fVar175 = auVar227._0_4_;
      fVar192 = auVar227._4_4_;
      fVar196 = auVar227._8_4_;
      fVar211 = auVar227._12_4_;
      fVar223 = auVar181._0_4_;
      fVar234 = auVar181._4_4_;
      fVar236 = auVar181._8_4_;
      auVar227 = vshufps_avx(auVar271,auVar271,0);
      register0x00001510 = auVar227;
      _local_5a0 = auVar227;
      fVar213 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0x484);
      fVar319 = *(float *)(bspline_basis0 + lVar20 + 0x488);
      fVar217 = *(float *)(bspline_basis0 + lVar20 + 0x48c);
      fVar320 = *(float *)(bspline_basis0 + lVar20 + 0x490);
      fVar220 = *(float *)(bspline_basis0 + lVar20 + 0x494);
      fVar321 = *(float *)(bspline_basis0 + lVar20 + 0x498);
      fVar136 = *(float *)(bspline_basis0 + lVar20 + 0x49c);
      auVar120 = *(undefined1 (*) [28])(bspline_basis0 + lVar20 + 0x484);
      fVar149 = *(float *)(bspline_basis0 + lVar20 + 0x4a0);
      fVar325 = auVar227._0_4_;
      fVar331 = auVar227._4_4_;
      fVar156 = auVar227._8_4_;
      fVar176 = auVar227._12_4_;
      auVar227 = vshufps_avx(auVar271,auVar271,0x55);
      register0x000015d0 = auVar227;
      _local_5c0 = auVar227;
      fVar280 = auVar227._0_4_;
      fVar281 = auVar227._4_4_;
      fVar282 = auVar227._8_4_;
      fVar296 = auVar227._12_4_;
      auVar227 = vpermilps_avx(local_540,0xff);
      register0x00001590 = auVar227;
      _local_a0 = auVar227;
      fVar265 = auVar227._0_4_;
      fVar275 = auVar227._4_4_;
      fVar277 = auVar227._8_4_;
      fVar279 = auVar227._12_4_;
      auVar109._8_4_ = auVar199._8_4_;
      auVar109._0_8_ = auVar199._0_8_;
      auVar109._12_4_ = auVar199._12_4_;
      auVar227 = vshufps_avx(auVar109,auVar109,0);
      register0x000013d0 = auVar227;
      _local_140 = auVar227;
      pauVar9 = (undefined1 (*) [16])(bspline_basis0 + lVar20);
      fVar150 = *(float *)*pauVar9;
      fVar151 = *(float *)(bspline_basis0 + lVar20 + 4);
      fVar152 = *(float *)(bspline_basis0 + lVar20 + 8);
      auVar121 = *(undefined1 (*) [12])*pauVar9;
      fVar153 = *(float *)(bspline_basis0 + lVar20 + 0xc);
      fStack_370 = *(float *)(bspline_basis0 + lVar20 + 0x10);
      fStack_36c = *(float *)(bspline_basis0 + lVar20 + 0x14);
      fStack_368 = *(float *)(bspline_basis0 + lVar20 + 0x18);
      uStack_364 = *(undefined4 *)(bspline_basis0 + lVar20 + 0x1c);
      fVar264 = auVar227._0_4_;
      fVar274 = auVar227._4_4_;
      fVar276 = auVar227._8_4_;
      fVar278 = auVar227._12_4_;
      auVar288._0_4_ = fVar264 * fVar150 + fVar325 * fVar213 + fVar157 * fVar215 + fVar263 * fVar253
      ;
      auVar288._4_4_ = fVar274 * fVar151 + fVar331 * fVar319 + fVar155 * fVar222 + fVar335 * fVar313
      ;
      auVar288._8_4_ = fVar276 * fVar152 + fVar156 * fVar217 + fVar195 * fVar235 + fVar336 * fVar340
      ;
      auVar288._12_4_ =
           fVar278 * fVar153 + fVar176 * fVar320 + fVar174 * fVar237 + fVar337 * fVar341;
      auVar288._16_4_ =
           fVar264 * fStack_370 + fVar325 * fVar220 + fVar157 * fVar241 + fVar263 * fVar218;
      auVar288._20_4_ =
           fVar274 * fStack_36c + fVar331 * fVar321 + fVar155 * fVar251 + fVar335 * fVar314;
      auVar288._24_4_ =
           fVar276 * fStack_368 + fVar156 * fVar136 + fVar195 * fVar252 + fVar336 * fVar315;
      auVar288._28_4_ = fVar149 + fVar174 + 0.0 + 0.0;
      auVar202 = vshufps_avx(auVar109,auVar109,0x55);
      local_360._16_16_ = auVar202;
      local_360._0_16_ = auVar202;
      fVar177 = auVar202._0_4_;
      fVar189 = auVar202._4_4_;
      fVar191 = auVar202._8_4_;
      fVar194 = auVar202._12_4_;
      auVar298._0_4_ = fVar177 * fVar150 + fVar280 * fVar213 + fVar239 * fVar215 + fVar253 * fVar309
      ;
      auVar298._4_4_ = fVar189 * fVar151 + fVar281 * fVar319 + fVar188 * fVar222 + fVar313 * fVar254
      ;
      auVar298._8_4_ = fVar191 * fVar152 + fVar282 * fVar217 + fVar190 * fVar235 + fVar340 * fVar214
      ;
      auVar298._12_4_ =
           fVar194 * fVar153 + fVar296 * fVar320 + fVar193 * fVar237 + fVar341 * fVar233;
      auVar298._16_4_ =
           fVar177 * fStack_370 + fVar280 * fVar220 + fVar239 * fVar241 + fVar218 * fVar309;
      auVar298._20_4_ =
           fVar189 * fStack_36c + fVar281 * fVar321 + fVar188 * fVar251 + fVar314 * fVar254;
      auVar298._24_4_ =
           fVar191 * fStack_368 + fVar282 * fVar136 + fVar190 * fVar252 + fVar315 * fVar214;
      auVar298._28_4_ = fVar193 + fVar233 + 0.0 + 0.0;
      auVar202 = vpermilps_avx(_local_6b0,0xff);
      register0x00001490 = auVar202;
      _local_c0 = auVar202;
      fVar238 = auVar202._0_4_;
      fVar283 = auVar202._4_4_;
      fVar291 = auVar202._8_4_;
      local_7e0._0_4_ =
           fVar265 * fVar213 + fVar223 * fVar215 + fVar253 * fVar175 + fVar238 * fVar150;
      local_7e0._4_4_ =
           fVar275 * fVar319 + fVar234 * fVar222 + fVar313 * fVar192 + fVar283 * fVar151;
      local_7e0._8_4_ =
           fVar277 * fVar217 + fVar236 * fVar235 + fVar340 * fVar196 + fVar291 * fVar152;
      local_7e0._12_4_ =
           fVar279 * fVar320 + auVar181._12_4_ * fVar237 + fVar341 * fVar211 +
           auVar202._12_4_ * fVar153;
      local_7e0._16_4_ =
           fVar265 * fVar220 + fVar223 * fVar241 + fVar218 * fVar175 + fVar238 * fStack_370;
      local_7e0._20_4_ =
           fVar275 * fVar321 + fVar234 * fVar251 + fVar314 * fVar192 + fVar283 * fStack_36c;
      local_7e0._24_4_ =
           fVar277 * fVar136 + fVar236 * fVar252 + fVar315 * fVar196 + fVar291 * fStack_368;
      local_7e0._28_4_ = 0;
      fVar341 = *(float *)(bspline_basis1 + lVar20 + 0x908);
      fVar218 = *(float *)(bspline_basis1 + lVar20 + 0x90c);
      fVar314 = *(float *)(bspline_basis1 + lVar20 + 0x910);
      fVar315 = *(float *)(bspline_basis1 + lVar20 + 0x914);
      fVar213 = *(float *)(bspline_basis1 + lVar20 + 0x918);
      fVar319 = *(float *)(bspline_basis1 + lVar20 + 0x91c);
      fVar217 = *(float *)(bspline_basis1 + lVar20 + 0x920);
      fVar320 = *(float *)(bspline_basis1 + lVar20 + 0xd8c);
      fVar220 = *(float *)(bspline_basis1 + lVar20 + 0xd90);
      fVar321 = *(float *)(bspline_basis1 + lVar20 + 0xd94);
      fVar136 = *(float *)(bspline_basis1 + lVar20 + 0xd98);
      fVar150 = *(float *)(bspline_basis1 + lVar20 + 0xd9c);
      fVar151 = *(float *)(bspline_basis1 + lVar20 + 0xda0);
      fVar152 = *(float *)(bspline_basis1 + lVar20 + 0xda4);
      fVar154 = *(float *)(bspline_basis1 + lVar20 + 0x484);
      fVar240 = *(float *)(bspline_basis1 + lVar20 + 0x488);
      fVar322 = *(float *)(bspline_basis1 + lVar20 + 0x48c);
      fVar212 = *(float *)(bspline_basis1 + lVar20 + 0x490);
      fVar323 = *(float *)(bspline_basis1 + lVar20 + 0x494);
      fVar216 = *(float *)(bspline_basis1 + lVar20 + 0x498);
      fVar324 = *(float *)(bspline_basis1 + lVar20 + 0x49c);
      fVar219 = *(float *)(bspline_basis1 + lVar20);
      fVar221 = *(float *)(bspline_basis1 + lVar20 + 4);
      fVar255 = *(float *)(bspline_basis1 + lVar20 + 8);
      fVar292 = *(float *)(bspline_basis1 + lVar20 + 0xc);
      fVar293 = *(float *)(bspline_basis1 + lVar20 + 0x10);
      fVar294 = *(float *)(bspline_basis1 + lVar20 + 0x14);
      fVar295 = *(float *)(bspline_basis1 + lVar20 + 0x18);
      auVar228._0_4_ = fVar264 * fVar219 + fVar325 * fVar154 + fVar341 * fVar157 + fVar263 * fVar320
      ;
      auVar228._4_4_ = fVar274 * fVar221 + fVar331 * fVar240 + fVar218 * fVar155 + fVar335 * fVar220
      ;
      auVar228._8_4_ = fVar276 * fVar255 + fVar156 * fVar322 + fVar314 * fVar195 + fVar336 * fVar321
      ;
      auVar228._12_4_ =
           fVar278 * fVar292 + fVar176 * fVar212 + fVar315 * fVar174 + fVar337 * fVar136;
      auVar228._16_4_ =
           fVar264 * fVar293 + fVar325 * fVar323 + fVar213 * fVar157 + fVar263 * fVar150;
      auVar228._20_4_ =
           fVar274 * fVar294 + fVar331 * fVar216 + fVar319 * fVar155 + fVar335 * fVar151;
      auVar228._24_4_ =
           fVar276 * fVar295 + fVar156 * fVar324 + fVar217 * fVar195 + fVar336 * fVar152;
      auVar228._28_4_ = fVar279 + fVar337 + 0.0;
      auVar203._0_4_ = fVar177 * fVar219 + fVar280 * fVar154 + fVar341 * fVar239 + fVar320 * fVar309
      ;
      auVar203._4_4_ = fVar189 * fVar221 + fVar281 * fVar240 + fVar218 * fVar188 + fVar220 * fVar254
      ;
      auVar203._8_4_ = fVar191 * fVar255 + fVar282 * fVar322 + fVar314 * fVar190 + fVar321 * fVar214
      ;
      auVar203._12_4_ =
           fVar194 * fVar292 + fVar296 * fVar212 + fVar315 * fVar193 + fVar136 * fVar233;
      auVar203._16_4_ =
           fVar177 * fVar293 + fVar280 * fVar323 + fVar213 * fVar239 + fVar150 * fVar309;
      auVar203._20_4_ =
           fVar189 * fVar294 + fVar281 * fVar216 + fVar319 * fVar188 + fVar151 * fVar254;
      auVar203._24_4_ =
           fVar191 * fVar295 + fVar282 * fVar324 + fVar217 * fVar190 + fVar152 * fVar214;
      auVar203._28_4_ = fVar194 + fVar337 + fVar149 + 0.0;
      local_780._0_4_ =
           fVar265 * fVar154 + fVar223 * fVar341 + fVar320 * fVar175 + fVar238 * fVar219;
      local_780._4_4_ =
           fVar275 * fVar240 + fVar234 * fVar218 + fVar220 * fVar192 + fVar283 * fVar221;
      local_780._8_4_ =
           fVar277 * fVar322 + fVar236 * fVar314 + fVar321 * fVar196 + fVar291 * fVar255;
      local_780._12_4_ =
           fVar279 * fVar212 + auVar181._12_4_ * fVar315 + fVar136 * fVar211 +
           auVar202._12_4_ * fVar292;
      local_780._16_4_ =
           fVar265 * fVar323 + fVar223 * fVar213 + fVar150 * fVar175 + fVar238 * fVar293;
      local_780._20_4_ =
           fVar275 * fVar216 + fVar234 * fVar319 + fVar151 * fVar192 + fVar283 * fVar294;
      local_780._24_4_ =
           fVar277 * fVar324 + fVar236 * fVar217 + fVar152 * fVar196 + fVar291 * fVar295;
      local_780._28_4_ = fVar337 + fVar211 + fVar149 + fVar194;
      local_3a0 = vsubps_avx(auVar228,auVar288);
      auVar30 = vsubps_avx(auVar203,auVar298);
      fVar175 = local_3a0._0_4_;
      fVar196 = local_3a0._4_4_;
      auVar248._4_4_ = auVar298._4_4_ * fVar196;
      auVar248._0_4_ = auVar298._0_4_ * fVar175;
      fVar215 = local_3a0._8_4_;
      auVar248._8_4_ = auVar298._8_4_ * fVar215;
      fVar235 = local_3a0._12_4_;
      auVar248._12_4_ = auVar298._12_4_ * fVar235;
      fVar241 = local_3a0._16_4_;
      auVar248._16_4_ = auVar298._16_4_ * fVar241;
      fVar252 = local_3a0._20_4_;
      auVar248._20_4_ = auVar298._20_4_ * fVar252;
      fVar313 = local_3a0._24_4_;
      auVar248._24_4_ = auVar298._24_4_ * fVar313;
      auVar248._28_4_ = fVar194;
      fVar192 = auVar30._0_4_;
      fVar211 = auVar30._4_4_;
      auVar31._4_4_ = auVar288._4_4_ * fVar211;
      auVar31._0_4_ = auVar288._0_4_ * fVar192;
      fVar222 = auVar30._8_4_;
      auVar31._8_4_ = auVar288._8_4_ * fVar222;
      fVar237 = auVar30._12_4_;
      auVar31._12_4_ = auVar288._12_4_ * fVar237;
      fVar251 = auVar30._16_4_;
      auVar31._16_4_ = auVar288._16_4_ * fVar251;
      fVar253 = auVar30._20_4_;
      auVar31._20_4_ = auVar288._20_4_ * fVar253;
      fVar340 = auVar30._24_4_;
      auVar31._24_4_ = auVar288._24_4_ * fVar340;
      auVar31._28_4_ = auVar203._28_4_;
      auVar31 = vsubps_avx(auVar248,auVar31);
      auVar248 = vmaxps_avx(local_7e0,local_780);
      auVar39._4_4_ = auVar248._4_4_ * auVar248._4_4_ * (fVar196 * fVar196 + fVar211 * fVar211);
      auVar39._0_4_ = auVar248._0_4_ * auVar248._0_4_ * (fVar175 * fVar175 + fVar192 * fVar192);
      auVar39._8_4_ = auVar248._8_4_ * auVar248._8_4_ * (fVar215 * fVar215 + fVar222 * fVar222);
      auVar39._12_4_ = auVar248._12_4_ * auVar248._12_4_ * (fVar235 * fVar235 + fVar237 * fVar237);
      auVar39._16_4_ = auVar248._16_4_ * auVar248._16_4_ * (fVar241 * fVar241 + fVar251 * fVar251);
      auVar39._20_4_ = auVar248._20_4_ * auVar248._20_4_ * (fVar252 * fVar252 + fVar253 * fVar253);
      auVar39._24_4_ = auVar248._24_4_ * auVar248._24_4_ * (fVar313 * fVar313 + fVar340 * fVar340);
      auVar39._28_4_ = auVar228._28_4_ + auVar203._28_4_;
      auVar172._4_4_ = auVar31._4_4_ * auVar31._4_4_;
      auVar172._0_4_ = auVar31._0_4_ * auVar31._0_4_;
      auVar172._8_4_ = auVar31._8_4_ * auVar31._8_4_;
      auVar172._12_4_ = auVar31._12_4_ * auVar31._12_4_;
      auVar172._16_4_ = auVar31._16_4_ * auVar31._16_4_;
      auVar172._20_4_ = auVar31._20_4_ * auVar31._20_4_;
      auVar172._24_4_ = auVar31._24_4_ * auVar31._24_4_;
      auVar172._28_4_ = auVar31._28_4_;
      auVar248 = vcmpps_avx(auVar172,auVar39,2);
      auVar200 = ZEXT416((uint)(auVar243._0_4_ * 4.7683716e-07));
      local_800._0_16_ = auVar200;
      auVar201._0_4_ = (float)(int)uVar15;
      auVar201._4_12_ = auVar227._4_12_;
      local_4c0._0_16_ = auVar201;
      auVar243 = vshufps_avx(auVar201,auVar201,0);
      auVar204._16_16_ = auVar243;
      auVar204._0_16_ = auVar243;
      auVar31 = vcmpps_avx(_DAT_02020f40,auVar204,1);
      auVar210 = ZEXT3264(auVar31);
      auVar110._8_4_ = auVar199._8_4_;
      auVar110._0_8_ = auVar199._0_8_;
      auVar110._12_4_ = auVar199._12_4_;
      auVar243 = vpermilps_avx(auVar110,0xaa);
      register0x00001410 = auVar243;
      _local_180 = auVar243;
      auVar181 = vpermilps_avx(auVar271,0xaa);
      register0x00001550 = auVar181;
      _local_340 = auVar181;
      auVar227 = vpermilps_avx(auVar287,0xaa);
      register0x00001590 = auVar227;
      _local_e0 = auVar227;
      auVar202 = vpermilps_avx(auVar161,0xaa);
      register0x00001310 = auVar202;
      _local_640 = auVar202;
      auVar39 = auVar31 & auVar248;
      uVar130 = *(uint *)(ray + k * 4 + 0x30);
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0x7f,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar39 >> 0xbf,0) == '\0') &&
          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar39[0x1f])
      {
        uVar129 = 0;
        auVar318 = ZEXT3264(_local_7a0);
      }
      else {
        auVar248 = vandps_avx(auVar248,auVar31);
        fVar283 = auVar243._0_4_;
        fVar291 = auVar243._4_4_;
        fVar265 = auVar243._8_4_;
        fVar275 = auVar243._12_4_;
        fVar277 = auVar181._0_4_;
        fVar279 = auVar181._4_4_;
        fVar303 = auVar181._8_4_;
        fVar304 = auVar181._12_4_;
        fVar305 = auVar227._0_4_;
        fVar306 = auVar227._4_4_;
        fVar307 = auVar227._8_4_;
        fVar308 = auVar227._12_4_;
        fVar223 = auVar202._0_4_;
        fVar234 = auVar202._4_4_;
        fVar236 = auVar202._8_4_;
        fVar238 = auVar202._12_4_;
        fVar175 = auVar31._28_4_ +
                  *(float *)(bspline_basis1 + lVar20 + 0x924) +
                  *(float *)(bspline_basis1 + lVar20 + 0x4a0);
        local_500 = fVar283 * fVar219 + fVar277 * fVar154 + fVar305 * fVar341 + fVar223 * fVar320;
        fStack_4fc = fVar291 * fVar221 + fVar279 * fVar240 + fVar306 * fVar218 + fVar234 * fVar220;
        fStack_4f8 = fVar265 * fVar255 + fVar303 * fVar322 + fVar307 * fVar314 + fVar236 * fVar321;
        fStack_4f4 = fVar275 * fVar292 + fVar304 * fVar212 + fVar308 * fVar315 + fVar238 * fVar136;
        fStack_4f0 = fVar283 * fVar293 + fVar277 * fVar323 + fVar305 * fVar213 + fVar223 * fVar150;
        fStack_4ec = fVar291 * fVar294 + fVar279 * fVar216 + fVar306 * fVar319 + fVar234 * fVar151;
        fStack_4e8 = fVar265 * fVar295 + fVar303 * fVar324 + fVar307 * fVar217 + fVar236 * fVar152;
        fStack_4e4 = auVar248._28_4_ + fVar175;
        local_380._0_4_ = auVar121._0_4_;
        local_380._4_4_ = auVar121._4_4_;
        fStack_378 = auVar121._8_4_;
        local_740._0_4_ = auVar120._0_4_;
        local_740._4_4_ = auVar120._4_4_;
        uStack_738._0_4_ = auVar120._8_4_;
        uStack_738._4_4_ = auVar120._12_4_;
        fStack_730 = auVar120._16_4_;
        fStack_72c = auVar120._20_4_;
        fStack_728 = auVar120._24_4_;
        local_700._0_4_ = auVar119._0_4_;
        local_700._4_4_ = auVar119._4_4_;
        uStack_6f8._0_4_ = auVar119._8_4_;
        uStack_6f8._4_4_ = auVar119._12_4_;
        auStack_6f0._0_4_ = auVar119._16_4_;
        auStack_6f0._4_4_ = auVar119._20_4_;
        fStack_6e8 = auVar119._24_4_;
        local_720._0_4_ = auVar118._0_4_;
        local_720._4_4_ = auVar118._4_4_;
        uStack_718._0_4_ = auVar118._8_4_;
        uStack_718._4_4_ = auVar118._12_4_;
        fStack_710 = auVar118._16_4_;
        fStack_70c = auVar118._20_4_;
        fStack_708 = auVar118._24_4_;
        local_700._0_4_ =
             fVar283 * (float)local_380._0_4_ +
             fVar277 * (float)local_740._0_4_ +
             fVar305 * (float)local_700._0_4_ + fVar223 * (float)local_720._0_4_;
        local_700._4_4_ =
             fVar291 * (float)local_380._4_4_ +
             fVar279 * (float)local_740._4_4_ +
             fVar306 * (float)local_700._4_4_ + fVar234 * (float)local_720._4_4_;
        uStack_6f8._0_4_ =
             fVar265 * fStack_378 +
             fVar303 * (float)uStack_738 + fVar307 * (float)uStack_6f8 + fVar236 * (float)uStack_718
        ;
        uStack_6f8._4_4_ =
             fVar275 * fVar153 +
             fVar304 * uStack_738._4_4_ + fVar308 * uStack_6f8._4_4_ + fVar238 * uStack_718._4_4_;
        auStack_6f0._0_4_ =
             fVar283 * fStack_370 +
             fVar277 * fStack_730 + fVar305 * (float)auStack_6f0._0_4_ + fVar223 * fStack_710;
        auStack_6f0._4_4_ =
             fVar291 * fStack_36c +
             fVar279 * fStack_72c + fVar306 * (float)auStack_6f0._4_4_ + fVar234 * fStack_70c;
        fStack_6e8 = fVar265 * fStack_368 +
                     fVar303 * fStack_728 + fVar307 * fStack_6e8 + fVar236 * fStack_708;
        fStack_6e4 = fStack_4e4 + fVar175 + auVar248._28_4_ + auVar31._28_4_;
        fVar175 = *(float *)(bspline_basis0 + lVar20 + 0x1210);
        fVar192 = *(float *)(bspline_basis0 + lVar20 + 0x1214);
        fVar196 = *(float *)(bspline_basis0 + lVar20 + 0x1218);
        fVar211 = *(float *)(bspline_basis0 + lVar20 + 0x121c);
        fVar215 = *(float *)(bspline_basis0 + lVar20 + 0x1220);
        fVar222 = *(float *)(bspline_basis0 + lVar20 + 0x1224);
        fVar235 = *(float *)(bspline_basis0 + lVar20 + 0x1228);
        fVar237 = *(float *)(bspline_basis0 + lVar20 + 0x1694);
        fVar241 = *(float *)(bspline_basis0 + lVar20 + 0x1698);
        fVar251 = *(float *)(bspline_basis0 + lVar20 + 0x169c);
        fVar252 = *(float *)(bspline_basis0 + lVar20 + 0x16a0);
        fVar253 = *(float *)(bspline_basis0 + lVar20 + 0x16a4);
        fVar313 = *(float *)(bspline_basis0 + lVar20 + 0x16a8);
        fVar340 = *(float *)(bspline_basis0 + lVar20 + 0x16ac);
        fVar341 = *(float *)(bspline_basis0 + lVar20 + 0x1b18);
        fVar218 = *(float *)(bspline_basis0 + lVar20 + 0x1b1c);
        fVar314 = *(float *)(bspline_basis0 + lVar20 + 0x1b20);
        fVar315 = *(float *)(bspline_basis0 + lVar20 + 0x1b24);
        fVar213 = *(float *)(bspline_basis0 + lVar20 + 0x1b28);
        fVar319 = *(float *)(bspline_basis0 + lVar20 + 0x1b2c);
        fVar217 = *(float *)(bspline_basis0 + lVar20 + 0x1b30);
        fVar320 = *(float *)(bspline_basis0 + lVar20 + 0x1f9c);
        fVar220 = *(float *)(bspline_basis0 + lVar20 + 0x1fa0);
        fVar321 = *(float *)(bspline_basis0 + lVar20 + 0x1fa4);
        fVar136 = *(float *)(bspline_basis0 + lVar20 + 0x1fa8);
        fVar149 = *(float *)(bspline_basis0 + lVar20 + 0x1fac);
        fVar150 = *(float *)(bspline_basis0 + lVar20 + 0x1fb0);
        fVar151 = *(float *)(bspline_basis0 + lVar20 + 0x1fb4);
        fVar153 = auVar298._28_4_ + *(float *)(bspline_basis1 + lVar20 + 0x4a0);
        fVar152 = *(float *)(bspline_basis0 + lVar20 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar20 + 0x1fb8);
        fVar154 = *(float *)(bspline_basis0 + lVar20 + 0x16b0) + fVar152;
        local_740._4_4_ =
             fVar274 * fVar192 + fVar331 * fVar241 + fVar155 * fVar218 + fVar335 * fVar220;
        local_740._0_4_ =
             fVar264 * fVar175 + fVar325 * fVar237 + fVar157 * fVar341 + fVar263 * fVar320;
        uStack_738._0_4_ =
             fVar276 * fVar196 + fVar156 * fVar251 + fVar195 * fVar314 + fVar336 * fVar321;
        uStack_738._4_4_ =
             fVar278 * fVar211 + fVar176 * fVar252 + fVar174 * fVar315 + fVar337 * fVar136;
        fStack_730 = fVar264 * fVar215 + fVar325 * fVar253 + fVar157 * fVar213 + fVar263 * fVar149;
        fStack_72c = fVar274 * fVar222 + fVar331 * fVar313 + fVar155 * fVar319 + fVar335 * fVar150;
        fStack_728 = fVar276 * fVar235 + fVar156 * fVar340 + fVar195 * fVar217 + fVar336 * fVar151;
        fStack_724 = *(float *)(bspline_basis0 + lVar20 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar20 + 0x1fb8) + fVar153;
        auVar167._0_4_ =
             fVar177 * fVar175 + fVar239 * fVar341 + fVar309 * fVar320 + fVar280 * fVar237;
        auVar167._4_4_ =
             fVar189 * fVar192 + fVar188 * fVar218 + fVar254 * fVar220 + fVar281 * fVar241;
        auVar167._8_4_ =
             fVar191 * fVar196 + fVar190 * fVar314 + fVar214 * fVar321 + fVar282 * fVar251;
        auVar167._12_4_ =
             fVar194 * fVar211 + fVar193 * fVar315 + fVar233 * fVar136 + fVar296 * fVar252;
        auVar167._16_4_ =
             fVar177 * fVar215 + fVar239 * fVar213 + fVar309 * fVar149 + fVar280 * fVar253;
        auVar167._20_4_ =
             fVar189 * fVar222 + fVar188 * fVar319 + fVar254 * fVar150 + fVar281 * fVar313;
        auVar167._24_4_ =
             fVar191 * fVar235 + fVar190 * fVar217 + fVar214 * fVar151 + fVar282 * fVar340;
        auVar167._28_4_ = fVar152 + auVar298._28_4_ + fVar296 + fVar153;
        auVar244._0_4_ =
             fVar277 * fVar237 + fVar305 * fVar341 + fVar223 * fVar320 + fVar283 * fVar175;
        auVar244._4_4_ =
             fVar279 * fVar241 + fVar306 * fVar218 + fVar234 * fVar220 + fVar291 * fVar192;
        auVar244._8_4_ =
             fVar303 * fVar251 + fVar307 * fVar314 + fVar236 * fVar321 + fVar265 * fVar196;
        auVar244._12_4_ =
             fVar304 * fVar252 + fVar308 * fVar315 + fVar238 * fVar136 + fVar275 * fVar211;
        auVar244._16_4_ =
             fVar277 * fVar253 + fVar305 * fVar213 + fVar223 * fVar149 + fVar283 * fVar215;
        auVar244._20_4_ =
             fVar279 * fVar313 + fVar306 * fVar319 + fVar234 * fVar150 + fVar291 * fVar222;
        auVar244._24_4_ =
             fVar303 * fVar340 + fVar307 * fVar217 + fVar236 * fVar151 + fVar265 * fVar235;
        auVar244._28_4_ = fVar154 + *(float *)(bspline_basis0 + lVar20 + 0x122c);
        fVar175 = *(float *)(bspline_basis1 + lVar20 + 0x1b18);
        fVar192 = *(float *)(bspline_basis1 + lVar20 + 0x1b1c);
        fVar196 = *(float *)(bspline_basis1 + lVar20 + 0x1b20);
        fVar211 = *(float *)(bspline_basis1 + lVar20 + 0x1b24);
        fVar215 = *(float *)(bspline_basis1 + lVar20 + 0x1b28);
        fVar222 = *(float *)(bspline_basis1 + lVar20 + 0x1b2c);
        fVar235 = *(float *)(bspline_basis1 + lVar20 + 0x1b30);
        fVar237 = *(float *)(bspline_basis1 + lVar20 + 0x1f9c);
        fVar241 = *(float *)(bspline_basis1 + lVar20 + 0x1fa0);
        fVar251 = *(float *)(bspline_basis1 + lVar20 + 0x1fa4);
        fVar252 = *(float *)(bspline_basis1 + lVar20 + 0x1fa8);
        fVar253 = *(float *)(bspline_basis1 + lVar20 + 0x1fac);
        fVar313 = *(float *)(bspline_basis1 + lVar20 + 0x1fb0);
        fVar340 = *(float *)(bspline_basis1 + lVar20 + 0x1fb4);
        fVar341 = *(float *)(bspline_basis1 + lVar20 + 0x1694);
        fVar218 = *(float *)(bspline_basis1 + lVar20 + 0x1698);
        fVar314 = *(float *)(bspline_basis1 + lVar20 + 0x169c);
        fVar315 = *(float *)(bspline_basis1 + lVar20 + 0x16a0);
        fVar213 = *(float *)(bspline_basis1 + lVar20 + 0x16a4);
        fVar319 = *(float *)(bspline_basis1 + lVar20 + 0x16a8);
        fVar217 = *(float *)(bspline_basis1 + lVar20 + 0x16ac);
        fVar320 = *(float *)(bspline_basis1 + lVar20 + 0x1210);
        fVar220 = *(float *)(bspline_basis1 + lVar20 + 0x1214);
        fVar321 = *(float *)(bspline_basis1 + lVar20 + 0x1218);
        fVar136 = *(float *)(bspline_basis1 + lVar20 + 0x121c);
        fVar149 = *(float *)(bspline_basis1 + lVar20 + 0x1220);
        fVar150 = *(float *)(bspline_basis1 + lVar20 + 0x1224);
        fVar151 = *(float *)(bspline_basis1 + lVar20 + 0x1228);
        auVar259._0_4_ =
             fVar320 * fVar264 + fVar325 * fVar341 + fVar157 * fVar175 + fVar263 * fVar237;
        auVar259._4_4_ =
             fVar220 * fVar274 + fVar331 * fVar218 + fVar155 * fVar192 + fVar335 * fVar241;
        auVar259._8_4_ =
             fVar321 * fVar276 + fVar156 * fVar314 + fVar195 * fVar196 + fVar336 * fVar251;
        auVar259._12_4_ =
             fVar136 * fVar278 + fVar176 * fVar315 + fVar174 * fVar211 + fVar337 * fVar252;
        auVar259._16_4_ =
             fVar149 * fVar264 + fVar325 * fVar213 + fVar157 * fVar215 + fVar263 * fVar253;
        auVar259._20_4_ =
             fVar150 * fVar274 + fVar331 * fVar319 + fVar155 * fVar222 + fVar335 * fVar313;
        auVar259._24_4_ =
             fVar151 * fVar276 + fVar156 * fVar217 + fVar195 * fVar235 + fVar336 * fVar340;
        auVar259._28_4_ = fVar337 + fVar337 + fVar154 + fVar337;
        auVar299._0_4_ =
             fVar177 * fVar320 + fVar280 * fVar341 + fVar239 * fVar175 + fVar309 * fVar237;
        auVar299._4_4_ =
             fVar189 * fVar220 + fVar281 * fVar218 + fVar188 * fVar192 + fVar254 * fVar241;
        auVar299._8_4_ =
             fVar191 * fVar321 + fVar282 * fVar314 + fVar190 * fVar196 + fVar214 * fVar251;
        auVar299._12_4_ =
             fVar194 * fVar136 + fVar296 * fVar315 + fVar193 * fVar211 + fVar233 * fVar252;
        auVar299._16_4_ =
             fVar177 * fVar149 + fVar280 * fVar213 + fVar239 * fVar215 + fVar309 * fVar253;
        auVar299._20_4_ =
             fVar189 * fVar150 + fVar281 * fVar319 + fVar188 * fVar222 + fVar254 * fVar313;
        auVar299._24_4_ =
             fVar191 * fVar151 + fVar282 * fVar217 + fVar190 * fVar235 + fVar214 * fVar340;
        auVar299._28_4_ = fVar337 + fVar337 + fVar337 + fVar154;
        auVar187._0_4_ =
             fVar283 * fVar320 + fVar277 * fVar341 + fVar305 * fVar175 + fVar237 * fVar223;
        auVar187._4_4_ =
             fVar291 * fVar220 + fVar279 * fVar218 + fVar306 * fVar192 + fVar241 * fVar234;
        auVar187._8_4_ =
             fVar265 * fVar321 + fVar303 * fVar314 + fVar307 * fVar196 + fVar251 * fVar236;
        auVar187._12_4_ =
             fVar275 * fVar136 + fVar304 * fVar315 + fVar308 * fVar211 + fVar252 * fVar238;
        auVar187._16_4_ =
             fVar283 * fVar149 + fVar277 * fVar213 + fVar305 * fVar215 + fVar253 * fVar223;
        auVar187._20_4_ =
             fVar291 * fVar150 + fVar279 * fVar319 + fVar306 * fVar222 + fVar313 * fVar234;
        auVar187._24_4_ =
             fVar265 * fVar151 + fVar303 * fVar217 + fVar307 * fVar235 + fVar340 * fVar236;
        auVar187._28_4_ =
             *(float *)(bspline_basis1 + lVar20 + 0x122c) +
             *(float *)(bspline_basis1 + lVar20 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar20 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar20 + 0x1fb8);
        auVar229._8_4_ = 0x7fffffff;
        auVar229._0_8_ = 0x7fffffff7fffffff;
        auVar229._12_4_ = 0x7fffffff;
        auVar229._16_4_ = 0x7fffffff;
        auVar229._20_4_ = 0x7fffffff;
        auVar229._24_4_ = 0x7fffffff;
        auVar229._28_4_ = 0x7fffffff;
        auVar31 = vandps_avx(_local_740,auVar229);
        auVar39 = vandps_avx(auVar167,auVar229);
        auVar39 = vmaxps_avx(auVar31,auVar39);
        auVar31 = vandps_avx(auVar244,auVar229);
        auVar31 = vmaxps_avx(auVar39,auVar31);
        auVar243 = vpermilps_avx(auVar200,0);
        auVar245._16_16_ = auVar243;
        auVar245._0_16_ = auVar243;
        auVar31 = vcmpps_avx(auVar31,auVar245,1);
        auVar172 = vblendvps_avx(_local_740,local_3a0,auVar31);
        auVar204 = vblendvps_avx(auVar167,auVar30,auVar31);
        auVar31 = vandps_avx(auVar259,auVar229);
        auVar39 = vandps_avx(auVar299,auVar229);
        auVar34 = vmaxps_avx(auVar31,auVar39);
        auVar31 = vandps_avx(auVar187,auVar229);
        auVar31 = vmaxps_avx(auVar34,auVar31);
        auVar34 = vcmpps_avx(auVar31,auVar245,1);
        auVar31 = vblendvps_avx(auVar259,local_3a0,auVar34);
        auVar30 = vblendvps_avx(auVar299,auVar30,auVar34);
        fVar149 = auVar172._0_4_;
        fVar150 = auVar172._4_4_;
        fVar151 = auVar172._8_4_;
        fVar152 = auVar172._12_4_;
        fVar153 = auVar172._16_4_;
        fVar154 = auVar172._20_4_;
        fVar240 = auVar172._24_4_;
        fVar255 = -auVar172._28_4_;
        fVar322 = auVar31._0_4_;
        fVar212 = auVar31._4_4_;
        fVar323 = auVar31._8_4_;
        fVar216 = auVar31._12_4_;
        fVar324 = auVar31._16_4_;
        fVar219 = auVar31._20_4_;
        fVar221 = auVar31._24_4_;
        fVar309 = auVar204._0_4_;
        fVar196 = auVar204._4_4_;
        fVar222 = auVar204._8_4_;
        fVar241 = auVar204._12_4_;
        fVar313 = auVar204._16_4_;
        fVar314 = auVar204._20_4_;
        fVar217 = auVar204._24_4_;
        auVar142._0_4_ = fVar309 * fVar309 + fVar149 * fVar149;
        auVar142._4_4_ = fVar196 * fVar196 + fVar150 * fVar150;
        auVar142._8_4_ = fVar222 * fVar222 + fVar151 * fVar151;
        auVar142._12_4_ = fVar241 * fVar241 + fVar152 * fVar152;
        auVar142._16_4_ = fVar313 * fVar313 + fVar153 * fVar153;
        auVar142._20_4_ = fVar314 * fVar314 + fVar154 * fVar154;
        auVar142._24_4_ = fVar217 * fVar217 + fVar240 * fVar240;
        auVar142._28_4_ = auVar299._28_4_ + auVar172._28_4_;
        auVar172 = vrsqrtps_avx(auVar142);
        fVar175 = auVar172._0_4_;
        fVar192 = auVar172._4_4_;
        auVar34._4_4_ = fVar192 * 1.5;
        auVar34._0_4_ = fVar175 * 1.5;
        fVar254 = auVar172._8_4_;
        auVar34._8_4_ = fVar254 * 1.5;
        fVar211 = auVar172._12_4_;
        auVar34._12_4_ = fVar211 * 1.5;
        fVar214 = auVar172._16_4_;
        auVar34._16_4_ = fVar214 * 1.5;
        fVar215 = auVar172._20_4_;
        auVar34._20_4_ = fVar215 * 1.5;
        fVar233 = auVar172._24_4_;
        fVar136 = auVar39._28_4_;
        auVar34._24_4_ = fVar233 * 1.5;
        auVar34._28_4_ = fVar136;
        auVar35._4_4_ = fVar192 * fVar192 * fVar192 * auVar142._4_4_ * 0.5;
        auVar35._0_4_ = fVar175 * fVar175 * fVar175 * auVar142._0_4_ * 0.5;
        auVar35._8_4_ = fVar254 * fVar254 * fVar254 * auVar142._8_4_ * 0.5;
        auVar35._12_4_ = fVar211 * fVar211 * fVar211 * auVar142._12_4_ * 0.5;
        auVar35._16_4_ = fVar214 * fVar214 * fVar214 * auVar142._16_4_ * 0.5;
        auVar35._20_4_ = fVar215 * fVar215 * fVar215 * auVar142._20_4_ * 0.5;
        auVar35._24_4_ = fVar233 * fVar233 * fVar233 * auVar142._24_4_ * 0.5;
        auVar35._28_4_ = auVar142._28_4_;
        auVar39 = vsubps_avx(auVar34,auVar35);
        fVar175 = auVar39._0_4_;
        fVar211 = auVar39._4_4_;
        fVar233 = auVar39._8_4_;
        fVar251 = auVar39._12_4_;
        fVar340 = auVar39._16_4_;
        fVar315 = auVar39._20_4_;
        fVar320 = auVar39._24_4_;
        fVar192 = auVar30._0_4_;
        fVar214 = auVar30._4_4_;
        fVar235 = auVar30._8_4_;
        fVar252 = auVar30._12_4_;
        fVar341 = auVar30._16_4_;
        fVar213 = auVar30._20_4_;
        fVar220 = auVar30._24_4_;
        auVar143._0_4_ = fVar192 * fVar192 + fVar322 * fVar322;
        auVar143._4_4_ = fVar214 * fVar214 + fVar212 * fVar212;
        auVar143._8_4_ = fVar235 * fVar235 + fVar323 * fVar323;
        auVar143._12_4_ = fVar252 * fVar252 + fVar216 * fVar216;
        auVar143._16_4_ = fVar341 * fVar341 + fVar324 * fVar324;
        auVar143._20_4_ = fVar213 * fVar213 + fVar219 * fVar219;
        auVar143._24_4_ = fVar220 * fVar220 + fVar221 * fVar221;
        auVar143._28_4_ = auVar31._28_4_ + auVar39._28_4_;
        auVar31 = vrsqrtps_avx(auVar143);
        fVar254 = auVar31._0_4_;
        fVar215 = auVar31._4_4_;
        auVar21._4_4_ = fVar215 * 1.5;
        auVar21._0_4_ = fVar254 * 1.5;
        fVar237 = auVar31._8_4_;
        auVar21._8_4_ = fVar237 * 1.5;
        fVar253 = auVar31._12_4_;
        auVar21._12_4_ = fVar253 * 1.5;
        fVar218 = auVar31._16_4_;
        auVar21._16_4_ = fVar218 * 1.5;
        fVar319 = auVar31._20_4_;
        auVar21._20_4_ = fVar319 * 1.5;
        fVar321 = auVar31._24_4_;
        auVar21._24_4_ = fVar321 * 1.5;
        auVar21._28_4_ = fVar136;
        auVar22._4_4_ = fVar215 * fVar215 * fVar215 * auVar143._4_4_ * 0.5;
        auVar22._0_4_ = fVar254 * fVar254 * fVar254 * auVar143._0_4_ * 0.5;
        auVar22._8_4_ = fVar237 * fVar237 * fVar237 * auVar143._8_4_ * 0.5;
        auVar22._12_4_ = fVar253 * fVar253 * fVar253 * auVar143._12_4_ * 0.5;
        auVar22._16_4_ = fVar218 * fVar218 * fVar218 * auVar143._16_4_ * 0.5;
        auVar22._20_4_ = fVar319 * fVar319 * fVar319 * auVar143._20_4_ * 0.5;
        auVar22._24_4_ = fVar321 * fVar321 * fVar321 * auVar143._24_4_ * 0.5;
        auVar22._28_4_ = auVar143._28_4_;
        auVar31 = vsubps_avx(auVar21,auVar22);
        fVar254 = auVar31._0_4_;
        fVar215 = auVar31._4_4_;
        fVar237 = auVar31._8_4_;
        fVar253 = auVar31._12_4_;
        fVar218 = auVar31._16_4_;
        fVar319 = auVar31._20_4_;
        fVar321 = auVar31._24_4_;
        fVar309 = (float)local_7e0._0_4_ * fVar309 * fVar175;
        fVar196 = local_7e0._4_4_ * fVar196 * fVar211;
        auVar32._4_4_ = fVar196;
        auVar32._0_4_ = fVar309;
        fVar222 = local_7e0._8_4_ * fVar222 * fVar233;
        auVar32._8_4_ = fVar222;
        fVar241 = local_7e0._12_4_ * fVar241 * fVar251;
        auVar32._12_4_ = fVar241;
        fVar313 = local_7e0._16_4_ * fVar313 * fVar340;
        auVar32._16_4_ = fVar313;
        fVar314 = local_7e0._20_4_ * fVar314 * fVar315;
        auVar32._20_4_ = fVar314;
        fVar217 = local_7e0._24_4_ * fVar217 * fVar320;
        auVar32._24_4_ = fVar217;
        auVar32._28_4_ = fVar136;
        local_720._4_4_ = fVar196 + auVar288._4_4_;
        local_720._0_4_ = fVar309 + auVar288._0_4_;
        uStack_718._0_4_ = fVar222 + auVar288._8_4_;
        uStack_718._4_4_ = fVar241 + auVar288._12_4_;
        fStack_710 = fVar313 + auVar288._16_4_;
        fStack_70c = fVar314 + auVar288._20_4_;
        fStack_708 = fVar217 + auVar288._24_4_;
        fStack_704 = fVar136 + auVar288._28_4_;
        fVar309 = (float)local_7e0._0_4_ * fVar175 * -fVar149;
        fVar196 = local_7e0._4_4_ * fVar211 * -fVar150;
        auVar33._4_4_ = fVar196;
        auVar33._0_4_ = fVar309;
        fVar222 = local_7e0._8_4_ * fVar233 * -fVar151;
        auVar33._8_4_ = fVar222;
        fVar241 = local_7e0._12_4_ * fVar251 * -fVar152;
        auVar33._12_4_ = fVar241;
        fVar313 = local_7e0._16_4_ * fVar340 * -fVar153;
        auVar33._16_4_ = fVar313;
        fVar314 = local_7e0._20_4_ * fVar315 * -fVar154;
        auVar33._20_4_ = fVar314;
        fVar217 = local_7e0._24_4_ * fVar320 * -fVar240;
        auVar33._24_4_ = fVar217;
        auVar33._28_4_ = fVar255;
        local_740._4_4_ = auVar298._4_4_ + fVar196;
        local_740._0_4_ = auVar298._0_4_ + fVar309;
        uStack_738._0_4_ = auVar298._8_4_ + fVar222;
        uStack_738._4_4_ = auVar298._12_4_ + fVar241;
        fStack_730 = auVar298._16_4_ + fVar313;
        fStack_72c = auVar298._20_4_ + fVar314;
        fStack_728 = auVar298._24_4_ + fVar217;
        fStack_724 = auVar298._28_4_ + fVar255;
        fVar309 = fVar175 * 0.0 * (float)local_7e0._0_4_;
        fVar175 = fVar211 * 0.0 * local_7e0._4_4_;
        auVar36._4_4_ = fVar175;
        auVar36._0_4_ = fVar309;
        fVar196 = fVar233 * 0.0 * local_7e0._8_4_;
        auVar36._8_4_ = fVar196;
        fVar211 = fVar251 * 0.0 * local_7e0._12_4_;
        auVar36._12_4_ = fVar211;
        fVar222 = fVar340 * 0.0 * local_7e0._16_4_;
        auVar36._16_4_ = fVar222;
        fVar233 = fVar315 * 0.0 * local_7e0._20_4_;
        auVar36._20_4_ = fVar233;
        fVar241 = fVar320 * 0.0 * local_7e0._24_4_;
        auVar36._24_4_ = fVar241;
        auVar36._28_4_ = fVar304;
        auVar260._0_4_ = (float)local_700._0_4_ + fVar309;
        auVar260._4_4_ = (float)local_700._4_4_ + fVar175;
        auVar260._8_4_ = (float)uStack_6f8 + fVar196;
        auVar260._12_4_ = uStack_6f8._4_4_ + fVar211;
        auVar260._16_4_ = (float)auStack_6f0._0_4_ + fVar222;
        auVar260._20_4_ = (float)auStack_6f0._4_4_ + fVar233;
        auVar260._24_4_ = fStack_6e8 + fVar241;
        auVar260._28_4_ = fStack_6e4 + fVar304;
        fVar309 = local_780._0_4_ * fVar192 * fVar254;
        fVar175 = local_780._4_4_ * fVar214 * fVar215;
        auVar37._4_4_ = fVar175;
        auVar37._0_4_ = fVar309;
        fVar192 = local_780._8_4_ * fVar235 * fVar237;
        auVar37._8_4_ = fVar192;
        fVar196 = local_780._12_4_ * fVar252 * fVar253;
        auVar37._12_4_ = fVar196;
        fVar211 = local_780._16_4_ * fVar341 * fVar218;
        auVar37._16_4_ = fVar211;
        fVar214 = local_780._20_4_ * fVar213 * fVar319;
        auVar37._20_4_ = fVar214;
        fVar222 = local_780._24_4_ * fVar220 * fVar321;
        auVar37._24_4_ = fVar222;
        auVar37._28_4_ = auVar30._28_4_;
        auVar288 = vsubps_avx(auVar288,auVar32);
        auVar311._0_4_ = auVar228._0_4_ + fVar309;
        auVar311._4_4_ = auVar228._4_4_ + fVar175;
        auVar311._8_4_ = auVar228._8_4_ + fVar192;
        auVar311._12_4_ = auVar228._12_4_ + fVar196;
        auVar311._16_4_ = auVar228._16_4_ + fVar211;
        auVar311._20_4_ = auVar228._20_4_ + fVar214;
        auVar311._24_4_ = auVar228._24_4_ + fVar222;
        auVar311._28_4_ = auVar228._28_4_ + auVar30._28_4_;
        fVar309 = local_780._0_4_ * fVar254 * -fVar322;
        fVar175 = local_780._4_4_ * fVar215 * -fVar212;
        auVar30._4_4_ = fVar175;
        auVar30._0_4_ = fVar309;
        fVar192 = local_780._8_4_ * fVar237 * -fVar323;
        auVar30._8_4_ = fVar192;
        fVar196 = local_780._12_4_ * fVar253 * -fVar216;
        auVar30._12_4_ = fVar196;
        fVar211 = local_780._16_4_ * fVar218 * -fVar324;
        auVar30._16_4_ = fVar211;
        fVar214 = local_780._20_4_ * fVar319 * -fVar219;
        auVar30._20_4_ = fVar214;
        fVar222 = local_780._24_4_ * fVar321 * -fVar221;
        auVar30._24_4_ = fVar222;
        auVar30._28_4_ = fVar308;
        auVar298 = vsubps_avx(auVar298,auVar33);
        auVar317._0_4_ = fVar309 + auVar203._0_4_;
        auVar317._4_4_ = fVar175 + auVar203._4_4_;
        auVar317._8_4_ = fVar192 + auVar203._8_4_;
        auVar317._12_4_ = fVar196 + auVar203._12_4_;
        auVar317._16_4_ = fVar211 + auVar203._16_4_;
        auVar317._20_4_ = fVar214 + auVar203._20_4_;
        auVar317._24_4_ = fVar222 + auVar203._24_4_;
        auVar317._28_4_ = fVar308 + auVar203._28_4_;
        fVar309 = local_780._0_4_ * fVar254 * 0.0;
        fVar175 = local_780._4_4_ * fVar215 * 0.0;
        auVar38._4_4_ = fVar175;
        auVar38._0_4_ = fVar309;
        fVar192 = local_780._8_4_ * fVar237 * 0.0;
        auVar38._8_4_ = fVar192;
        fVar254 = local_780._12_4_ * fVar253 * 0.0;
        auVar38._12_4_ = fVar254;
        fVar196 = local_780._16_4_ * fVar218 * 0.0;
        auVar38._16_4_ = fVar196;
        fVar211 = local_780._20_4_ * fVar319 * 0.0;
        auVar38._20_4_ = fVar211;
        fVar214 = local_780._24_4_ * fVar321 * 0.0;
        auVar38._24_4_ = fVar214;
        auVar38._28_4_ = fVar255;
        auVar35 = vsubps_avx(_local_700,auVar36);
        auVar116._4_4_ = fStack_4fc;
        auVar116._0_4_ = local_500;
        auVar116._8_4_ = fStack_4f8;
        auVar116._12_4_ = fStack_4f4;
        auVar116._16_4_ = fStack_4f0;
        auVar116._20_4_ = fStack_4ec;
        auVar116._24_4_ = fStack_4e8;
        auVar116._28_4_ = fStack_4e4;
        auVar342._0_4_ = local_500 + fVar309;
        auVar342._4_4_ = fStack_4fc + fVar175;
        auVar342._8_4_ = fStack_4f8 + fVar192;
        auVar342._12_4_ = fStack_4f4 + fVar254;
        auVar342._16_4_ = fStack_4f0 + fVar196;
        auVar342._20_4_ = fStack_4ec + fVar211;
        auVar342._24_4_ = fStack_4e8 + fVar214;
        auVar342._28_4_ = fStack_4e4 + fVar255;
        auVar31 = vsubps_avx(auVar228,auVar37);
        auVar30 = vsubps_avx(auVar203,auVar30);
        auVar39 = vsubps_avx(auVar116,auVar38);
        auVar172 = vsubps_avx(auVar317,auVar298);
        auVar204 = vsubps_avx(auVar342,auVar35);
        auVar40._4_4_ = auVar35._4_4_ * auVar172._4_4_;
        auVar40._0_4_ = auVar35._0_4_ * auVar172._0_4_;
        auVar40._8_4_ = auVar35._8_4_ * auVar172._8_4_;
        auVar40._12_4_ = auVar35._12_4_ * auVar172._12_4_;
        auVar40._16_4_ = auVar35._16_4_ * auVar172._16_4_;
        auVar40._20_4_ = auVar35._20_4_ * auVar172._20_4_;
        auVar40._24_4_ = auVar35._24_4_ * auVar172._24_4_;
        auVar40._28_4_ = fVar308;
        auVar41._4_4_ = auVar298._4_4_ * auVar204._4_4_;
        auVar41._0_4_ = auVar298._0_4_ * auVar204._0_4_;
        auVar41._8_4_ = auVar298._8_4_ * auVar204._8_4_;
        auVar41._12_4_ = auVar298._12_4_ * auVar204._12_4_;
        auVar41._16_4_ = auVar298._16_4_ * auVar204._16_4_;
        auVar41._20_4_ = auVar298._20_4_ * auVar204._20_4_;
        auVar41._24_4_ = auVar298._24_4_ * auVar204._24_4_;
        auVar41._28_4_ = fStack_4e4;
        auVar34 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar288._4_4_ * auVar204._4_4_;
        auVar42._0_4_ = auVar288._0_4_ * auVar204._0_4_;
        auVar42._8_4_ = auVar288._8_4_ * auVar204._8_4_;
        auVar42._12_4_ = auVar288._12_4_ * auVar204._12_4_;
        auVar42._16_4_ = auVar288._16_4_ * auVar204._16_4_;
        auVar42._20_4_ = auVar288._20_4_ * auVar204._20_4_;
        auVar42._24_4_ = auVar288._24_4_ * auVar204._24_4_;
        auVar42._28_4_ = auVar204._28_4_;
        auVar21 = vsubps_avx(auVar311,auVar288);
        auVar43._4_4_ = auVar35._4_4_ * auVar21._4_4_;
        auVar43._0_4_ = auVar35._0_4_ * auVar21._0_4_;
        auVar43._8_4_ = auVar35._8_4_ * auVar21._8_4_;
        auVar43._12_4_ = auVar35._12_4_ * auVar21._12_4_;
        auVar43._16_4_ = auVar35._16_4_ * auVar21._16_4_;
        auVar43._20_4_ = auVar35._20_4_ * auVar21._20_4_;
        auVar43._24_4_ = auVar35._24_4_ * auVar21._24_4_;
        auVar43._28_4_ = auVar228._28_4_;
        auVar22 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar21._4_4_ * auVar298._4_4_;
        auVar44._0_4_ = auVar21._0_4_ * auVar298._0_4_;
        auVar44._8_4_ = auVar21._8_4_ * auVar298._8_4_;
        auVar44._12_4_ = auVar21._12_4_ * auVar298._12_4_;
        auVar44._16_4_ = auVar21._16_4_ * auVar298._16_4_;
        auVar44._20_4_ = auVar21._20_4_ * auVar298._20_4_;
        auVar44._24_4_ = auVar21._24_4_ * auVar298._24_4_;
        auVar44._28_4_ = auVar204._28_4_;
        auVar45._4_4_ = auVar288._4_4_ * auVar172._4_4_;
        auVar45._0_4_ = auVar288._0_4_ * auVar172._0_4_;
        auVar45._8_4_ = auVar288._8_4_ * auVar172._8_4_;
        auVar45._12_4_ = auVar288._12_4_ * auVar172._12_4_;
        auVar45._16_4_ = auVar288._16_4_ * auVar172._16_4_;
        auVar45._20_4_ = auVar288._20_4_ * auVar172._20_4_;
        auVar45._24_4_ = auVar288._24_4_ * auVar172._24_4_;
        auVar45._28_4_ = auVar172._28_4_;
        auVar172 = vsubps_avx(auVar45,auVar44);
        auVar144._0_4_ = auVar34._0_4_ * 0.0 + auVar172._0_4_ + auVar22._0_4_ * 0.0;
        auVar144._4_4_ = auVar34._4_4_ * 0.0 + auVar172._4_4_ + auVar22._4_4_ * 0.0;
        auVar144._8_4_ = auVar34._8_4_ * 0.0 + auVar172._8_4_ + auVar22._8_4_ * 0.0;
        auVar144._12_4_ = auVar34._12_4_ * 0.0 + auVar172._12_4_ + auVar22._12_4_ * 0.0;
        auVar144._16_4_ = auVar34._16_4_ * 0.0 + auVar172._16_4_ + auVar22._16_4_ * 0.0;
        auVar144._20_4_ = auVar34._20_4_ * 0.0 + auVar172._20_4_ + auVar22._20_4_ * 0.0;
        auVar144._24_4_ = auVar34._24_4_ * 0.0 + auVar172._24_4_ + auVar22._24_4_ * 0.0;
        auVar144._28_4_ = auVar172._28_4_ + auVar172._28_4_ + auVar22._28_4_;
        auVar34 = vcmpps_avx(auVar144,ZEXT432(0) << 0x20,2);
        _local_7c0 = vblendvps_avx(auVar31,_local_720,auVar34);
        auVar31 = vblendvps_avx(auVar30,_local_740,auVar34);
        auVar30 = vblendvps_avx(auVar39,auVar260,auVar34);
        auVar39 = vblendvps_avx(auVar288,auVar311,auVar34);
        auVar172 = vblendvps_avx(auVar298,auVar317,auVar34);
        auVar204 = vblendvps_avx(auVar35,auVar342,auVar34);
        auVar288 = vblendvps_avx(auVar311,auVar288,auVar34);
        auVar298 = vblendvps_avx(auVar317,auVar298,auVar34);
        local_760._0_16_ = vpackssdw_avx(auVar248._0_16_,auVar248._16_16_);
        local_760._16_16_ = auVar248._16_16_;
        auVar248 = vblendvps_avx(auVar342,auVar35,auVar34);
        auVar288 = vsubps_avx(auVar288,_local_7c0);
        auVar35 = vsubps_avx(auVar298,auVar31);
        auVar21 = vsubps_avx(auVar248,auVar30);
        auVar248 = vsubps_avx(auVar31,auVar172);
        fVar309 = auVar35._0_4_;
        fVar240 = auVar30._0_4_;
        fVar211 = auVar35._4_4_;
        fVar322 = auVar30._4_4_;
        auVar46._4_4_ = fVar322 * fVar211;
        auVar46._0_4_ = fVar240 * fVar309;
        fVar235 = auVar35._8_4_;
        fVar212 = auVar30._8_4_;
        auVar46._8_4_ = fVar212 * fVar235;
        fVar253 = auVar35._12_4_;
        fVar323 = auVar30._12_4_;
        auVar46._12_4_ = fVar323 * fVar253;
        fVar314 = auVar35._16_4_;
        fVar216 = auVar30._16_4_;
        auVar46._16_4_ = fVar216 * fVar314;
        fVar320 = auVar35._20_4_;
        fVar324 = auVar30._20_4_;
        auVar46._20_4_ = fVar324 * fVar320;
        fVar150 = auVar35._24_4_;
        fVar219 = auVar30._24_4_;
        auVar46._24_4_ = fVar219 * fVar150;
        auVar46._28_4_ = auVar298._28_4_;
        fVar175 = auVar31._0_4_;
        fVar155 = auVar21._0_4_;
        fVar214 = auVar31._4_4_;
        fVar195 = auVar21._4_4_;
        auVar47._4_4_ = fVar195 * fVar214;
        auVar47._0_4_ = fVar155 * fVar175;
        fVar237 = auVar31._8_4_;
        fVar174 = auVar21._8_4_;
        auVar47._8_4_ = fVar174 * fVar237;
        fVar313 = auVar31._12_4_;
        fVar239 = auVar21._12_4_;
        auVar47._12_4_ = fVar239 * fVar313;
        fVar315 = auVar31._16_4_;
        fVar177 = auVar21._16_4_;
        auVar47._16_4_ = fVar177 * fVar315;
        fVar220 = auVar31._20_4_;
        fVar188 = auVar21._20_4_;
        auVar47._20_4_ = fVar188 * fVar220;
        fVar151 = auVar31._24_4_;
        fVar189 = auVar21._24_4_;
        auVar47._24_4_ = fVar189 * fVar151;
        auVar47._28_4_ = auVar317._28_4_;
        auVar298 = vsubps_avx(auVar47,auVar46);
        fVar192 = local_7c0._0_4_;
        fVar215 = local_7c0._4_4_;
        auVar48._4_4_ = fVar195 * fVar215;
        auVar48._0_4_ = fVar155 * fVar192;
        fVar241 = local_7c0._8_4_;
        auVar48._8_4_ = fVar174 * fVar241;
        fVar340 = local_7c0._12_4_;
        auVar48._12_4_ = fVar239 * fVar340;
        fVar213 = local_7c0._16_4_;
        auVar48._16_4_ = fVar177 * fVar213;
        fVar321 = local_7c0._20_4_;
        auVar48._20_4_ = fVar188 * fVar321;
        fVar152 = local_7c0._24_4_;
        auVar48._24_4_ = fVar189 * fVar152;
        auVar48._28_4_ = auVar317._28_4_;
        fVar254 = auVar288._0_4_;
        auVar338._0_4_ = fVar240 * fVar254;
        fVar222 = auVar288._4_4_;
        auVar338._4_4_ = fVar322 * fVar222;
        fVar251 = auVar288._8_4_;
        auVar338._8_4_ = fVar212 * fVar251;
        fVar341 = auVar288._12_4_;
        auVar338._12_4_ = fVar323 * fVar341;
        fVar319 = auVar288._16_4_;
        auVar338._16_4_ = fVar216 * fVar319;
        fVar136 = auVar288._20_4_;
        auVar338._20_4_ = fVar324 * fVar136;
        fVar153 = auVar288._24_4_;
        auVar338._24_4_ = fVar219 * fVar153;
        auVar338._28_4_ = 0;
        auVar22 = vsubps_avx(auVar338,auVar48);
        auVar49._4_4_ = fVar214 * fVar222;
        auVar49._0_4_ = fVar175 * fVar254;
        auVar49._8_4_ = fVar237 * fVar251;
        auVar49._12_4_ = fVar313 * fVar341;
        auVar49._16_4_ = fVar315 * fVar319;
        auVar49._20_4_ = fVar220 * fVar136;
        auVar49._24_4_ = fVar151 * fVar153;
        auVar49._28_4_ = auVar317._28_4_;
        auVar50._4_4_ = fVar215 * fVar211;
        auVar50._0_4_ = fVar192 * fVar309;
        auVar50._8_4_ = fVar241 * fVar235;
        auVar50._12_4_ = fVar340 * fVar253;
        auVar50._16_4_ = fVar213 * fVar314;
        auVar50._20_4_ = fVar321 * fVar320;
        auVar50._24_4_ = fVar152 * fVar150;
        auVar50._28_4_ = auVar342._28_4_;
        auVar32 = vsubps_avx(auVar50,auVar49);
        auVar33 = vsubps_avx(auVar30,auVar204);
        fVar196 = auVar32._28_4_ + auVar22._28_4_;
        auVar168._0_4_ = auVar32._0_4_ + auVar22._0_4_ * 0.0 + auVar298._0_4_ * 0.0;
        auVar168._4_4_ = auVar32._4_4_ + auVar22._4_4_ * 0.0 + auVar298._4_4_ * 0.0;
        auVar168._8_4_ = auVar32._8_4_ + auVar22._8_4_ * 0.0 + auVar298._8_4_ * 0.0;
        auVar168._12_4_ = auVar32._12_4_ + auVar22._12_4_ * 0.0 + auVar298._12_4_ * 0.0;
        auVar168._16_4_ = auVar32._16_4_ + auVar22._16_4_ * 0.0 + auVar298._16_4_ * 0.0;
        auVar168._20_4_ = auVar32._20_4_ + auVar22._20_4_ * 0.0 + auVar298._20_4_ * 0.0;
        auVar168._24_4_ = auVar32._24_4_ + auVar22._24_4_ * 0.0 + auVar298._24_4_ * 0.0;
        auVar168._28_4_ = fVar196 + auVar298._28_4_;
        fVar221 = auVar248._0_4_;
        fVar255 = auVar248._4_4_;
        auVar51._4_4_ = fVar255 * auVar204._4_4_;
        auVar51._0_4_ = fVar221 * auVar204._0_4_;
        fVar292 = auVar248._8_4_;
        auVar51._8_4_ = fVar292 * auVar204._8_4_;
        fVar293 = auVar248._12_4_;
        auVar51._12_4_ = fVar293 * auVar204._12_4_;
        fVar294 = auVar248._16_4_;
        auVar51._16_4_ = fVar294 * auVar204._16_4_;
        fVar295 = auVar248._20_4_;
        auVar51._20_4_ = fVar295 * auVar204._20_4_;
        fVar157 = auVar248._24_4_;
        auVar51._24_4_ = fVar157 * auVar204._24_4_;
        auVar51._28_4_ = fVar196;
        fVar196 = auVar33._0_4_;
        fVar233 = auVar33._4_4_;
        auVar52._4_4_ = auVar172._4_4_ * fVar233;
        auVar52._0_4_ = auVar172._0_4_ * fVar196;
        fVar252 = auVar33._8_4_;
        auVar52._8_4_ = auVar172._8_4_ * fVar252;
        fVar218 = auVar33._12_4_;
        auVar52._12_4_ = auVar172._12_4_ * fVar218;
        fVar217 = auVar33._16_4_;
        auVar52._16_4_ = auVar172._16_4_ * fVar217;
        fVar149 = auVar33._20_4_;
        auVar52._20_4_ = auVar172._20_4_ * fVar149;
        fVar154 = auVar33._24_4_;
        auVar52._24_4_ = auVar172._24_4_ * fVar154;
        auVar52._28_4_ = auVar32._28_4_;
        auVar248 = vsubps_avx(auVar52,auVar51);
        auVar22 = vsubps_avx(_local_7c0,auVar39);
        fVar190 = auVar22._0_4_;
        fVar191 = auVar22._4_4_;
        auVar53._4_4_ = fVar191 * auVar204._4_4_;
        auVar53._0_4_ = fVar190 * auVar204._0_4_;
        fVar193 = auVar22._8_4_;
        auVar53._8_4_ = fVar193 * auVar204._8_4_;
        fVar194 = auVar22._12_4_;
        auVar53._12_4_ = fVar194 * auVar204._12_4_;
        fVar223 = auVar22._16_4_;
        auVar53._16_4_ = fVar223 * auVar204._16_4_;
        fVar234 = auVar22._20_4_;
        auVar53._20_4_ = fVar234 * auVar204._20_4_;
        fVar236 = auVar22._24_4_;
        auVar53._24_4_ = fVar236 * auVar204._24_4_;
        auVar53._28_4_ = auVar204._28_4_;
        auVar54._4_4_ = auVar39._4_4_ * fVar233;
        auVar54._0_4_ = auVar39._0_4_ * fVar196;
        auVar54._8_4_ = auVar39._8_4_ * fVar252;
        auVar54._12_4_ = auVar39._12_4_ * fVar218;
        auVar54._16_4_ = auVar39._16_4_ * fVar217;
        auVar54._20_4_ = auVar39._20_4_ * fVar149;
        auVar54._24_4_ = auVar39._24_4_ * fVar154;
        auVar54._28_4_ = auVar298._28_4_;
        auVar298 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar172._4_4_ * fVar191;
        auVar55._0_4_ = auVar172._0_4_ * fVar190;
        auVar55._8_4_ = auVar172._8_4_ * fVar193;
        auVar55._12_4_ = auVar172._12_4_ * fVar194;
        auVar55._16_4_ = auVar172._16_4_ * fVar223;
        auVar55._20_4_ = auVar172._20_4_ * fVar234;
        auVar55._24_4_ = auVar172._24_4_ * fVar236;
        auVar55._28_4_ = auVar204._28_4_;
        auVar56._4_4_ = auVar39._4_4_ * fVar255;
        auVar56._0_4_ = auVar39._0_4_ * fVar221;
        auVar56._8_4_ = auVar39._8_4_ * fVar292;
        auVar56._12_4_ = auVar39._12_4_ * fVar293;
        auVar56._16_4_ = auVar39._16_4_ * fVar294;
        auVar56._20_4_ = auVar39._20_4_ * fVar295;
        auVar56._24_4_ = auVar39._24_4_ * fVar157;
        auVar56._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar56,auVar55);
        auVar173 = ZEXT864(0) << 0x20;
        auVar230._0_4_ = auVar248._0_4_ * 0.0 + auVar39._0_4_ + auVar298._0_4_ * 0.0;
        auVar230._4_4_ = auVar248._4_4_ * 0.0 + auVar39._4_4_ + auVar298._4_4_ * 0.0;
        auVar230._8_4_ = auVar248._8_4_ * 0.0 + auVar39._8_4_ + auVar298._8_4_ * 0.0;
        auVar230._12_4_ = auVar248._12_4_ * 0.0 + auVar39._12_4_ + auVar298._12_4_ * 0.0;
        auVar230._16_4_ = auVar248._16_4_ * 0.0 + auVar39._16_4_ + auVar298._16_4_ * 0.0;
        auVar230._20_4_ = auVar248._20_4_ * 0.0 + auVar39._20_4_ + auVar298._20_4_ * 0.0;
        auVar230._24_4_ = auVar248._24_4_ * 0.0 + auVar39._24_4_ + auVar298._24_4_ * 0.0;
        auVar230._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar298._28_4_;
        auVar248 = vmaxps_avx(auVar168,auVar230);
        auVar248 = vcmpps_avx(auVar248,ZEXT832(0) << 0x20,2);
        auVar243 = vpackssdw_avx(auVar248._0_16_,auVar248._16_16_);
        auVar243 = vpand_avx(auVar243,local_760._0_16_);
        auVar181 = vpmovsxwd_avx(auVar243);
        auVar227 = vpunpckhwd_avx(auVar243,auVar243);
        auVar205._16_16_ = auVar227;
        auVar205._0_16_ = auVar181;
        if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar205 >> 0x7f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar227 >> 0x3f,0) == '\0') &&
            (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar227[0xf]) {
LAB_01021c7c:
          auVar148 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar210 = ZEXT3264(auVar205);
          auVar273 = ZEXT3264(local_560);
          auVar302 = ZEXT3264(local_580);
        }
        else {
          auVar57._4_4_ = fVar233 * fVar211;
          auVar57._0_4_ = fVar196 * fVar309;
          auVar57._8_4_ = fVar252 * fVar235;
          auVar57._12_4_ = fVar218 * fVar253;
          auVar57._16_4_ = fVar217 * fVar314;
          auVar57._20_4_ = fVar149 * fVar320;
          auVar57._24_4_ = fVar154 * fVar150;
          auVar57._28_4_ = auVar227._12_4_;
          auVar327._0_4_ = fVar221 * fVar155;
          auVar327._4_4_ = fVar255 * fVar195;
          auVar327._8_4_ = fVar292 * fVar174;
          auVar327._12_4_ = fVar293 * fVar239;
          auVar327._16_4_ = fVar294 * fVar177;
          auVar327._20_4_ = fVar295 * fVar188;
          auVar327._24_4_ = fVar157 * fVar189;
          auVar327._28_4_ = 0;
          auVar248 = vsubps_avx(auVar327,auVar57);
          auVar58._4_4_ = fVar191 * fVar195;
          auVar58._0_4_ = fVar190 * fVar155;
          auVar58._8_4_ = fVar193 * fVar174;
          auVar58._12_4_ = fVar194 * fVar239;
          auVar58._16_4_ = fVar223 * fVar177;
          auVar58._20_4_ = fVar234 * fVar188;
          auVar58._24_4_ = fVar236 * fVar189;
          auVar58._28_4_ = auVar21._28_4_;
          auVar59._4_4_ = fVar233 * fVar222;
          auVar59._0_4_ = fVar196 * fVar254;
          auVar59._8_4_ = fVar252 * fVar251;
          auVar59._12_4_ = fVar218 * fVar341;
          auVar59._16_4_ = fVar217 * fVar319;
          auVar59._20_4_ = fVar149 * fVar136;
          auVar59._24_4_ = fVar154 * fVar153;
          auVar59._28_4_ = auVar33._28_4_;
          auVar172 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar255 * fVar222;
          auVar60._0_4_ = fVar221 * fVar254;
          auVar60._8_4_ = fVar292 * fVar251;
          auVar60._12_4_ = fVar293 * fVar341;
          auVar60._16_4_ = fVar294 * fVar319;
          auVar60._20_4_ = fVar295 * fVar136;
          auVar60._24_4_ = fVar157 * fVar153;
          auVar60._28_4_ = auVar168._28_4_;
          auVar61._4_4_ = fVar191 * fVar211;
          auVar61._0_4_ = fVar190 * fVar309;
          auVar61._8_4_ = fVar193 * fVar235;
          auVar61._12_4_ = fVar194 * fVar253;
          auVar61._16_4_ = fVar223 * fVar314;
          auVar61._20_4_ = fVar234 * fVar320;
          auVar61._24_4_ = fVar236 * fVar150;
          auVar61._28_4_ = auVar35._28_4_;
          auVar204 = vsubps_avx(auVar61,auVar60);
          auVar272._0_4_ = auVar248._0_4_ * 0.0 + auVar204._0_4_ + auVar172._0_4_ * 0.0;
          auVar272._4_4_ = auVar248._4_4_ * 0.0 + auVar204._4_4_ + auVar172._4_4_ * 0.0;
          auVar272._8_4_ = auVar248._8_4_ * 0.0 + auVar204._8_4_ + auVar172._8_4_ * 0.0;
          auVar272._12_4_ = auVar248._12_4_ * 0.0 + auVar204._12_4_ + auVar172._12_4_ * 0.0;
          auVar272._16_4_ = auVar248._16_4_ * 0.0 + auVar204._16_4_ + auVar172._16_4_ * 0.0;
          auVar272._20_4_ = auVar248._20_4_ * 0.0 + auVar204._20_4_ + auVar172._20_4_ * 0.0;
          auVar272._24_4_ = auVar248._24_4_ * 0.0 + auVar204._24_4_ + auVar172._24_4_ * 0.0;
          auVar272._28_4_ = auVar35._28_4_ + auVar204._28_4_ + auVar168._28_4_;
          auVar39 = vrcpps_avx(auVar272);
          fVar309 = auVar39._0_4_;
          fVar254 = auVar39._4_4_;
          auVar62._4_4_ = auVar272._4_4_ * fVar254;
          auVar62._0_4_ = auVar272._0_4_ * fVar309;
          fVar196 = auVar39._8_4_;
          auVar62._8_4_ = auVar272._8_4_ * fVar196;
          fVar211 = auVar39._12_4_;
          auVar62._12_4_ = auVar272._12_4_ * fVar211;
          fVar222 = auVar39._16_4_;
          auVar62._16_4_ = auVar272._16_4_ * fVar222;
          fVar233 = auVar39._20_4_;
          auVar62._20_4_ = auVar272._20_4_ * fVar233;
          fVar235 = auVar39._24_4_;
          auVar62._24_4_ = auVar272._24_4_ * fVar235;
          auVar62._28_4_ = auVar33._28_4_;
          auVar328._8_4_ = 0x3f800000;
          auVar328._0_8_ = &DAT_3f8000003f800000;
          auVar328._12_4_ = 0x3f800000;
          auVar328._16_4_ = 0x3f800000;
          auVar328._20_4_ = 0x3f800000;
          auVar328._24_4_ = 0x3f800000;
          auVar328._28_4_ = 0x3f800000;
          auVar298 = vsubps_avx(auVar328,auVar62);
          fVar309 = auVar298._0_4_ * fVar309 + fVar309;
          fVar254 = auVar298._4_4_ * fVar254 + fVar254;
          fVar196 = auVar298._8_4_ * fVar196 + fVar196;
          fVar211 = auVar298._12_4_ * fVar211 + fVar211;
          fVar222 = auVar298._16_4_ * fVar222 + fVar222;
          fVar233 = auVar298._20_4_ * fVar233 + fVar233;
          fVar235 = auVar298._24_4_ * fVar235 + fVar235;
          auVar63._4_4_ =
               (auVar248._4_4_ * fVar215 + auVar172._4_4_ * fVar214 + auVar204._4_4_ * fVar322) *
               fVar254;
          auVar63._0_4_ =
               (auVar248._0_4_ * fVar192 + auVar172._0_4_ * fVar175 + auVar204._0_4_ * fVar240) *
               fVar309;
          auVar63._8_4_ =
               (auVar248._8_4_ * fVar241 + auVar172._8_4_ * fVar237 + auVar204._8_4_ * fVar212) *
               fVar196;
          auVar63._12_4_ =
               (auVar248._12_4_ * fVar340 + auVar172._12_4_ * fVar313 + auVar204._12_4_ * fVar323) *
               fVar211;
          auVar63._16_4_ =
               (auVar248._16_4_ * fVar213 + auVar172._16_4_ * fVar315 + auVar204._16_4_ * fVar216) *
               fVar222;
          auVar63._20_4_ =
               (auVar248._20_4_ * fVar321 + auVar172._20_4_ * fVar220 + auVar204._20_4_ * fVar324) *
               fVar233;
          auVar63._24_4_ =
               (auVar248._24_4_ * fVar152 + auVar172._24_4_ * fVar151 + auVar204._24_4_ * fVar219) *
               fVar235;
          auVar63._28_4_ = local_7c0._28_4_ + auVar288._28_4_ + auVar30._28_4_;
          auVar181 = vpermilps_avx(ZEXT416(uVar130),0);
          auVar206._16_16_ = auVar181;
          auVar206._0_16_ = auVar181;
          auVar248 = vcmpps_avx(auVar206,auVar63,2);
          uVar284 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar246._4_4_ = uVar284;
          auVar246._0_4_ = uVar284;
          auVar246._8_4_ = uVar284;
          auVar246._12_4_ = uVar284;
          auVar246._16_4_ = uVar284;
          auVar246._20_4_ = uVar284;
          auVar246._24_4_ = uVar284;
          auVar246._28_4_ = uVar284;
          auVar30 = vcmpps_avx(auVar63,auVar246,2);
          auVar248 = vandps_avx(auVar30,auVar248);
          auVar181 = vpackssdw_avx(auVar248._0_16_,auVar248._16_16_);
          auVar243 = vpand_avx(auVar243,auVar181);
          auVar181 = vpmovsxwd_avx(auVar243);
          auVar227 = vpshufd_avx(auVar243,0xee);
          auVar227 = vpmovsxwd_avx(auVar227);
          auVar205._16_16_ = auVar227;
          auVar205._0_16_ = auVar181;
          if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar205 >> 0x7f,0) == '\0') &&
                (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar227 >> 0x3f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar227[0xf]) goto LAB_01021c7c;
          auVar248 = vcmpps_avx(ZEXT832(0) << 0x20,auVar272,4);
          auVar181 = vpackssdw_avx(auVar248._0_16_,auVar248._16_16_);
          auVar243 = vpand_avx(auVar243,auVar181);
          auVar181 = vpmovsxwd_avx(auVar243);
          auVar243 = vpunpckhwd_avx(auVar243,auVar243);
          auVar210 = ZEXT1664(auVar243);
          auVar261._16_16_ = auVar243;
          auVar261._0_16_ = auVar181;
          auVar148 = ZEXT3264(CONCAT824(uStack_508,
                                        CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          auVar273 = ZEXT3264(local_560);
          auVar302 = ZEXT3264(local_580);
          if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar261 >> 0x7f,0) != '\0') ||
                (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar243 >> 0x3f,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar243[0xf] < '\0') {
            auVar207._0_4_ = auVar168._0_4_ * fVar309;
            auVar207._4_4_ = auVar168._4_4_ * fVar254;
            auVar207._8_4_ = auVar168._8_4_ * fVar196;
            auVar207._12_4_ = auVar168._12_4_ * fVar211;
            auVar207._16_4_ = auVar168._16_4_ * fVar222;
            auVar207._20_4_ = auVar168._20_4_ * fVar233;
            auVar207._24_4_ = auVar168._24_4_ * fVar235;
            auVar207._28_4_ = 0;
            auVar64._4_4_ = auVar230._4_4_ * fVar254;
            auVar64._0_4_ = auVar230._0_4_ * fVar309;
            auVar64._8_4_ = auVar230._8_4_ * fVar196;
            auVar64._12_4_ = auVar230._12_4_ * fVar211;
            auVar64._16_4_ = auVar230._16_4_ * fVar222;
            auVar64._20_4_ = auVar230._20_4_ * fVar233;
            auVar64._24_4_ = auVar230._24_4_ * fVar235;
            auVar64._28_4_ = auVar298._28_4_ + auVar39._28_4_;
            auVar247._8_4_ = 0x3f800000;
            auVar247._0_8_ = &DAT_3f8000003f800000;
            auVar247._12_4_ = 0x3f800000;
            auVar247._16_4_ = 0x3f800000;
            auVar247._20_4_ = 0x3f800000;
            auVar247._24_4_ = 0x3f800000;
            auVar247._28_4_ = 0x3f800000;
            auVar248 = vsubps_avx(auVar247,auVar207);
            auVar248 = vblendvps_avx(auVar248,auVar207,auVar34);
            auVar273 = ZEXT3264(auVar248);
            auVar248 = vsubps_avx(auVar247,auVar64);
            auVar210 = ZEXT3264(auVar248);
            _local_3c0 = vblendvps_avx(auVar248,auVar64,auVar34);
            auVar148 = ZEXT3264(auVar261);
            auVar302 = ZEXT3264(auVar63);
          }
        }
        auVar318 = ZEXT3264(_local_7a0);
        local_560 = auVar273._0_32_;
        local_580 = auVar302._0_32_;
        auVar248 = auVar148._0_32_;
        if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar248 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar248 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar248 >> 0x7f,0) == '\0') &&
              (auVar148 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar248 >> 0xbf,0) == '\0') &&
            (auVar148 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar148[0x1f]) {
          uVar129 = 0;
        }
        else {
          auVar30 = vsubps_avx(local_780,local_7e0);
          fVar175 = (float)local_7e0._0_4_ + auVar30._0_4_ * auVar273._0_4_;
          fVar192 = local_7e0._4_4_ + auVar30._4_4_ * auVar273._4_4_;
          fVar254 = local_7e0._8_4_ + auVar30._8_4_ * auVar273._8_4_;
          fVar196 = local_7e0._12_4_ + auVar30._12_4_ * auVar273._12_4_;
          fVar211 = local_7e0._16_4_ + auVar30._16_4_ * auVar273._16_4_;
          fVar214 = local_7e0._20_4_ + auVar30._20_4_ * auVar273._20_4_;
          fVar215 = local_7e0._24_4_ + auVar30._24_4_ * auVar273._24_4_;
          fVar222 = auVar30._28_4_ + 0.0;
          fVar309 = *(float *)((long)local_698->ray_space + k * 4 + -0x10);
          auVar65._4_4_ = (fVar192 + fVar192) * fVar309;
          auVar65._0_4_ = (fVar175 + fVar175) * fVar309;
          auVar65._8_4_ = (fVar254 + fVar254) * fVar309;
          auVar65._12_4_ = (fVar196 + fVar196) * fVar309;
          auVar65._16_4_ = (fVar211 + fVar211) * fVar309;
          auVar65._20_4_ = (fVar214 + fVar214) * fVar309;
          auVar65._24_4_ = (fVar215 + fVar215) * fVar309;
          auVar65._28_4_ = fVar222 + fVar222;
          auVar30 = vcmpps_avx(local_580,auVar65,6);
          auVar39 = auVar248 & auVar30;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0x7f,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0xbf,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar39[0x1f] < '\0') {
            local_240 = vandps_avx(auVar30,auVar248);
            local_2e0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
            local_2e0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
            fStack_2d8 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
            fStack_2d4 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
            fStack_2d0 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
            fStack_2cc = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
            fStack_2c8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
            fStack_2c4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
            local_2a0 = 0;
            uStack_288 = uStack_6a8;
            uStack_278 = local_540._8_8_;
            uStack_268 = local_4d0._8_8_;
            uStack_258 = local_4e0._8_8_;
            local_3c0._4_4_ = local_2e0._4_4_;
            local_3c0._0_4_ = local_2e0._0_4_;
            uStack_3b8._0_4_ = fStack_2d8;
            uStack_3b8._4_4_ = fStack_2d4;
            uStack_3b0._0_4_ = fStack_2d0;
            uStack_3b0._4_4_ = fStack_2cc;
            auVar166 = _local_3c0;
            uStack_3a8._0_4_ = fStack_2c8;
            uStack_3a8._4_4_ = fStack_2c4;
            auVar248 = _local_3c0;
            if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar129 = CONCAT71((int7)(uVar129 >> 8),1),
                 pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar184._0_4_ = 1.0 / auVar201._0_4_;
                auVar184._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar243 = vshufps_avx(auVar184,auVar184,0);
                local_220[0] = auVar243._0_4_ * (auVar273._0_4_ + 0.0);
                local_220[1] = auVar243._4_4_ * (auVar273._4_4_ + 1.0);
                local_220[2] = auVar243._8_4_ * (auVar273._8_4_ + 2.0);
                local_220[3] = auVar243._12_4_ * (auVar273._12_4_ + 3.0);
                fStack_210 = auVar243._0_4_ * (auVar273._16_4_ + 4.0);
                fStack_20c = auVar243._4_4_ * (auVar273._20_4_ + 5.0);
                fStack_208 = auVar243._8_4_ * (auVar273._24_4_ + 6.0);
                fStack_204 = auVar273._28_4_ + 7.0;
                uStack_3b0 = auVar166._16_8_;
                uStack_3a8 = auVar248._24_8_;
                local_200 = local_3c0;
                uStack_1f8 = uStack_3b8;
                uStack_1f0 = uStack_3b0;
                uStack_1e8 = uStack_3a8;
                local_1e0 = local_580;
                iVar127 = vmovmskps_avx(local_240);
                uVar134 = CONCAT44((int)((ulong)lVar133 >> 0x20),iVar127);
                uVar131 = 0;
                if (uVar134 != 0) {
                  for (; (uVar134 >> uVar131 & 1) == 0; uVar131 = uVar131 + 1) {
                  }
                }
                uVar129 = CONCAT71((int7)(uVar129 >> 8),iVar127 != 0);
                auVar30 = local_580;
                auVar39 = local_560;
                _local_3c0 = auVar248;
                if (iVar127 != 0) {
                  _local_820 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
                  _auStack_810 = auVar31._16_16_;
                  _local_660 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
                  _auStack_650 = auVar228._16_16_;
                  _auStack_6d0 = auVar203._16_16_;
                  uStack_6d8 = local_540._8_8_;
                  local_6e0 = (undefined1  [8])local_540._0_8_;
                  uStack_6f8 = local_4d0._8_8_;
                  local_700 = (undefined1  [8])local_4d0._0_8_;
                  uStack_718 = local_4e0._8_8_;
                  local_720 = (undefined1  [8])local_4e0._0_8_;
                  _local_740 = *local_6a0;
                  _local_380 = *pauVar9;
                  local_300 = local_560;
                  local_2c0 = local_580;
                  local_29c = uVar15;
                  local_290 = local_6b0;
                  local_280 = local_540._0_8_;
                  local_270 = local_4d0._0_8_;
                  local_260 = local_4e0._0_8_;
                  do {
                    uVar284 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_440 = local_220[uVar131];
                    local_430 = *(undefined4 *)((long)&local_200 + uVar131 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar131 * 4);
                    fVar175 = 1.0 - local_440;
                    fVar309 = local_440 * fVar175 * 4.0;
                    auVar243 = ZEXT416((uint)(local_440 * local_440 * 0.5));
                    auVar243 = vshufps_avx(auVar243,auVar243,0);
                    auVar181 = ZEXT416((uint)((fVar175 * fVar175 + fVar309) * 0.5));
                    auVar181 = vshufps_avx(auVar181,auVar181,0);
                    auVar227 = ZEXT416((uint)((-local_440 * local_440 - fVar309) * 0.5));
                    auVar227 = vshufps_avx(auVar227,auVar227,0);
                    local_690.context = context->user;
                    auVar202 = ZEXT416((uint)(fVar175 * -fVar175 * 0.5));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    auVar185._0_4_ =
                         auVar202._0_4_ * (float)local_6b0._0_4_ +
                         auVar227._0_4_ * (float)local_6e0._0_4_ +
                         auVar243._0_4_ * (float)local_720._0_4_ +
                         auVar181._0_4_ * (float)local_700._0_4_;
                    auVar185._4_4_ =
                         auVar202._4_4_ * (float)local_6b0._4_4_ +
                         auVar227._4_4_ * (float)local_6e0._4_4_ +
                         auVar243._4_4_ * (float)local_720._4_4_ +
                         auVar181._4_4_ * (float)local_700._4_4_;
                    auVar185._8_4_ =
                         auVar202._8_4_ * (float)uStack_6a8 +
                         auVar227._8_4_ * (float)uStack_6d8 +
                         auVar243._8_4_ * (float)uStack_718 + auVar181._8_4_ * (float)uStack_6f8;
                    auVar185._12_4_ =
                         auVar202._12_4_ * uStack_6a8._4_4_ +
                         auVar227._12_4_ * uStack_6d8._4_4_ +
                         auVar243._12_4_ * uStack_718._4_4_ + auVar181._12_4_ * uStack_6f8._4_4_;
                    local_470 = (RTCHitN  [16])vshufps_avx(auVar185,auVar185,0);
                    local_460 = vshufps_avx(auVar185,auVar185,0x55);
                    auVar210 = ZEXT1664(local_460);
                    local_450 = vshufps_avx(auVar185,auVar185,0xaa);
                    local_420 = local_660;
                    uStack_418 = uStack_658;
                    local_410 = local_820;
                    uStack_408 = uStack_818;
                    vcmpps_avx(auVar173._0_32_,auVar173._0_32_,0xf);
                    uStack_3fc = (local_690.context)->instID[0];
                    local_400 = uStack_3fc;
                    uStack_3f8 = uStack_3fc;
                    uStack_3f4 = uStack_3fc;
                    uStack_3f0 = (local_690.context)->instPrimID[0];
                    uStack_3ec = uStack_3f0;
                    uStack_3e8 = uStack_3f0;
                    uStack_3e4 = uStack_3f0;
                    local_840 = local_740;
                    uStack_838 = uStack_738;
                    local_690.valid = (int *)&local_840;
                    local_690.geometryUserPtr = pGVar16->userPtr;
                    local_690.hit = local_470;
                    local_690.N = 4;
                    local_7e0._0_4_ = (int)uVar129;
                    local_760._0_8_ = uVar134;
                    local_780._0_8_ = uVar131;
                    local_7c0._0_4_ = uVar284;
                    local_690.ray = (RTCRayN *)ray;
                    fStack_43c = local_440;
                    fStack_438 = local_440;
                    fStack_434 = local_440;
                    uStack_42c = local_430;
                    uStack_428 = local_430;
                    uStack_424 = local_430;
                    if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar210 = ZEXT1664(local_460);
                      (*pGVar16->occlusionFilterN)(&local_690);
                      uVar129 = (ulong)(uint)local_7e0._0_4_;
                      auVar318 = ZEXT3264(_local_7a0);
                      auVar302 = ZEXT3264(local_580);
                      auVar273 = ZEXT3264(local_560);
                      auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar134 = local_760._0_8_;
                      uVar131 = local_780._0_8_;
                      uVar284 = local_7c0._0_4_;
                    }
                    auVar114._8_8_ = uStack_838;
                    auVar114._0_8_ = local_840;
                    if (auVar114 == (undefined1  [16])0x0) {
                      auVar243 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar243 = auVar243 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        (*p_Var19)(&local_690);
                        uVar129 = (ulong)(uint)local_7e0._0_4_;
                        auVar318 = ZEXT3264(_local_7a0);
                        auVar302 = ZEXT3264(local_580);
                        auVar273 = ZEXT3264(local_560);
                        auVar173 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar134 = local_760._0_8_;
                        uVar131 = local_780._0_8_;
                        uVar284 = local_7c0._0_4_;
                      }
                      auVar115._8_8_ = uStack_838;
                      auVar115._0_8_ = local_840;
                      auVar181 = vpcmpeqd_avx((undefined1  [16])0x0,auVar115);
                      auVar243 = auVar181 ^ _DAT_01febe20;
                      auVar186._8_4_ = 0xff800000;
                      auVar186._0_8_ = 0xff800000ff800000;
                      auVar186._12_4_ = 0xff800000;
                      auVar181 = vblendvps_avx(auVar186,*(undefined1 (*) [16])(local_690.ray + 0x80)
                                               ,auVar181);
                      *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar181;
                    }
                    auVar165._8_8_ = 0x100000001;
                    auVar165._0_8_ = 0x100000001;
                    auVar30 = auVar302._0_32_;
                    auVar39 = auVar273._0_32_;
                    if ((auVar165 & auVar243) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar284;
                    uVar134 = uVar134 ^ 1L << (uVar131 & 0x3f);
                    uVar131 = 0;
                    if (uVar134 != 0) {
                      for (; (uVar134 >> uVar131 & 1) == 0; uVar131 = uVar131 + 1) {
                      }
                    }
                    uVar129 = CONCAT71((int7)(uVar129 >> 8),uVar134 != 0);
                  } while (uVar134 != 0);
                }
                local_560 = auVar39;
                local_580 = auVar30;
                uVar129 = uVar129 & 0xffffffffffffff01;
              }
              goto LAB_01020d1a;
            }
          }
          uVar129 = 0;
        }
      }
LAB_01020d1a:
      auVar173 = ZEXT1664(local_800._0_16_);
      if (8 < (int)uVar15) {
        _local_380 = vpshufd_avx(ZEXT416(uVar15),0);
        auVar243 = vshufps_avx(local_800._0_16_,local_800._0_16_,0);
        local_3a0._16_16_ = auVar243;
        local_3a0._0_16_ = auVar243;
        auVar243 = vpermilps_avx(ZEXT416(uVar130),0);
        local_100._16_16_ = auVar243;
        local_100._0_16_ = auVar243;
        auVar141._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar141._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar243 = vshufps_avx(auVar141,auVar141,0);
        register0x00001210 = auVar243;
        _local_120 = auVar243;
        local_320 = vshufps_avx(ZEXT416((uint)local_828),ZEXT416((uint)local_828),0);
        local_5d0 = vshufps_avx(ZEXT416((uint)local_5d0._0_4_),ZEXT416((uint)local_5d0._0_4_),0);
        auVar148 = ZEXT1664(local_5d0);
        lVar135 = 8;
        fVar309 = (float)local_620._0_4_;
        fVar175 = (float)local_620._4_4_;
        fVar192 = fStack_618;
        fVar254 = fStack_614;
        fVar196 = fStack_610;
        fVar211 = fStack_60c;
        fVar214 = fStack_608;
        fVar215 = (float)local_5a0._0_4_;
        fVar222 = (float)local_5a0._4_4_;
        fVar233 = fStack_598;
        fVar235 = fStack_594;
        fVar237 = fStack_590;
        fVar241 = fStack_58c;
        fVar251 = fStack_588;
        fVar252 = (float)local_5c0._0_4_;
        fVar253 = (float)local_5c0._4_4_;
        fVar313 = fStack_5b8;
        fVar340 = fStack_5b4;
        fVar341 = fStack_5b0;
        fVar218 = fStack_5ac;
        fVar314 = fStack_5a8;
        do {
          pauVar10 = (undefined1 (*) [28])(bspline_basis0 + lVar135 * 4 + lVar20);
          fVar315 = *(float *)*pauVar10;
          fVar213 = *(float *)(*pauVar10 + 4);
          fVar319 = *(float *)(*pauVar10 + 8);
          fVar217 = *(float *)(*pauVar10 + 0xc);
          fVar320 = *(float *)(*pauVar10 + 0x10);
          fVar220 = *(float *)(*pauVar10 + 0x14);
          fVar321 = *(float *)(*pauVar10 + 0x18);
          auVar122 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x222bfac + lVar135 * 4);
          fVar136 = *(float *)*pauVar11;
          fVar149 = *(float *)(*pauVar11 + 4);
          fVar150 = *(float *)(*pauVar11 + 8);
          fVar151 = *(float *)(*pauVar11 + 0xc);
          fVar152 = *(float *)(*pauVar11 + 0x10);
          fVar153 = *(float *)(*pauVar11 + 0x14);
          fVar154 = *(float *)(*pauVar11 + 0x18);
          auVar120 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x222c430 + lVar135 * 4);
          fVar240 = *(float *)*pauVar11;
          fVar322 = *(float *)(*pauVar11 + 4);
          fVar212 = *(float *)(*pauVar11 + 8);
          fVar323 = *(float *)(*pauVar11 + 0xc);
          fVar216 = *(float *)(*pauVar11 + 0x10);
          fVar324 = *(float *)(*pauVar11 + 0x14);
          fVar219 = *(float *)(*pauVar11 + 0x18);
          auVar119 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x222c8b4 + lVar135 * 4);
          fVar221 = *(float *)*pauVar11;
          fVar255 = *(float *)(*pauVar11 + 4);
          fVar292 = *(float *)(*pauVar11 + 8);
          fVar293 = *(float *)(*pauVar11 + 0xc);
          fVar294 = *(float *)(*pauVar11 + 0x10);
          fVar295 = *(float *)(*pauVar11 + 0x14);
          fVar157 = *(float *)(*pauVar11 + 0x18);
          auVar118 = *pauVar11;
          fVar194 = auVar318._0_4_;
          fVar223 = auVar318._4_4_;
          fVar234 = auVar318._8_4_;
          fVar236 = auVar318._12_4_;
          fVar264 = auVar318._16_4_;
          fVar274 = auVar318._20_4_;
          fVar276 = auVar318._24_4_;
          fVar174 = auVar210._28_4_;
          fVar195 = fVar174 + *(float *)pauVar11[1];
          fVar155 = fVar174 + fVar174 + auVar148._28_4_;
          fVar239 = fVar174 + fVar195;
          local_800._0_4_ =
               (float)local_140._0_4_ * fVar315 +
               fVar215 * fVar136 + fVar309 * fVar240 + (float)local_4a0._0_4_ * fVar221;
          local_800._4_4_ =
               (float)local_140._4_4_ * fVar213 +
               fVar222 * fVar149 + fVar175 * fVar322 + (float)local_4a0._4_4_ * fVar255;
          local_800._8_4_ =
               fStack_138 * fVar319 + fVar233 * fVar150 + fVar192 * fVar212 + fStack_498 * fVar292;
          local_800._12_4_ =
               fStack_134 * fVar217 + fVar235 * fVar151 + fVar254 * fVar323 + fStack_494 * fVar293;
          local_800._16_4_ =
               fStack_130 * fVar320 + fVar237 * fVar152 + fVar196 * fVar216 + fStack_490 * fVar294;
          local_800._20_4_ =
               fStack_12c * fVar220 + fVar241 * fVar153 + fVar211 * fVar324 + fStack_48c * fVar295;
          local_800._24_4_ =
               fStack_128 * fVar321 + fVar251 * fVar154 + fVar214 * fVar219 + fStack_488 * fVar157;
          local_800._28_4_ = fVar195 + fVar155;
          fVar195 = local_360._0_4_;
          fVar177 = local_360._4_4_;
          fVar188 = local_360._8_4_;
          fVar189 = local_360._12_4_;
          fVar190 = local_360._16_4_;
          fVar191 = local_360._20_4_;
          fVar193 = local_360._24_4_;
          auVar208._0_4_ =
               fVar195 * fVar315 +
               fVar252 * fVar136 + (float)local_600._0_4_ * fVar240 + fVar194 * fVar221;
          auVar208._4_4_ =
               fVar177 * fVar213 +
               fVar253 * fVar149 + (float)local_600._4_4_ * fVar322 + fVar223 * fVar255;
          auVar208._8_4_ =
               fVar188 * fVar319 + fVar313 * fVar150 + fStack_5f8 * fVar212 + fVar234 * fVar292;
          auVar208._12_4_ =
               fVar189 * fVar217 + fVar340 * fVar151 + fStack_5f4 * fVar323 + fVar236 * fVar293;
          auVar208._16_4_ =
               fVar190 * fVar320 + fVar341 * fVar152 + fStack_5f0 * fVar216 + fVar264 * fVar294;
          auVar208._20_4_ =
               fVar191 * fVar220 + fVar218 * fVar153 + fStack_5ec * fVar324 + fVar274 * fVar295;
          auVar208._24_4_ =
               fVar193 * fVar321 + fVar314 * fVar154 + fStack_5e8 * fVar219 + fVar276 * fVar157;
          auVar208._28_4_ = fVar155 + fVar174 + fVar174 + auVar173._28_4_;
          fVar136 = (float)local_c0._0_4_ * fVar315 +
                    (float)local_a0._0_4_ * fVar136 +
                    fVar240 * (float)local_160._0_4_ + (float)local_80._0_4_ * fVar221;
          fVar149 = (float)local_c0._4_4_ * fVar213 +
                    (float)local_a0._4_4_ * fVar149 +
                    fVar322 * (float)local_160._4_4_ + (float)local_80._4_4_ * fVar255;
          fVar150 = fStack_b8 * fVar319 +
                    fStack_98 * fVar150 + fVar212 * fStack_158 + fStack_78 * fVar292;
          fVar151 = fStack_b4 * fVar217 +
                    fStack_94 * fVar151 + fVar323 * fStack_154 + fStack_74 * fVar293;
          fVar152 = fStack_b0 * fVar320 +
                    fStack_90 * fVar152 + fVar216 * fStack_150 + fStack_70 * fVar294;
          fVar153 = fStack_ac * fVar220 +
                    fStack_8c * fVar153 + fVar324 * fStack_14c + fStack_6c * fVar295;
          fVar154 = fStack_a8 * fVar321 +
                    fStack_88 * fVar154 + fVar219 * fStack_148 + fStack_68 * fVar157;
          fVar155 = fVar155 + fVar239;
          pfVar1 = (float *)(bspline_basis1 + lVar135 * 4 + lVar20);
          fVar315 = *pfVar1;
          fVar213 = pfVar1[1];
          fVar319 = pfVar1[2];
          fVar217 = pfVar1[3];
          fVar320 = pfVar1[4];
          fVar220 = pfVar1[5];
          fVar321 = pfVar1[6];
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x222e3cc + lVar135 * 4);
          fVar309 = *(float *)*pauVar11;
          fVar175 = *(float *)(*pauVar11 + 4);
          fVar192 = *(float *)(*pauVar11 + 8);
          fVar254 = *(float *)(*pauVar11 + 0xc);
          fVar196 = *(float *)(*pauVar11 + 0x10);
          fVar211 = *(float *)(*pauVar11 + 0x14);
          fVar214 = *(float *)(*pauVar11 + 0x18);
          auVar125 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x222e850 + lVar135 * 4);
          fVar215 = *(float *)*pauVar11;
          fVar222 = *(float *)(*pauVar11 + 4);
          fVar233 = *(float *)(*pauVar11 + 8);
          fVar235 = *(float *)(*pauVar11 + 0xc);
          fVar237 = *(float *)(*pauVar11 + 0x10);
          fVar241 = *(float *)(*pauVar11 + 0x14);
          fVar251 = *(float *)(*pauVar11 + 0x18);
          auVar124 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar20 + 0x222ecd4 + lVar135 * 4);
          fVar252 = *(float *)*pauVar11;
          fVar253 = *(float *)(*pauVar11 + 4);
          fVar313 = *(float *)(*pauVar11 + 8);
          fVar340 = *(float *)(*pauVar11 + 0xc);
          fVar341 = *(float *)(*pauVar11 + 0x10);
          fVar218 = *(float *)(*pauVar11 + 0x14);
          fVar314 = *(float *)(*pauVar11 + 0x18);
          auVar123 = *pauVar11;
          fVar240 = fStack_484 + fStack_484 + fVar239;
          auVar148 = ZEXT3264(local_360);
          local_760._0_4_ =
               (float)local_140._0_4_ * fVar315 +
               (float)local_5a0._0_4_ * fVar309 +
               fVar215 * (float)local_620._0_4_ + (float)local_4a0._0_4_ * fVar252;
          local_760._4_4_ =
               (float)local_140._4_4_ * fVar213 +
               (float)local_5a0._4_4_ * fVar175 +
               fVar222 * (float)local_620._4_4_ + (float)local_4a0._4_4_ * fVar253;
          local_760._8_4_ =
               fStack_138 * fVar319 +
               fStack_598 * fVar192 + fVar233 * fStack_618 + fStack_498 * fVar313;
          local_760._12_4_ =
               fStack_134 * fVar217 +
               fStack_594 * fVar254 + fVar235 * fStack_614 + fStack_494 * fVar340;
          local_760._16_4_ =
               fStack_130 * fVar320 +
               fStack_590 * fVar196 + fVar237 * fStack_610 + fStack_490 * fVar341;
          local_760._20_4_ =
               fStack_12c * fVar220 +
               fStack_58c * fVar211 + fVar241 * fStack_60c + fStack_48c * fVar218;
          local_760._24_4_ =
               fStack_128 * fVar321 +
               fStack_588 * fVar214 + fVar251 * fStack_608 + fStack_488 * fVar314;
          local_760._28_4_ = fStack_484 + fStack_64 + fVar240;
          auVar249._0_4_ =
               fVar315 * fVar195 +
               (float)local_5c0._0_4_ * fVar309 +
               (float)local_600._0_4_ * fVar215 + fVar194 * fVar252;
          auVar249._4_4_ =
               fVar213 * fVar177 +
               (float)local_5c0._4_4_ * fVar175 +
               (float)local_600._4_4_ * fVar222 + fVar223 * fVar253;
          auVar249._8_4_ =
               fVar319 * fVar188 + fStack_5b8 * fVar192 + fStack_5f8 * fVar233 + fVar234 * fVar313;
          auVar249._12_4_ =
               fVar217 * fVar189 + fStack_5b4 * fVar254 + fStack_5f4 * fVar235 + fVar236 * fVar340;
          auVar249._16_4_ =
               fVar320 * fVar190 + fStack_5b0 * fVar196 + fStack_5f0 * fVar237 + fVar264 * fVar341;
          auVar249._20_4_ =
               fVar220 * fVar191 + fStack_5ac * fVar211 + fStack_5ec * fVar241 + fVar274 * fVar218;
          auVar249._24_4_ =
               fVar321 * fVar193 + fStack_5a8 * fVar214 + fStack_5e8 * fVar251 + fVar276 * fVar314;
          auVar249._28_4_ = fVar240 + fStack_484 + fStack_484 + *(float *)pauVar10[1];
          auVar339._0_4_ =
               (float)local_a0._0_4_ * fVar309 +
               fVar215 * (float)local_160._0_4_ + (float)local_80._0_4_ * fVar252 +
               (float)local_c0._0_4_ * fVar315;
          auVar339._4_4_ =
               (float)local_a0._4_4_ * fVar175 +
               fVar222 * (float)local_160._4_4_ + (float)local_80._4_4_ * fVar253 +
               (float)local_c0._4_4_ * fVar213;
          auVar339._8_4_ =
               fStack_98 * fVar192 + fVar233 * fStack_158 + fStack_78 * fVar313 +
               fStack_b8 * fVar319;
          auVar339._12_4_ =
               fStack_94 * fVar254 + fVar235 * fStack_154 + fStack_74 * fVar340 +
               fStack_b4 * fVar217;
          auVar339._16_4_ =
               fStack_90 * fVar196 + fVar237 * fStack_150 + fStack_70 * fVar341 +
               fStack_b0 * fVar320;
          auVar339._20_4_ =
               fStack_8c * fVar211 + fVar241 * fStack_14c + fStack_6c * fVar218 +
               fStack_ac * fVar220;
          auVar339._24_4_ =
               fStack_88 * fVar214 + fVar251 * fStack_148 + fStack_68 * fVar314 +
               fStack_a8 * fVar321;
          auVar339._28_4_ = fStack_484 + fStack_484 + fStack_64 + fVar240;
          auVar173 = ZEXT3264(auVar318._0_32_);
          auVar31 = vsubps_avx(local_760,local_800);
          auVar30 = vsubps_avx(auVar249,auVar208);
          fVar215 = auVar31._0_4_;
          fVar222 = auVar31._4_4_;
          auVar66._4_4_ = fVar222 * auVar208._4_4_;
          auVar66._0_4_ = fVar215 * auVar208._0_4_;
          fVar233 = auVar31._8_4_;
          auVar66._8_4_ = fVar233 * auVar208._8_4_;
          fVar235 = auVar31._12_4_;
          auVar66._12_4_ = fVar235 * auVar208._12_4_;
          fVar237 = auVar31._16_4_;
          auVar66._16_4_ = fVar237 * auVar208._16_4_;
          fVar241 = auVar31._20_4_;
          auVar66._20_4_ = fVar241 * auVar208._20_4_;
          fVar251 = auVar31._24_4_;
          auVar66._24_4_ = fVar251 * auVar208._24_4_;
          auVar66._28_4_ = fVar240;
          fVar309 = auVar30._0_4_;
          fVar175 = auVar30._4_4_;
          auVar67._4_4_ = local_800._4_4_ * fVar175;
          auVar67._0_4_ = local_800._0_4_ * fVar309;
          fVar192 = auVar30._8_4_;
          auVar67._8_4_ = local_800._8_4_ * fVar192;
          fVar254 = auVar30._12_4_;
          auVar67._12_4_ = local_800._12_4_ * fVar254;
          fVar196 = auVar30._16_4_;
          auVar67._16_4_ = local_800._16_4_ * fVar196;
          fVar211 = auVar30._20_4_;
          auVar67._20_4_ = local_800._20_4_ * fVar211;
          fVar214 = auVar30._24_4_;
          auVar67._24_4_ = local_800._24_4_ * fVar214;
          auVar67._28_4_ = auVar249._28_4_;
          auVar39 = vsubps_avx(auVar66,auVar67);
          auVar111._4_4_ = fVar149;
          auVar111._0_4_ = fVar136;
          auVar111._8_4_ = fVar150;
          auVar111._12_4_ = fVar151;
          auVar111._16_4_ = fVar152;
          auVar111._20_4_ = fVar153;
          auVar111._24_4_ = fVar154;
          auVar111._28_4_ = fVar155;
          auVar248 = vmaxps_avx(auVar111,auVar339);
          auVar68._4_4_ = auVar248._4_4_ * auVar248._4_4_ * (fVar222 * fVar222 + fVar175 * fVar175);
          auVar68._0_4_ = auVar248._0_4_ * auVar248._0_4_ * (fVar215 * fVar215 + fVar309 * fVar309);
          auVar68._8_4_ = auVar248._8_4_ * auVar248._8_4_ * (fVar233 * fVar233 + fVar192 * fVar192);
          auVar68._12_4_ =
               auVar248._12_4_ * auVar248._12_4_ * (fVar235 * fVar235 + fVar254 * fVar254);
          auVar68._16_4_ =
               auVar248._16_4_ * auVar248._16_4_ * (fVar237 * fVar237 + fVar196 * fVar196);
          auVar68._20_4_ =
               auVar248._20_4_ * auVar248._20_4_ * (fVar241 * fVar241 + fVar211 * fVar211);
          auVar68._24_4_ =
               auVar248._24_4_ * auVar248._24_4_ * (fVar251 * fVar251 + fVar214 * fVar214);
          auVar68._28_4_ = local_760._28_4_ + auVar249._28_4_;
          auVar69._4_4_ = auVar39._4_4_ * auVar39._4_4_;
          auVar69._0_4_ = auVar39._0_4_ * auVar39._0_4_;
          auVar69._8_4_ = auVar39._8_4_ * auVar39._8_4_;
          auVar69._12_4_ = auVar39._12_4_ * auVar39._12_4_;
          auVar69._16_4_ = auVar39._16_4_ * auVar39._16_4_;
          auVar69._20_4_ = auVar39._20_4_ * auVar39._20_4_;
          auVar69._24_4_ = auVar39._24_4_ * auVar39._24_4_;
          auVar69._28_4_ = auVar39._28_4_;
          auVar248 = vcmpps_avx(auVar69,auVar68,2);
          local_2a0 = (uint)lVar135;
          auVar181 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar243 = vpor_avx(auVar181,_DAT_01ff0cf0);
          auVar181 = vpor_avx(auVar181,_DAT_02020ea0);
          auVar243 = vpcmpgtd_avx(_local_380,auVar243);
          auVar181 = vpcmpgtd_avx(_local_380,auVar181);
          auVar209._16_16_ = auVar181;
          auVar209._0_16_ = auVar243;
          auVar210 = ZEXT3264(auVar209);
          auVar39 = auVar209 & auVar248;
          fVar309 = (float)local_620._0_4_;
          fVar175 = (float)local_620._4_4_;
          fVar192 = fStack_618;
          fVar254 = fStack_614;
          fVar196 = fStack_610;
          fVar211 = fStack_60c;
          fVar214 = fStack_608;
          fVar215 = (float)local_5a0._0_4_;
          fVar222 = (float)local_5a0._4_4_;
          fVar233 = fStack_598;
          fVar235 = fStack_594;
          fVar237 = fStack_590;
          fVar241 = fStack_58c;
          fVar251 = fStack_588;
          fVar252 = (float)local_5c0._0_4_;
          fVar253 = (float)local_5c0._4_4_;
          fVar313 = fStack_5b8;
          fVar340 = fStack_5b4;
          fVar341 = fStack_5b0;
          fVar218 = fStack_5ac;
          fVar314 = fStack_5a8;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar39 >> 0x7f,0) == '\0') &&
                (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar39 >> 0xbf,0) == '\0') &&
              (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar39[0x1f]) {
            auVar318 = ZEXT3264(auVar318._0_32_);
          }
          else {
            local_700._0_4_ = auVar125._0_4_;
            local_700._4_4_ = auVar125._4_4_;
            uStack_6f8._0_4_ = auVar125._8_4_;
            uStack_6f8._4_4_ = auVar125._12_4_;
            auStack_6f0._0_4_ = auVar125._16_4_;
            auStack_6f0._4_4_ = auVar125._20_4_;
            fStack_6e8 = auVar125._24_4_;
            local_720._0_4_ = auVar124._0_4_;
            local_720._4_4_ = auVar124._4_4_;
            uStack_718._0_4_ = auVar124._8_4_;
            uStack_718._4_4_ = auVar124._12_4_;
            fStack_710 = auVar124._16_4_;
            fStack_70c = auVar124._20_4_;
            fStack_708 = auVar124._24_4_;
            fVar240 = local_360._28_4_;
            local_740._0_4_ = auVar123._0_4_;
            local_740._4_4_ = auVar123._4_4_;
            uStack_738._0_4_ = auVar123._8_4_;
            uStack_738._4_4_ = auVar123._12_4_;
            fStack_730 = auVar123._16_4_;
            fStack_72c = auVar123._20_4_;
            fStack_728 = auVar123._24_4_;
            local_720._0_4_ =
                 fVar315 * (float)local_180._0_4_ +
                 (float)local_340._0_4_ * (float)local_700._0_4_ +
                 (float)local_e0._0_4_ * (float)local_720._0_4_ +
                 (float)local_640._0_4_ * (float)local_740._0_4_;
            local_720._4_4_ =
                 fVar213 * (float)local_180._4_4_ +
                 (float)local_340._4_4_ * (float)local_700._4_4_ +
                 (float)local_e0._4_4_ * (float)local_720._4_4_ +
                 (float)local_640._4_4_ * (float)local_740._4_4_;
            uStack_718._0_4_ =
                 fVar319 * fStack_178 +
                 fStack_338 * (float)uStack_6f8 +
                 fStack_d8 * (float)uStack_718 + fStack_638 * (float)uStack_738;
            uStack_718._4_4_ =
                 fVar217 * fStack_174 +
                 fStack_334 * uStack_6f8._4_4_ +
                 fStack_d4 * uStack_718._4_4_ + fStack_634 * uStack_738._4_4_;
            fStack_710 = fVar320 * fStack_170 +
                         fStack_330 * (float)auStack_6f0._0_4_ +
                         fStack_d0 * fStack_710 + fStack_630 * fStack_730;
            fStack_70c = fVar220 * fStack_16c +
                         fStack_32c * (float)auStack_6f0._4_4_ +
                         fStack_cc * fStack_70c + fStack_62c * fStack_72c;
            fStack_708 = fVar321 * fStack_168 +
                         fStack_328 * fStack_6e8 + fStack_c8 * fStack_708 + fStack_628 * fStack_728;
            fStack_704 = local_800._28_4_ + fVar240 + auVar318._28_4_ + 0.0;
            local_820._0_4_ = auVar120._0_4_;
            local_820._4_4_ = auVar120._4_4_;
            uStack_818._0_4_ = auVar120._8_4_;
            uStack_818._4_4_ = auVar120._12_4_;
            auStack_810._0_4_ = auVar120._16_4_;
            auStack_810._4_4_ = auVar120._20_4_;
            fStack_808 = auVar120._24_4_;
            local_660._0_4_ = auVar119._0_4_;
            local_660._4_4_ = auVar119._4_4_;
            uStack_658._0_4_ = auVar119._8_4_;
            uStack_658._4_4_ = auVar119._12_4_;
            auStack_650._0_4_ = auVar119._16_4_;
            auStack_650._4_4_ = auVar119._20_4_;
            fStack_648 = auVar119._24_4_;
            local_6e0._0_4_ = auVar118._0_4_;
            local_6e0._4_4_ = auVar118._4_4_;
            uStack_6d8._0_4_ = auVar118._8_4_;
            uStack_6d8._4_4_ = auVar118._12_4_;
            auStack_6d0._0_4_ = auVar118._16_4_;
            auStack_6d0._4_4_ = auVar118._20_4_;
            fStack_6c8 = auVar118._24_4_;
            pfVar1 = (float *)(lVar20 + 0x222d640 + lVar135 * 4);
            fVar315 = *pfVar1;
            fVar213 = pfVar1[1];
            fVar319 = pfVar1[2];
            fVar217 = pfVar1[3];
            fVar320 = pfVar1[4];
            fVar220 = pfVar1[5];
            fVar321 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x222dac4 + lVar135 * 4);
            fVar322 = *pfVar2;
            fVar212 = pfVar2[1];
            fVar323 = pfVar2[2];
            fVar216 = pfVar2[3];
            fVar324 = pfVar2[4];
            fVar219 = pfVar2[5];
            fVar221 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x222d1bc + lVar135 * 4);
            fVar255 = *pfVar3;
            fVar292 = pfVar3[1];
            fVar293 = pfVar3[2];
            fVar294 = pfVar3[3];
            fVar295 = pfVar3[4];
            fVar157 = pfVar3[5];
            fVar174 = pfVar3[6];
            fVar156 = pfVar1[7] + pfVar2[7];
            fVar176 = pfVar2[7] + auVar339._28_4_ + 0.0;
            fVar263 = auVar339._28_4_ + fVar240 + auVar339._28_4_ + 0.0;
            pfVar1 = (float *)(lVar20 + 0x222cd38 + lVar135 * 4);
            fVar239 = *pfVar1;
            fVar278 = pfVar1[1];
            fVar238 = pfVar1[2];
            fVar283 = pfVar1[3];
            fVar291 = pfVar1[4];
            fVar325 = pfVar1[5];
            fVar331 = pfVar1[6];
            local_500 = fVar239 * (float)local_140._0_4_ +
                        (float)local_5a0._0_4_ * fVar255 +
                        (float)local_620._0_4_ * fVar315 + (float)local_4a0._0_4_ * fVar322;
            fStack_4fc = fVar278 * (float)local_140._4_4_ +
                         (float)local_5a0._4_4_ * fVar292 +
                         (float)local_620._4_4_ * fVar213 + (float)local_4a0._4_4_ * fVar212;
            fStack_4f8 = fVar238 * fStack_138 +
                         fStack_598 * fVar293 + fStack_618 * fVar319 + fStack_498 * fVar323;
            fStack_4f4 = fVar283 * fStack_134 +
                         fStack_594 * fVar294 + fStack_614 * fVar217 + fStack_494 * fVar216;
            fStack_4f0 = fVar291 * fStack_130 +
                         fStack_590 * fVar295 + fStack_610 * fVar320 + fStack_490 * fVar324;
            fStack_4ec = fVar325 * fStack_12c +
                         fStack_58c * fVar157 + fStack_60c * fVar220 + fStack_48c * fVar219;
            fStack_4e8 = fVar331 * fStack_128 +
                         fStack_588 * fVar174 + fStack_608 * fVar321 + fStack_488 * fVar221;
            fStack_4e4 = fVar156 + fVar176;
            auVar169._0_4_ =
                 fVar195 * fVar239 +
                 (float)local_600._0_4_ * fVar315 + fVar194 * fVar322 +
                 (float)local_5c0._0_4_ * fVar255;
            auVar169._4_4_ =
                 fVar177 * fVar278 +
                 (float)local_600._4_4_ * fVar213 + fVar223 * fVar212 +
                 (float)local_5c0._4_4_ * fVar292;
            auVar169._8_4_ =
                 fVar188 * fVar238 + fStack_5f8 * fVar319 + fVar234 * fVar323 + fStack_5b8 * fVar293
            ;
            auVar169._12_4_ =
                 fVar189 * fVar283 + fStack_5f4 * fVar217 + fVar236 * fVar216 + fStack_5b4 * fVar294
            ;
            auVar169._16_4_ =
                 fVar190 * fVar291 + fStack_5f0 * fVar320 + fVar264 * fVar324 + fStack_5b0 * fVar295
            ;
            auVar169._20_4_ =
                 fVar191 * fVar325 + fStack_5ec * fVar220 + fVar274 * fVar219 + fStack_5ac * fVar157
            ;
            auVar169._24_4_ =
                 fVar193 * fVar331 + fStack_5e8 * fVar321 + fVar276 * fVar221 + fStack_5a8 * fVar174
            ;
            auVar169._28_4_ = fVar176 + fVar263;
            auVar333._0_4_ =
                 fVar255 * (float)local_340._0_4_ +
                 (float)local_e0._0_4_ * fVar315 + (float)local_640._0_4_ * fVar322 +
                 fVar239 * (float)local_180._0_4_;
            auVar333._4_4_ =
                 fVar292 * (float)local_340._4_4_ +
                 (float)local_e0._4_4_ * fVar213 + (float)local_640._4_4_ * fVar212 +
                 fVar278 * (float)local_180._4_4_;
            auVar333._8_4_ =
                 fVar293 * fStack_338 + fStack_d8 * fVar319 + fStack_638 * fVar323 +
                 fVar238 * fStack_178;
            auVar333._12_4_ =
                 fVar294 * fStack_334 + fStack_d4 * fVar217 + fStack_634 * fVar216 +
                 fVar283 * fStack_174;
            auVar333._16_4_ =
                 fVar295 * fStack_330 + fStack_d0 * fVar320 + fStack_630 * fVar324 +
                 fVar291 * fStack_170;
            auVar333._20_4_ =
                 fVar157 * fStack_32c + fStack_cc * fVar220 + fStack_62c * fVar219 +
                 fVar325 * fStack_16c;
            auVar333._24_4_ =
                 fVar174 * fStack_328 + fStack_c8 * fVar321 + fStack_628 * fVar221 +
                 fVar331 * fStack_168;
            auVar333._28_4_ = pfVar3[7] + fVar156 + fVar263;
            pfVar1 = (float *)(lVar20 + 0x222fa60 + lVar135 * 4);
            fVar315 = *pfVar1;
            fVar213 = pfVar1[1];
            fVar319 = pfVar1[2];
            fVar217 = pfVar1[3];
            fVar320 = pfVar1[4];
            fVar220 = pfVar1[5];
            fVar321 = pfVar1[6];
            pfVar2 = (float *)(lVar20 + 0x222fee4 + lVar135 * 4);
            fVar322 = *pfVar2;
            fVar212 = pfVar2[1];
            fVar323 = pfVar2[2];
            fVar216 = pfVar2[3];
            fVar324 = pfVar2[4];
            fVar219 = pfVar2[5];
            fVar221 = pfVar2[6];
            pfVar3 = (float *)(lVar20 + 0x222f5dc + lVar135 * 4);
            fVar255 = *pfVar3;
            fVar292 = pfVar3[1];
            fVar293 = pfVar3[2];
            fVar294 = pfVar3[3];
            fVar295 = pfVar3[4];
            fVar157 = pfVar3[5];
            fVar174 = pfVar3[6];
            pfVar4 = (float *)(lVar20 + 0x222f158 + lVar135 * 4);
            fVar239 = *pfVar4;
            fVar194 = pfVar4[1];
            fVar223 = pfVar4[2];
            fVar234 = pfVar4[3];
            fVar236 = pfVar4[4];
            fVar264 = pfVar4[5];
            fVar274 = pfVar4[6];
            auVar300._0_4_ =
                 fVar239 * (float)local_140._0_4_ +
                 (float)local_5a0._0_4_ * fVar255 +
                 (float)local_620._0_4_ * fVar315 + (float)local_4a0._0_4_ * fVar322;
            auVar300._4_4_ =
                 fVar194 * (float)local_140._4_4_ +
                 (float)local_5a0._4_4_ * fVar292 +
                 (float)local_620._4_4_ * fVar213 + (float)local_4a0._4_4_ * fVar212;
            auVar300._8_4_ =
                 fVar223 * fStack_138 +
                 fStack_598 * fVar293 + fStack_618 * fVar319 + fStack_498 * fVar323;
            auVar300._12_4_ =
                 fVar234 * fStack_134 +
                 fStack_594 * fVar294 + fStack_614 * fVar217 + fStack_494 * fVar216;
            auVar300._16_4_ =
                 fVar236 * fStack_130 +
                 fStack_590 * fVar295 + fStack_610 * fVar320 + fStack_490 * fVar324;
            auVar300._20_4_ =
                 fVar264 * fStack_12c +
                 fStack_58c * fVar157 + fStack_60c * fVar220 + fStack_48c * fVar219;
            auVar300._24_4_ =
                 fVar274 * fStack_128 +
                 fStack_588 * fVar174 + fStack_608 * fVar321 + fStack_488 * fVar221;
            auVar300._28_4_ = fVar240 + fVar240 + fStack_484 + fVar240;
            auVar329._0_4_ =
                 fVar239 * fVar195 +
                 (float)local_5c0._0_4_ * fVar255 +
                 (float)local_600._0_4_ * fVar315 + fVar322 * (float)local_7a0._0_4_;
            auVar329._4_4_ =
                 fVar194 * fVar177 +
                 (float)local_5c0._4_4_ * fVar292 +
                 (float)local_600._4_4_ * fVar213 + fVar212 * (float)local_7a0._4_4_;
            auVar329._8_4_ =
                 fVar223 * fVar188 +
                 fStack_5b8 * fVar293 + fStack_5f8 * fVar319 + fVar323 * fStack_798;
            auVar329._12_4_ =
                 fVar234 * fVar189 +
                 fStack_5b4 * fVar294 + fStack_5f4 * fVar217 + fVar216 * fStack_794;
            auVar329._16_4_ =
                 fVar236 * fVar190 +
                 fStack_5b0 * fVar295 + fStack_5f0 * fVar320 + fVar324 * fStack_790;
            auVar329._20_4_ =
                 fVar264 * fVar191 +
                 fStack_5ac * fVar157 + fStack_5ec * fVar220 + fVar219 * fStack_78c;
            auVar329._24_4_ =
                 fVar274 * fVar193 +
                 fStack_5a8 * fVar174 + fStack_5e8 * fVar321 + fVar221 * fStack_788;
            auVar329._28_4_ = fVar240 + fVar240 + fStack_604 + fVar240;
            auVar250._8_4_ = 0x7fffffff;
            auVar250._0_8_ = 0x7fffffff7fffffff;
            auVar250._12_4_ = 0x7fffffff;
            auVar250._16_4_ = 0x7fffffff;
            auVar250._20_4_ = 0x7fffffff;
            auVar250._24_4_ = 0x7fffffff;
            auVar250._28_4_ = 0x7fffffff;
            auVar117._4_4_ = fStack_4fc;
            auVar117._0_4_ = local_500;
            auVar117._8_4_ = fStack_4f8;
            auVar117._12_4_ = fStack_4f4;
            auVar117._16_4_ = fStack_4f0;
            auVar117._20_4_ = fStack_4ec;
            auVar117._24_4_ = fStack_4e8;
            auVar117._28_4_ = fStack_4e4;
            auVar39 = vandps_avx(auVar117,auVar250);
            auVar172 = vandps_avx(auVar169,auVar250);
            auVar172 = vmaxps_avx(auVar39,auVar172);
            auVar39 = vandps_avx(auVar333,auVar250);
            auVar172 = vmaxps_avx(auVar172,auVar39);
            auVar172 = vcmpps_avx(auVar172,local_3a0,1);
            auVar203 = vblendvps_avx(auVar117,auVar31,auVar172);
            auVar145._0_4_ =
                 fVar239 * (float)local_180._0_4_ +
                 fVar255 * (float)local_340._0_4_ +
                 fVar322 * (float)local_640._0_4_ + (float)local_e0._0_4_ * fVar315;
            auVar145._4_4_ =
                 fVar194 * (float)local_180._4_4_ +
                 fVar292 * (float)local_340._4_4_ +
                 fVar212 * (float)local_640._4_4_ + (float)local_e0._4_4_ * fVar213;
            auVar145._8_4_ =
                 fVar223 * fStack_178 +
                 fVar293 * fStack_338 + fVar323 * fStack_638 + fStack_d8 * fVar319;
            auVar145._12_4_ =
                 fVar234 * fStack_174 +
                 fVar294 * fStack_334 + fVar216 * fStack_634 + fStack_d4 * fVar217;
            auVar145._16_4_ =
                 fVar236 * fStack_170 +
                 fVar295 * fStack_330 + fVar324 * fStack_630 + fStack_d0 * fVar320;
            auVar145._20_4_ =
                 fVar264 * fStack_16c +
                 fVar157 * fStack_32c + fVar219 * fStack_62c + fStack_cc * fVar220;
            auVar145._24_4_ =
                 fVar274 * fStack_168 +
                 fVar174 * fStack_328 + fVar221 * fStack_628 + fStack_c8 * fVar321;
            auVar145._28_4_ = auVar39._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar204 = vblendvps_avx(auVar169,auVar30,auVar172);
            auVar39 = vandps_avx(auVar300,auVar250);
            auVar172 = vandps_avx(auVar329,auVar250);
            auVar228 = vmaxps_avx(auVar39,auVar172);
            auVar39 = vandps_avx(auVar145,auVar250);
            auVar39 = vmaxps_avx(auVar228,auVar39);
            local_7c0._0_4_ = auVar122._0_4_;
            local_7c0._4_4_ = auVar122._4_4_;
            fStack_7b8 = auVar122._8_4_;
            fStack_7b4 = auVar122._12_4_;
            fStack_7b0 = auVar122._16_4_;
            fStack_7ac = auVar122._20_4_;
            fStack_7a8 = auVar122._24_4_;
            auVar172 = vcmpps_avx(auVar39,local_3a0,1);
            auVar39 = vblendvps_avx(auVar300,auVar31,auVar172);
            auVar146._0_4_ =
                 (float)local_180._0_4_ * (float)local_7c0._0_4_ +
                 (float)local_340._0_4_ * (float)local_820._0_4_ +
                 (float)local_e0._0_4_ * (float)local_660._0_4_ +
                 (float)local_640._0_4_ * (float)local_6e0._0_4_;
            auVar146._4_4_ =
                 (float)local_180._4_4_ * (float)local_7c0._4_4_ +
                 (float)local_340._4_4_ * (float)local_820._4_4_ +
                 (float)local_e0._4_4_ * (float)local_660._4_4_ +
                 (float)local_640._4_4_ * (float)local_6e0._4_4_;
            auVar146._8_4_ =
                 fStack_178 * fStack_7b8 +
                 fStack_338 * (float)uStack_818 +
                 fStack_d8 * (float)uStack_658 + fStack_638 * (float)uStack_6d8;
            auVar146._12_4_ =
                 fStack_174 * fStack_7b4 +
                 fStack_334 * uStack_818._4_4_ +
                 fStack_d4 * uStack_658._4_4_ + fStack_634 * uStack_6d8._4_4_;
            auVar146._16_4_ =
                 fStack_170 * fStack_7b0 +
                 fStack_330 * (float)auStack_810._0_4_ +
                 fStack_d0 * (float)auStack_650._0_4_ + fStack_630 * (float)auStack_6d0._0_4_;
            auVar146._20_4_ =
                 fStack_16c * fStack_7ac +
                 fStack_32c * (float)auStack_810._4_4_ +
                 fStack_cc * (float)auStack_650._4_4_ + fStack_62c * (float)auStack_6d0._4_4_;
            auVar146._24_4_ =
                 fStack_168 * fStack_7a8 +
                 fStack_328 * fStack_808 + fStack_c8 * fStack_648 + fStack_628 * fStack_6c8;
            auVar146._28_4_ = auVar228._28_4_ + fStack_704 + auVar318._28_4_ + 0.0;
            auVar172 = vblendvps_avx(auVar329,auVar30,auVar172);
            fVar274 = auVar203._0_4_;
            fVar276 = auVar203._4_4_;
            fVar278 = auVar203._8_4_;
            fVar238 = auVar203._12_4_;
            fVar283 = auVar203._16_4_;
            fVar291 = auVar203._20_4_;
            fVar325 = auVar203._24_4_;
            fVar331 = auVar203._28_4_;
            fVar221 = auVar39._0_4_;
            fVar292 = auVar39._4_4_;
            fVar294 = auVar39._8_4_;
            fVar157 = auVar39._12_4_;
            fVar174 = auVar39._16_4_;
            fVar177 = auVar39._20_4_;
            fVar189 = auVar39._24_4_;
            fVar315 = auVar204._0_4_;
            fVar319 = auVar204._4_4_;
            fVar320 = auVar204._8_4_;
            fVar321 = auVar204._12_4_;
            fVar322 = auVar204._16_4_;
            fVar323 = auVar204._20_4_;
            fVar324 = auVar204._24_4_;
            auVar312._0_4_ = fVar315 * fVar315 + fVar274 * fVar274;
            auVar312._4_4_ = fVar319 * fVar319 + fVar276 * fVar276;
            auVar312._8_4_ = fVar320 * fVar320 + fVar278 * fVar278;
            auVar312._12_4_ = fVar321 * fVar321 + fVar238 * fVar238;
            auVar312._16_4_ = fVar322 * fVar322 + fVar283 * fVar283;
            auVar312._20_4_ = fVar323 * fVar323 + fVar291 * fVar291;
            auVar312._24_4_ = fVar324 * fVar324 + fVar325 * fVar325;
            auVar312._28_4_ = fStack_5e4 + fStack_5a4;
            auVar203 = vrsqrtps_avx(auVar312);
            fVar213 = auVar203._0_4_;
            fVar217 = auVar203._4_4_;
            auVar70._4_4_ = fVar217 * 1.5;
            auVar70._0_4_ = fVar213 * 1.5;
            fVar220 = auVar203._8_4_;
            auVar70._8_4_ = fVar220 * 1.5;
            fVar240 = auVar203._12_4_;
            auVar70._12_4_ = fVar240 * 1.5;
            fVar212 = auVar203._16_4_;
            auVar70._16_4_ = fVar212 * 1.5;
            fVar216 = auVar203._20_4_;
            auVar70._20_4_ = fVar216 * 1.5;
            fVar219 = auVar203._24_4_;
            auVar70._24_4_ = fVar219 * 1.5;
            auVar70._28_4_ = auVar329._28_4_;
            auVar71._4_4_ = fVar217 * fVar217 * fVar217 * auVar312._4_4_ * 0.5;
            auVar71._0_4_ = fVar213 * fVar213 * fVar213 * auVar312._0_4_ * 0.5;
            auVar71._8_4_ = fVar220 * fVar220 * fVar220 * auVar312._8_4_ * 0.5;
            auVar71._12_4_ = fVar240 * fVar240 * fVar240 * auVar312._12_4_ * 0.5;
            auVar71._16_4_ = fVar212 * fVar212 * fVar212 * auVar312._16_4_ * 0.5;
            auVar71._20_4_ = fVar216 * fVar216 * fVar216 * auVar312._20_4_ * 0.5;
            auVar71._24_4_ = fVar219 * fVar219 * fVar219 * auVar312._24_4_ * 0.5;
            auVar71._28_4_ = auVar312._28_4_;
            auVar204 = vsubps_avx(auVar70,auVar71);
            fVar191 = auVar204._0_4_;
            fVar193 = auVar204._4_4_;
            fVar194 = auVar204._8_4_;
            fVar223 = auVar204._12_4_;
            fVar234 = auVar204._16_4_;
            fVar236 = auVar204._20_4_;
            fVar264 = auVar204._24_4_;
            fVar213 = auVar172._0_4_;
            fVar217 = auVar172._4_4_;
            fVar220 = auVar172._8_4_;
            fVar240 = auVar172._12_4_;
            fVar212 = auVar172._16_4_;
            fVar216 = auVar172._20_4_;
            fVar219 = auVar172._24_4_;
            auVar289._0_4_ = fVar213 * fVar213 + fVar221 * fVar221;
            auVar289._4_4_ = fVar217 * fVar217 + fVar292 * fVar292;
            auVar289._8_4_ = fVar220 * fVar220 + fVar294 * fVar294;
            auVar289._12_4_ = fVar240 * fVar240 + fVar157 * fVar157;
            auVar289._16_4_ = fVar212 * fVar212 + fVar174 * fVar174;
            auVar289._20_4_ = fVar216 * fVar216 + fVar177 * fVar177;
            auVar289._24_4_ = fVar219 * fVar219 + fVar189 * fVar189;
            auVar289._28_4_ = auVar203._28_4_ + auVar39._28_4_;
            auVar39 = vrsqrtps_avx(auVar289);
            fVar255 = auVar39._0_4_;
            fVar293 = auVar39._4_4_;
            auVar72._4_4_ = fVar293 * 1.5;
            auVar72._0_4_ = fVar255 * 1.5;
            fVar295 = auVar39._8_4_;
            auVar72._8_4_ = fVar295 * 1.5;
            fVar195 = auVar39._12_4_;
            auVar72._12_4_ = fVar195 * 1.5;
            fVar239 = auVar39._16_4_;
            auVar72._16_4_ = fVar239 * 1.5;
            fVar188 = auVar39._20_4_;
            auVar72._20_4_ = fVar188 * 1.5;
            fVar190 = auVar39._24_4_;
            auVar72._24_4_ = fVar190 * 1.5;
            auVar72._28_4_ = auVar329._28_4_;
            auVar73._4_4_ = fVar293 * fVar293 * fVar293 * auVar289._4_4_ * 0.5;
            auVar73._0_4_ = fVar255 * fVar255 * fVar255 * auVar289._0_4_ * 0.5;
            auVar73._8_4_ = fVar295 * fVar295 * fVar295 * auVar289._8_4_ * 0.5;
            auVar73._12_4_ = fVar195 * fVar195 * fVar195 * auVar289._12_4_ * 0.5;
            auVar73._16_4_ = fVar239 * fVar239 * fVar239 * auVar289._16_4_ * 0.5;
            auVar73._20_4_ = fVar188 * fVar188 * fVar188 * auVar289._20_4_ * 0.5;
            auVar73._24_4_ = fVar190 * fVar190 * fVar190 * auVar289._24_4_ * 0.5;
            auVar73._28_4_ = auVar289._28_4_;
            auVar172 = vsubps_avx(auVar72,auVar73);
            fVar255 = auVar172._0_4_;
            fVar293 = auVar172._4_4_;
            fVar295 = auVar172._8_4_;
            fVar195 = auVar172._12_4_;
            fVar239 = auVar172._16_4_;
            fVar188 = auVar172._20_4_;
            fVar190 = auVar172._24_4_;
            fVar315 = fVar136 * fVar191 * fVar315;
            fVar319 = fVar149 * fVar193 * fVar319;
            auVar74._4_4_ = fVar319;
            auVar74._0_4_ = fVar315;
            fVar320 = fVar150 * fVar194 * fVar320;
            auVar74._8_4_ = fVar320;
            fVar321 = fVar151 * fVar223 * fVar321;
            auVar74._12_4_ = fVar321;
            fVar322 = fVar152 * fVar234 * fVar322;
            auVar74._16_4_ = fVar322;
            fVar323 = fVar153 * fVar236 * fVar323;
            auVar74._20_4_ = fVar323;
            fVar324 = fVar154 * fVar264 * fVar324;
            auVar74._24_4_ = fVar324;
            auVar74._28_4_ = auVar39._28_4_;
            local_7c0._4_4_ = fVar319 + local_800._4_4_;
            local_7c0._0_4_ = fVar315 + local_800._0_4_;
            fStack_7b8 = fVar320 + local_800._8_4_;
            fStack_7b4 = fVar321 + local_800._12_4_;
            fStack_7b0 = fVar322 + local_800._16_4_;
            fStack_7ac = fVar323 + local_800._20_4_;
            fStack_7a8 = fVar324 + local_800._24_4_;
            fStack_7a4 = auVar39._28_4_ + local_800._28_4_;
            fVar315 = fVar136 * fVar191 * -fVar274;
            fVar319 = fVar149 * fVar193 * -fVar276;
            auVar75._4_4_ = fVar319;
            auVar75._0_4_ = fVar315;
            fVar320 = fVar150 * fVar194 * -fVar278;
            auVar75._8_4_ = fVar320;
            fVar321 = fVar151 * fVar223 * -fVar238;
            auVar75._12_4_ = fVar321;
            fVar322 = fVar152 * fVar234 * -fVar283;
            auVar75._16_4_ = fVar322;
            fVar323 = fVar153 * fVar236 * -fVar291;
            auVar75._20_4_ = fVar323;
            fVar324 = fVar154 * fVar264 * -fVar325;
            auVar75._24_4_ = fVar324;
            auVar75._28_4_ = -fVar331;
            local_6e0._4_4_ = auVar208._4_4_ + fVar319;
            local_6e0._0_4_ = auVar208._0_4_ + fVar315;
            uStack_6d8._0_4_ = auVar208._8_4_ + fVar320;
            uStack_6d8._4_4_ = auVar208._12_4_ + fVar321;
            auStack_6d0._0_4_ = auVar208._16_4_ + fVar322;
            auStack_6d0._4_4_ = auVar208._20_4_ + fVar323;
            fStack_6c8 = auVar208._24_4_ + fVar324;
            fStack_6c4 = auVar208._28_4_ + -fVar331;
            fVar315 = fVar191 * 0.0 * fVar136;
            fVar319 = fVar193 * 0.0 * fVar149;
            auVar76._4_4_ = fVar319;
            auVar76._0_4_ = fVar315;
            fVar320 = fVar194 * 0.0 * fVar150;
            auVar76._8_4_ = fVar320;
            fVar321 = fVar223 * 0.0 * fVar151;
            auVar76._12_4_ = fVar321;
            fVar322 = fVar234 * 0.0 * fVar152;
            auVar76._16_4_ = fVar322;
            fVar323 = fVar236 * 0.0 * fVar153;
            auVar76._20_4_ = fVar323;
            fVar324 = fVar264 * 0.0 * fVar154;
            auVar76._24_4_ = fVar324;
            auVar76._28_4_ = fVar331;
            auVar39 = vsubps_avx(local_800,auVar74);
            auVar343._0_4_ = fVar315 + auVar146._0_4_;
            auVar343._4_4_ = fVar319 + auVar146._4_4_;
            auVar343._8_4_ = fVar320 + auVar146._8_4_;
            auVar343._12_4_ = fVar321 + auVar146._12_4_;
            auVar343._16_4_ = fVar322 + auVar146._16_4_;
            auVar343._20_4_ = fVar323 + auVar146._20_4_;
            auVar343._24_4_ = fVar324 + auVar146._24_4_;
            auVar343._28_4_ = fVar331 + auVar146._28_4_;
            fVar315 = auVar339._0_4_ * fVar255 * fVar213;
            fVar213 = auVar339._4_4_ * fVar293 * fVar217;
            auVar77._4_4_ = fVar213;
            auVar77._0_4_ = fVar315;
            fVar319 = auVar339._8_4_ * fVar295 * fVar220;
            auVar77._8_4_ = fVar319;
            fVar217 = auVar339._12_4_ * fVar195 * fVar240;
            auVar77._12_4_ = fVar217;
            fVar320 = auVar339._16_4_ * fVar239 * fVar212;
            auVar77._16_4_ = fVar320;
            fVar220 = auVar339._20_4_ * fVar188 * fVar216;
            auVar77._20_4_ = fVar220;
            fVar321 = auVar339._24_4_ * fVar190 * fVar219;
            auVar77._24_4_ = fVar321;
            auVar77._28_4_ = fVar155;
            auVar32 = vsubps_avx(auVar208,auVar75);
            auVar334._0_4_ = (float)local_760._0_4_ + fVar315;
            auVar334._4_4_ = local_760._4_4_ + fVar213;
            auVar334._8_4_ = local_760._8_4_ + fVar319;
            auVar334._12_4_ = local_760._12_4_ + fVar217;
            auVar334._16_4_ = local_760._16_4_ + fVar320;
            auVar334._20_4_ = local_760._20_4_ + fVar220;
            auVar334._24_4_ = local_760._24_4_ + fVar321;
            auVar334._28_4_ = local_760._28_4_ + fVar155;
            fVar315 = fVar255 * -fVar221 * auVar339._0_4_;
            fVar213 = fVar293 * -fVar292 * auVar339._4_4_;
            auVar78._4_4_ = fVar213;
            auVar78._0_4_ = fVar315;
            fVar319 = fVar295 * -fVar294 * auVar339._8_4_;
            auVar78._8_4_ = fVar319;
            fVar217 = fVar195 * -fVar157 * auVar339._12_4_;
            auVar78._12_4_ = fVar217;
            fVar320 = fVar239 * -fVar174 * auVar339._16_4_;
            auVar78._16_4_ = fVar320;
            fVar220 = fVar188 * -fVar177 * auVar339._20_4_;
            auVar78._20_4_ = fVar220;
            fVar321 = fVar190 * -fVar189 * auVar339._24_4_;
            auVar78._24_4_ = fVar321;
            auVar78._28_4_ = local_800._28_4_;
            auVar33 = vsubps_avx(auVar146,auVar76);
            auVar231._0_4_ = auVar249._0_4_ + fVar315;
            auVar231._4_4_ = auVar249._4_4_ + fVar213;
            auVar231._8_4_ = auVar249._8_4_ + fVar319;
            auVar231._12_4_ = auVar249._12_4_ + fVar217;
            auVar231._16_4_ = auVar249._16_4_ + fVar320;
            auVar231._20_4_ = auVar249._20_4_ + fVar220;
            auVar231._24_4_ = auVar249._24_4_ + fVar321;
            auVar231._28_4_ = auVar249._28_4_ + local_800._28_4_;
            fVar315 = fVar255 * 0.0 * auVar339._0_4_;
            fVar213 = fVar293 * 0.0 * auVar339._4_4_;
            auVar79._4_4_ = fVar213;
            auVar79._0_4_ = fVar315;
            fVar319 = fVar295 * 0.0 * auVar339._8_4_;
            auVar79._8_4_ = fVar319;
            fVar217 = fVar195 * 0.0 * auVar339._12_4_;
            auVar79._12_4_ = fVar217;
            fVar320 = fVar239 * 0.0 * auVar339._16_4_;
            auVar79._16_4_ = fVar320;
            fVar220 = fVar188 * 0.0 * auVar339._20_4_;
            auVar79._20_4_ = fVar220;
            fVar321 = fVar190 * 0.0 * auVar339._24_4_;
            auVar79._24_4_ = fVar321;
            auVar79._28_4_ = auVar146._28_4_;
            auVar203 = vsubps_avx(local_760,auVar77);
            auVar301._0_4_ = (float)local_720._0_4_ + fVar315;
            auVar301._4_4_ = (float)local_720._4_4_ + fVar213;
            auVar301._8_4_ = (float)uStack_718 + fVar319;
            auVar301._12_4_ = uStack_718._4_4_ + fVar217;
            auVar301._16_4_ = fStack_710 + fVar320;
            auVar301._20_4_ = fStack_70c + fVar220;
            auVar301._24_4_ = fStack_708 + fVar321;
            auVar301._28_4_ = fStack_704 + auVar146._28_4_;
            auVar204 = vsubps_avx(auVar249,auVar78);
            auVar228 = vsubps_avx(_local_720,auVar79);
            auVar288 = vsubps_avx(auVar231,auVar32);
            auVar298 = vsubps_avx(auVar301,auVar33);
            auVar80._4_4_ = auVar33._4_4_ * auVar288._4_4_;
            auVar80._0_4_ = auVar33._0_4_ * auVar288._0_4_;
            auVar80._8_4_ = auVar33._8_4_ * auVar288._8_4_;
            auVar80._12_4_ = auVar33._12_4_ * auVar288._12_4_;
            auVar80._16_4_ = auVar33._16_4_ * auVar288._16_4_;
            auVar80._20_4_ = auVar33._20_4_ * auVar288._20_4_;
            auVar80._24_4_ = auVar33._24_4_ * auVar288._24_4_;
            auVar80._28_4_ = auVar329._28_4_;
            auVar81._4_4_ = auVar32._4_4_ * auVar298._4_4_;
            auVar81._0_4_ = auVar32._0_4_ * auVar298._0_4_;
            auVar81._8_4_ = auVar32._8_4_ * auVar298._8_4_;
            auVar81._12_4_ = auVar32._12_4_ * auVar298._12_4_;
            auVar81._16_4_ = auVar32._16_4_ * auVar298._16_4_;
            auVar81._20_4_ = auVar32._20_4_ * auVar298._20_4_;
            auVar81._24_4_ = auVar32._24_4_ * auVar298._24_4_;
            auVar81._28_4_ = fStack_704;
            auVar34 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar39._4_4_ * auVar298._4_4_;
            auVar82._0_4_ = auVar39._0_4_ * auVar298._0_4_;
            auVar82._8_4_ = auVar39._8_4_ * auVar298._8_4_;
            auVar82._12_4_ = auVar39._12_4_ * auVar298._12_4_;
            auVar82._16_4_ = auVar39._16_4_ * auVar298._16_4_;
            auVar82._20_4_ = auVar39._20_4_ * auVar298._20_4_;
            auVar82._24_4_ = auVar39._24_4_ * auVar298._24_4_;
            auVar82._28_4_ = auVar298._28_4_;
            auVar298 = vsubps_avx(auVar334,auVar39);
            auVar83._4_4_ = auVar33._4_4_ * auVar298._4_4_;
            auVar83._0_4_ = auVar33._0_4_ * auVar298._0_4_;
            auVar83._8_4_ = auVar33._8_4_ * auVar298._8_4_;
            auVar83._12_4_ = auVar33._12_4_ * auVar298._12_4_;
            auVar83._16_4_ = auVar33._16_4_ * auVar298._16_4_;
            auVar83._20_4_ = auVar33._20_4_ * auVar298._20_4_;
            auVar83._24_4_ = auVar33._24_4_ * auVar298._24_4_;
            auVar83._28_4_ = auVar172._28_4_;
            auVar35 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar32._4_4_ * auVar298._4_4_;
            auVar84._0_4_ = auVar32._0_4_ * auVar298._0_4_;
            auVar84._8_4_ = auVar32._8_4_ * auVar298._8_4_;
            auVar84._12_4_ = auVar32._12_4_ * auVar298._12_4_;
            auVar84._16_4_ = auVar32._16_4_ * auVar298._16_4_;
            auVar84._20_4_ = auVar32._20_4_ * auVar298._20_4_;
            auVar84._24_4_ = auVar32._24_4_ * auVar298._24_4_;
            auVar84._28_4_ = auVar172._28_4_;
            auVar85._4_4_ = auVar39._4_4_ * auVar288._4_4_;
            auVar85._0_4_ = auVar39._0_4_ * auVar288._0_4_;
            auVar85._8_4_ = auVar39._8_4_ * auVar288._8_4_;
            auVar85._12_4_ = auVar39._12_4_ * auVar288._12_4_;
            auVar85._16_4_ = auVar39._16_4_ * auVar288._16_4_;
            auVar85._20_4_ = auVar39._20_4_ * auVar288._20_4_;
            auVar85._24_4_ = auVar39._24_4_ * auVar288._24_4_;
            auVar85._28_4_ = auVar288._28_4_;
            auVar172 = vsubps_avx(auVar85,auVar84);
            auVar170._0_4_ = auVar34._0_4_ * 0.0 + auVar172._0_4_ + auVar35._0_4_ * 0.0;
            auVar170._4_4_ = auVar34._4_4_ * 0.0 + auVar172._4_4_ + auVar35._4_4_ * 0.0;
            auVar170._8_4_ = auVar34._8_4_ * 0.0 + auVar172._8_4_ + auVar35._8_4_ * 0.0;
            auVar170._12_4_ = auVar34._12_4_ * 0.0 + auVar172._12_4_ + auVar35._12_4_ * 0.0;
            auVar170._16_4_ = auVar34._16_4_ * 0.0 + auVar172._16_4_ + auVar35._16_4_ * 0.0;
            auVar170._20_4_ = auVar34._20_4_ * 0.0 + auVar172._20_4_ + auVar35._20_4_ * 0.0;
            auVar170._24_4_ = auVar34._24_4_ * 0.0 + auVar172._24_4_ + auVar35._24_4_ * 0.0;
            auVar170._28_4_ = auVar34._28_4_ + auVar172._28_4_ + auVar35._28_4_;
            auVar22 = vcmpps_avx(auVar170,ZEXT832(0) << 0x20,2);
            auVar172 = vblendvps_avx(auVar203,_local_7c0,auVar22);
            auVar210 = ZEXT3264(auVar172);
            auVar203 = vblendvps_avx(auVar204,_local_6e0,auVar22);
            auVar204 = vblendvps_avx(auVar228,auVar343,auVar22);
            auVar228 = vblendvps_avx(auVar39,auVar334,auVar22);
            auVar288 = vblendvps_avx(auVar32,auVar231,auVar22);
            auVar298 = vblendvps_avx(auVar33,auVar301,auVar22);
            auVar34 = vblendvps_avx(auVar334,auVar39,auVar22);
            auVar35 = vblendvps_avx(auVar231,auVar32,auVar22);
            auVar21 = vblendvps_avx(auVar301,auVar33,auVar22);
            auVar39 = vandps_avx(auVar248,auVar209);
            auVar34 = vsubps_avx(auVar34,auVar172);
            auVar36 = vsubps_avx(auVar35,auVar203);
            auVar21 = vsubps_avx(auVar21,auVar204);
            auVar37 = vsubps_avx(auVar203,auVar288);
            fVar315 = auVar36._0_4_;
            fVar265 = auVar204._0_4_;
            fVar240 = auVar36._4_4_;
            fVar275 = auVar204._4_4_;
            auVar86._4_4_ = fVar275 * fVar240;
            auVar86._0_4_ = fVar265 * fVar315;
            fVar221 = auVar36._8_4_;
            fVar277 = auVar204._8_4_;
            auVar86._8_4_ = fVar277 * fVar221;
            fVar195 = auVar36._12_4_;
            fVar279 = auVar204._12_4_;
            auVar86._12_4_ = fVar279 * fVar195;
            fVar191 = auVar36._16_4_;
            fVar280 = auVar204._16_4_;
            auVar86._16_4_ = fVar280 * fVar191;
            fVar274 = auVar36._20_4_;
            fVar281 = auVar204._20_4_;
            auVar86._20_4_ = fVar281 * fVar274;
            fVar331 = auVar36._24_4_;
            fVar282 = auVar204._24_4_;
            auVar86._24_4_ = fVar282 * fVar331;
            auVar86._28_4_ = auVar35._28_4_;
            fVar213 = auVar203._0_4_;
            fVar296 = auVar21._0_4_;
            fVar322 = auVar203._4_4_;
            fVar303 = auVar21._4_4_;
            auVar87._4_4_ = fVar303 * fVar322;
            auVar87._0_4_ = fVar296 * fVar213;
            fVar255 = auVar203._8_4_;
            fVar304 = auVar21._8_4_;
            auVar87._8_4_ = fVar304 * fVar255;
            fVar174 = auVar203._12_4_;
            fVar305 = auVar21._12_4_;
            auVar87._12_4_ = fVar305 * fVar174;
            fVar193 = auVar203._16_4_;
            fVar306 = auVar21._16_4_;
            auVar87._16_4_ = fVar306 * fVar193;
            fVar276 = auVar203._20_4_;
            fVar307 = auVar21._20_4_;
            auVar87._20_4_ = fVar307 * fVar276;
            fVar156 = auVar203._24_4_;
            fVar308 = auVar21._24_4_;
            uVar284 = auVar32._28_4_;
            auVar87._24_4_ = fVar308 * fVar156;
            auVar87._28_4_ = uVar284;
            auVar35 = vsubps_avx(auVar87,auVar86);
            fVar319 = auVar172._0_4_;
            fVar212 = auVar172._4_4_;
            auVar88._4_4_ = fVar303 * fVar212;
            auVar88._0_4_ = fVar296 * fVar319;
            fVar292 = auVar172._8_4_;
            auVar88._8_4_ = fVar304 * fVar292;
            fVar239 = auVar172._12_4_;
            auVar88._12_4_ = fVar305 * fVar239;
            fVar194 = auVar172._16_4_;
            auVar88._16_4_ = fVar306 * fVar194;
            fVar278 = auVar172._20_4_;
            auVar88._20_4_ = fVar307 * fVar278;
            fVar176 = auVar172._24_4_;
            auVar88._24_4_ = fVar308 * fVar176;
            auVar88._28_4_ = uVar284;
            fVar217 = auVar34._0_4_;
            fVar323 = auVar34._4_4_;
            auVar89._4_4_ = fVar275 * fVar323;
            auVar89._0_4_ = fVar265 * fVar217;
            fVar293 = auVar34._8_4_;
            auVar89._8_4_ = fVar277 * fVar293;
            fVar177 = auVar34._12_4_;
            auVar89._12_4_ = fVar279 * fVar177;
            fVar223 = auVar34._16_4_;
            auVar89._16_4_ = fVar280 * fVar223;
            fVar238 = auVar34._20_4_;
            auVar89._20_4_ = fVar281 * fVar238;
            fVar263 = auVar34._24_4_;
            auVar89._24_4_ = fVar282 * fVar263;
            auVar89._28_4_ = auVar334._28_4_;
            auVar32 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar322 * fVar323;
            auVar90._0_4_ = fVar213 * fVar217;
            auVar90._8_4_ = fVar255 * fVar293;
            auVar90._12_4_ = fVar174 * fVar177;
            auVar90._16_4_ = fVar193 * fVar223;
            auVar90._20_4_ = fVar276 * fVar238;
            auVar90._24_4_ = fVar156 * fVar263;
            auVar90._28_4_ = uVar284;
            auVar91._4_4_ = fVar212 * fVar240;
            auVar91._0_4_ = fVar319 * fVar315;
            auVar91._8_4_ = fVar292 * fVar221;
            auVar91._12_4_ = fVar239 * fVar195;
            auVar91._16_4_ = fVar194 * fVar191;
            auVar91._20_4_ = fVar278 * fVar274;
            auVar91._24_4_ = fVar176 * fVar331;
            auVar91._28_4_ = auVar33._28_4_;
            auVar33 = vsubps_avx(auVar91,auVar90);
            auVar38 = vsubps_avx(auVar204,auVar298);
            fVar220 = auVar33._28_4_ + auVar32._28_4_;
            local_800._0_4_ = auVar33._0_4_ + auVar32._0_4_ * 0.0 + auVar35._0_4_ * 0.0;
            local_800._4_4_ = auVar33._4_4_ + auVar32._4_4_ * 0.0 + auVar35._4_4_ * 0.0;
            local_800._8_4_ = auVar33._8_4_ + auVar32._8_4_ * 0.0 + auVar35._8_4_ * 0.0;
            local_800._12_4_ = auVar33._12_4_ + auVar32._12_4_ * 0.0 + auVar35._12_4_ * 0.0;
            local_800._16_4_ = auVar33._16_4_ + auVar32._16_4_ * 0.0 + auVar35._16_4_ * 0.0;
            local_800._20_4_ = auVar33._20_4_ + auVar32._20_4_ * 0.0 + auVar35._20_4_ * 0.0;
            local_800._24_4_ = auVar33._24_4_ + auVar32._24_4_ * 0.0 + auVar35._24_4_ * 0.0;
            local_800._28_4_ = fVar220 + auVar35._28_4_;
            fVar320 = auVar37._0_4_;
            fVar216 = auVar37._4_4_;
            auVar92._4_4_ = auVar298._4_4_ * fVar216;
            auVar92._0_4_ = auVar298._0_4_ * fVar320;
            fVar294 = auVar37._8_4_;
            auVar92._8_4_ = auVar298._8_4_ * fVar294;
            fVar188 = auVar37._12_4_;
            auVar92._12_4_ = auVar298._12_4_ * fVar188;
            fVar234 = auVar37._16_4_;
            auVar92._16_4_ = auVar298._16_4_ * fVar234;
            fVar283 = auVar37._20_4_;
            auVar92._20_4_ = auVar298._20_4_ * fVar283;
            fVar335 = auVar37._24_4_;
            auVar92._24_4_ = auVar298._24_4_ * fVar335;
            auVar92._28_4_ = fVar220;
            fVar220 = auVar38._0_4_;
            fVar324 = auVar38._4_4_;
            auVar93._4_4_ = auVar288._4_4_ * fVar324;
            auVar93._0_4_ = auVar288._0_4_ * fVar220;
            fVar295 = auVar38._8_4_;
            auVar93._8_4_ = auVar288._8_4_ * fVar295;
            fVar189 = auVar38._12_4_;
            auVar93._12_4_ = auVar288._12_4_ * fVar189;
            fVar236 = auVar38._16_4_;
            auVar93._16_4_ = auVar288._16_4_ * fVar236;
            fVar291 = auVar38._20_4_;
            auVar93._20_4_ = auVar288._20_4_ * fVar291;
            fVar336 = auVar38._24_4_;
            auVar93._24_4_ = auVar288._24_4_ * fVar336;
            auVar93._28_4_ = auVar33._28_4_;
            auVar32 = vsubps_avx(auVar93,auVar92);
            auVar33 = vsubps_avx(auVar172,auVar228);
            fVar321 = auVar33._0_4_;
            fVar219 = auVar33._4_4_;
            auVar94._4_4_ = auVar298._4_4_ * fVar219;
            auVar94._0_4_ = auVar298._0_4_ * fVar321;
            fVar157 = auVar33._8_4_;
            auVar94._8_4_ = auVar298._8_4_ * fVar157;
            fVar190 = auVar33._12_4_;
            auVar94._12_4_ = auVar298._12_4_ * fVar190;
            fVar264 = auVar33._16_4_;
            auVar94._16_4_ = auVar298._16_4_ * fVar264;
            fVar325 = auVar33._20_4_;
            auVar94._20_4_ = auVar298._20_4_ * fVar325;
            fVar337 = auVar33._24_4_;
            auVar94._24_4_ = auVar298._24_4_ * fVar337;
            auVar94._28_4_ = auVar298._28_4_;
            auVar95._4_4_ = fVar324 * auVar228._4_4_;
            auVar95._0_4_ = fVar220 * auVar228._0_4_;
            auVar95._8_4_ = fVar295 * auVar228._8_4_;
            auVar95._12_4_ = fVar189 * auVar228._12_4_;
            auVar95._16_4_ = fVar236 * auVar228._16_4_;
            auVar95._20_4_ = fVar291 * auVar228._20_4_;
            auVar95._24_4_ = fVar336 * auVar228._24_4_;
            auVar95._28_4_ = auVar35._28_4_;
            auVar298 = vsubps_avx(auVar94,auVar95);
            auVar96._4_4_ = auVar288._4_4_ * fVar219;
            auVar96._0_4_ = auVar288._0_4_ * fVar321;
            auVar96._8_4_ = auVar288._8_4_ * fVar157;
            auVar96._12_4_ = auVar288._12_4_ * fVar190;
            auVar96._16_4_ = auVar288._16_4_ * fVar264;
            auVar96._20_4_ = auVar288._20_4_ * fVar325;
            auVar96._24_4_ = auVar288._24_4_ * fVar337;
            auVar96._28_4_ = auVar288._28_4_;
            auVar97._4_4_ = fVar216 * auVar228._4_4_;
            auVar97._0_4_ = fVar320 * auVar228._0_4_;
            auVar97._8_4_ = fVar294 * auVar228._8_4_;
            auVar97._12_4_ = fVar188 * auVar228._12_4_;
            auVar97._16_4_ = fVar234 * auVar228._16_4_;
            auVar97._20_4_ = fVar283 * auVar228._20_4_;
            auVar97._24_4_ = fVar335 * auVar228._24_4_;
            auVar97._28_4_ = auVar228._28_4_;
            auVar228 = vsubps_avx(auVar97,auVar96);
            auVar147._0_4_ = auVar32._0_4_ * 0.0 + auVar228._0_4_ + auVar298._0_4_ * 0.0;
            auVar147._4_4_ = auVar32._4_4_ * 0.0 + auVar228._4_4_ + auVar298._4_4_ * 0.0;
            auVar147._8_4_ = auVar32._8_4_ * 0.0 + auVar228._8_4_ + auVar298._8_4_ * 0.0;
            auVar147._12_4_ = auVar32._12_4_ * 0.0 + auVar228._12_4_ + auVar298._12_4_ * 0.0;
            auVar147._16_4_ = auVar32._16_4_ * 0.0 + auVar228._16_4_ + auVar298._16_4_ * 0.0;
            auVar147._20_4_ = auVar32._20_4_ * 0.0 + auVar228._20_4_ + auVar298._20_4_ * 0.0;
            auVar147._24_4_ = auVar32._24_4_ * 0.0 + auVar228._24_4_ + auVar298._24_4_ * 0.0;
            auVar147._28_4_ = auVar298._28_4_ + auVar228._28_4_ + auVar298._28_4_;
            auVar148 = ZEXT3264(auVar147);
            auVar228 = vmaxps_avx(local_800,auVar147);
            auVar228 = vcmpps_avx(auVar228,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar288 = auVar39 & auVar228;
            if ((((((((auVar288 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar288 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar288 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar288 >> 0x7f,0) == '\0') &&
                  (auVar288 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar288 >> 0xbf,0) == '\0') &&
                (auVar288 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar288[0x1f]) {
LAB_01021c37:
              auVar173 = ZEXT3264(CONCAT824(uStack_508,
                                            CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
              auVar290._4_4_ = fVar149;
              auVar290._0_4_ = fVar136;
              auVar290._8_4_ = fVar150;
              auVar290._12_4_ = fVar151;
              auVar290._16_4_ = fVar152;
              auVar290._20_4_ = fVar153;
              auVar290._24_4_ = fVar154;
              auVar290._28_4_ = fVar155;
            }
            else {
              auVar288 = vandps_avx(auVar228,auVar39);
              auVar98._4_4_ = fVar324 * fVar240;
              auVar98._0_4_ = fVar220 * fVar315;
              auVar98._8_4_ = fVar295 * fVar221;
              auVar98._12_4_ = fVar189 * fVar195;
              auVar98._16_4_ = fVar236 * fVar191;
              auVar98._20_4_ = fVar291 * fVar274;
              auVar98._24_4_ = fVar336 * fVar331;
              auVar98._28_4_ = auVar39._28_4_;
              auVar99._4_4_ = fVar216 * fVar303;
              auVar99._0_4_ = fVar320 * fVar296;
              auVar99._8_4_ = fVar294 * fVar304;
              auVar99._12_4_ = fVar188 * fVar305;
              auVar99._16_4_ = fVar234 * fVar306;
              auVar99._20_4_ = fVar283 * fVar307;
              auVar99._24_4_ = fVar335 * fVar308;
              auVar99._28_4_ = auVar228._28_4_;
              auVar298 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar219 * fVar303;
              auVar100._0_4_ = fVar321 * fVar296;
              auVar100._8_4_ = fVar157 * fVar304;
              auVar100._12_4_ = fVar190 * fVar305;
              auVar100._16_4_ = fVar264 * fVar306;
              auVar100._20_4_ = fVar325 * fVar307;
              auVar100._24_4_ = fVar337 * fVar308;
              auVar100._28_4_ = auVar21._28_4_;
              auVar101._4_4_ = fVar324 * fVar323;
              auVar101._0_4_ = fVar220 * fVar217;
              auVar101._8_4_ = fVar295 * fVar293;
              auVar101._12_4_ = fVar189 * fVar177;
              auVar101._16_4_ = fVar236 * fVar223;
              auVar101._20_4_ = fVar291 * fVar238;
              auVar101._24_4_ = fVar336 * fVar263;
              auVar101._28_4_ = auVar38._28_4_;
              auVar35 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar216 * fVar323;
              auVar102._0_4_ = fVar320 * fVar217;
              auVar102._8_4_ = fVar294 * fVar293;
              auVar102._12_4_ = fVar188 * fVar177;
              auVar102._16_4_ = fVar234 * fVar223;
              auVar102._20_4_ = fVar283 * fVar238;
              auVar102._24_4_ = fVar335 * fVar263;
              auVar102._28_4_ = auVar34._28_4_;
              auVar103._4_4_ = fVar219 * fVar240;
              auVar103._0_4_ = fVar321 * fVar315;
              auVar103._8_4_ = fVar157 * fVar221;
              auVar103._12_4_ = fVar190 * fVar195;
              auVar103._16_4_ = fVar264 * fVar191;
              auVar103._20_4_ = fVar325 * fVar274;
              auVar103._24_4_ = fVar337 * fVar331;
              auVar103._28_4_ = auVar36._28_4_;
              auVar21 = vsubps_avx(auVar103,auVar102);
              auVar171._0_4_ = auVar298._0_4_ * 0.0 + auVar21._0_4_ + auVar35._0_4_ * 0.0;
              auVar171._4_4_ = auVar298._4_4_ * 0.0 + auVar21._4_4_ + auVar35._4_4_ * 0.0;
              auVar171._8_4_ = auVar298._8_4_ * 0.0 + auVar21._8_4_ + auVar35._8_4_ * 0.0;
              auVar171._12_4_ = auVar298._12_4_ * 0.0 + auVar21._12_4_ + auVar35._12_4_ * 0.0;
              auVar171._16_4_ = auVar298._16_4_ * 0.0 + auVar21._16_4_ + auVar35._16_4_ * 0.0;
              auVar171._20_4_ = auVar298._20_4_ * 0.0 + auVar21._20_4_ + auVar35._20_4_ * 0.0;
              auVar171._24_4_ = auVar298._24_4_ * 0.0 + auVar21._24_4_ + auVar35._24_4_ * 0.0;
              auVar171._28_4_ = auVar36._28_4_ + auVar21._28_4_ + auVar34._28_4_;
              auVar228 = vrcpps_avx(auVar171);
              fVar315 = auVar228._0_4_;
              fVar217 = auVar228._4_4_;
              auVar104._4_4_ = auVar171._4_4_ * fVar217;
              auVar104._0_4_ = auVar171._0_4_ * fVar315;
              fVar320 = auVar228._8_4_;
              auVar104._8_4_ = auVar171._8_4_ * fVar320;
              fVar220 = auVar228._12_4_;
              auVar104._12_4_ = auVar171._12_4_ * fVar220;
              fVar321 = auVar228._16_4_;
              auVar104._16_4_ = auVar171._16_4_ * fVar321;
              fVar240 = auVar228._20_4_;
              auVar104._20_4_ = auVar171._20_4_ * fVar240;
              fVar323 = auVar228._24_4_;
              auVar104._24_4_ = auVar171._24_4_ * fVar323;
              auVar104._28_4_ = auVar38._28_4_;
              auVar330._8_4_ = 0x3f800000;
              auVar330._0_8_ = &DAT_3f8000003f800000;
              auVar330._12_4_ = 0x3f800000;
              auVar330._16_4_ = 0x3f800000;
              auVar330._20_4_ = 0x3f800000;
              auVar330._24_4_ = 0x3f800000;
              auVar330._28_4_ = 0x3f800000;
              auVar228 = vsubps_avx(auVar330,auVar104);
              fVar315 = auVar228._0_4_ * fVar315 + fVar315;
              fVar217 = auVar228._4_4_ * fVar217 + fVar217;
              fVar320 = auVar228._8_4_ * fVar320 + fVar320;
              fVar220 = auVar228._12_4_ * fVar220 + fVar220;
              fVar321 = auVar228._16_4_ * fVar321 + fVar321;
              fVar240 = auVar228._20_4_ * fVar240 + fVar240;
              fVar323 = auVar228._24_4_ * fVar323 + fVar323;
              auVar105._4_4_ =
                   (fVar212 * auVar298._4_4_ + auVar35._4_4_ * fVar322 + auVar21._4_4_ * fVar275) *
                   fVar217;
              auVar105._0_4_ =
                   (fVar319 * auVar298._0_4_ + auVar35._0_4_ * fVar213 + auVar21._0_4_ * fVar265) *
                   fVar315;
              auVar105._8_4_ =
                   (fVar292 * auVar298._8_4_ + auVar35._8_4_ * fVar255 + auVar21._8_4_ * fVar277) *
                   fVar320;
              auVar105._12_4_ =
                   (fVar239 * auVar298._12_4_ + auVar35._12_4_ * fVar174 + auVar21._12_4_ * fVar279)
                   * fVar220;
              auVar105._16_4_ =
                   (fVar194 * auVar298._16_4_ + auVar35._16_4_ * fVar193 + auVar21._16_4_ * fVar280)
                   * fVar321;
              auVar105._20_4_ =
                   (fVar278 * auVar298._20_4_ + auVar35._20_4_ * fVar276 + auVar21._20_4_ * fVar281)
                   * fVar240;
              auVar105._24_4_ =
                   (fVar176 * auVar298._24_4_ + auVar35._24_4_ * fVar156 + auVar21._24_4_ * fVar282)
                   * fVar323;
              auVar105._28_4_ = auVar172._28_4_ + auVar203._28_4_ + auVar204._28_4_;
              auVar210 = ZEXT3264(auVar105);
              uVar284 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar232._4_4_ = uVar284;
              auVar232._0_4_ = uVar284;
              auVar232._8_4_ = uVar284;
              auVar232._12_4_ = uVar284;
              auVar232._16_4_ = uVar284;
              auVar232._20_4_ = uVar284;
              auVar232._24_4_ = uVar284;
              auVar232._28_4_ = uVar284;
              auVar172 = vcmpps_avx(local_100,auVar105,2);
              auVar203 = vcmpps_avx(auVar105,auVar232,2);
              auVar172 = vandps_avx(auVar172,auVar203);
              auVar204 = auVar288 & auVar172;
              if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar204 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar204 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar204 >> 0x7f,0) == '\0') &&
                    (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar204 >> 0xbf,0) == '\0') &&
                  (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar204[0x1f]) goto LAB_01021c37;
              auVar172 = vandps_avx(auVar288,auVar172);
              auVar204 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar171,4);
              auVar228 = auVar172 & auVar204;
              auVar173 = ZEXT3264(CONCAT824(uStack_508,
                                            CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
              auVar290._4_4_ = fVar149;
              auVar290._0_4_ = fVar136;
              auVar290._8_4_ = fVar150;
              auVar290._12_4_ = fVar151;
              auVar290._16_4_ = fVar152;
              auVar290._20_4_ = fVar153;
              auVar290._24_4_ = fVar154;
              auVar290._28_4_ = fVar155;
              if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar228 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar228 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar228 >> 0x7f,0) != '\0') ||
                    (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar228 >> 0xbf,0) != '\0') ||
                  (auVar228 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar228[0x1f] < '\0') {
                auVar172 = vandps_avx(auVar204,auVar172);
                auVar173 = ZEXT3264(auVar172);
                auVar106._4_4_ = fVar217 * local_800._4_4_;
                auVar106._0_4_ = fVar315 * local_800._0_4_;
                auVar106._8_4_ = fVar320 * local_800._8_4_;
                auVar106._12_4_ = fVar220 * local_800._12_4_;
                auVar106._16_4_ = fVar321 * local_800._16_4_;
                auVar106._20_4_ = fVar240 * local_800._20_4_;
                auVar106._24_4_ = fVar323 * local_800._24_4_;
                auVar106._28_4_ = auVar203._28_4_;
                auVar107._4_4_ = auVar147._4_4_ * fVar217;
                auVar107._0_4_ = auVar147._0_4_ * fVar315;
                auVar107._8_4_ = auVar147._8_4_ * fVar320;
                auVar107._12_4_ = auVar147._12_4_ * fVar220;
                auVar107._16_4_ = auVar147._16_4_ * fVar321;
                auVar107._20_4_ = auVar147._20_4_ * fVar240;
                auVar107._24_4_ = auVar147._24_4_ * fVar323;
                auVar107._28_4_ = auVar147._28_4_;
                auVar262._8_4_ = 0x3f800000;
                auVar262._0_8_ = &DAT_3f8000003f800000;
                auVar262._12_4_ = 0x3f800000;
                auVar262._16_4_ = 0x3f800000;
                auVar262._20_4_ = 0x3f800000;
                auVar262._24_4_ = 0x3f800000;
                auVar262._28_4_ = 0x3f800000;
                auVar172 = vsubps_avx(auVar262,auVar106);
                local_1a0 = vblendvps_avx(auVar172,auVar106,auVar22);
                auVar172 = vsubps_avx(auVar262,auVar107);
                _local_3e0 = vblendvps_avx(auVar172,auVar107,auVar22);
                auVar148 = ZEXT3264(_local_3e0);
                local_1c0 = auVar105;
              }
            }
            auVar318 = ZEXT3264(_local_7a0);
            auVar172 = auVar173._0_32_;
            local_4c0 = auVar31;
            if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar172 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar172 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar172 >> 0x7f,0) != '\0') ||
                  (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar172 >> 0xbf,0) != '\0') ||
                (auVar173 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar173[0x1f] < '\0') {
              auVar31 = vsubps_avx(auVar339,auVar290);
              auVar210 = ZEXT3264(local_1a0);
              fVar213 = auVar290._0_4_ + auVar31._0_4_ * local_1a0._0_4_;
              fVar319 = auVar290._4_4_ + auVar31._4_4_ * local_1a0._4_4_;
              fVar217 = auVar290._8_4_ + auVar31._8_4_ * local_1a0._8_4_;
              fVar320 = auVar290._12_4_ + auVar31._12_4_ * local_1a0._12_4_;
              fVar220 = auVar290._16_4_ + auVar31._16_4_ * local_1a0._16_4_;
              fVar321 = auVar290._20_4_ + auVar31._20_4_ * local_1a0._20_4_;
              fVar136 = auVar290._24_4_ + auVar31._24_4_ * local_1a0._24_4_;
              fVar149 = auVar290._28_4_ + auVar31._28_4_;
              fVar315 = *(float *)((long)local_698->ray_space + k * 4 + -0x10);
              auVar108._4_4_ = (fVar319 + fVar319) * fVar315;
              auVar108._0_4_ = (fVar213 + fVar213) * fVar315;
              auVar108._8_4_ = (fVar217 + fVar217) * fVar315;
              auVar108._12_4_ = (fVar320 + fVar320) * fVar315;
              auVar108._16_4_ = (fVar220 + fVar220) * fVar315;
              auVar108._20_4_ = (fVar321 + fVar321) * fVar315;
              auVar108._24_4_ = (fVar136 + fVar136) * fVar315;
              auVar108._28_4_ = fVar149 + fVar149;
              auVar31 = vcmpps_avx(local_1c0,auVar108,6);
              auVar148 = ZEXT3264(auVar31);
              auVar203 = auVar172 & auVar31;
              if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar203 >> 0x7f,0) != '\0') ||
                    (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar203 >> 0xbf,0) != '\0') ||
                  (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar203[0x1f] < '\0') {
                local_240 = vandps_avx(auVar31,auVar172);
                auVar148 = ZEXT3264(local_240);
                auVar162._0_8_ =
                     CONCAT44((float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0,
                              (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0);
                auVar162._8_4_ = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                auVar162._12_4_ = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                auVar166._16_4_ = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                auVar166._0_16_ = auVar162;
                auVar166._20_4_ = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                fStack_2c8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                _local_2e0 = auVar166;
                fStack_2c4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                auVar173 = ZEXT3264(_local_2e0);
                local_300 = local_1a0;
                local_2c0 = local_1c0;
                local_290 = local_6b0;
                uStack_288 = uStack_6a8;
                local_280 = local_540._0_8_;
                uStack_278 = local_540._8_8_;
                local_270 = local_4d0._0_8_;
                uStack_268 = local_4d0._8_8_;
                local_260 = local_4e0._0_8_;
                uStack_258 = local_4e0._8_8_;
                local_780._0_8_ = (context->scene->geometries).items[local_828].ptr;
                _local_3e0 = _local_2e0;
                if ((((Geometry *)local_780._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar128 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar128 = context->args;
                  if ((pRVar128->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar128 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar128 >> 8),1),
                     ((Geometry *)local_780._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_780._8_24_ = auVar249._8_24_;
                    local_7e0._4_28_ = auVar39._4_28_;
                    local_7e0._0_4_ = (int)uVar129;
                    auVar163._0_4_ = (float)(int)local_2a0;
                    auVar163._4_8_ = SUB128(ZEXT812(0),4);
                    auVar163._12_4_ = 0;
                    auVar243 = vshufps_avx(auVar163,auVar163,0);
                    local_220[0] = (auVar243._0_4_ + local_1a0._0_4_ + 0.0) * (float)local_120._0_4_
                    ;
                    local_220[1] = (auVar243._4_4_ + local_1a0._4_4_ + 1.0) * (float)local_120._4_4_
                    ;
                    local_220[2] = (auVar243._8_4_ + local_1a0._8_4_ + 2.0) * fStack_118;
                    local_220[3] = (auVar243._12_4_ + local_1a0._12_4_ + 3.0) * fStack_114;
                    fStack_210 = (auVar243._0_4_ + local_1a0._16_4_ + 4.0) * fStack_110;
                    fStack_20c = (auVar243._4_4_ + local_1a0._20_4_ + 5.0) * fStack_10c;
                    fStack_208 = (auVar243._8_4_ + local_1a0._24_4_ + 6.0) * fStack_108;
                    fStack_204 = auVar243._12_4_ + (float)local_1a0._28_4_ + 7.0;
                    uStack_3d8 = auVar162._8_8_;
                    uStack_3d0 = auVar166._16_8_;
                    uStack_3c8 = local_2e0._24_8_;
                    local_200 = auVar162._0_8_;
                    uStack_1f8 = uStack_3d8;
                    uStack_1f0 = uStack_3d0;
                    uStack_1e8 = uStack_3c8;
                    auVar173 = ZEXT3264(local_1c0);
                    local_1e0 = local_1c0;
                    iVar127 = vmovmskps_avx(local_240);
                    uVar129 = CONCAT44((int)((ulong)pRVar128 >> 0x20),iVar127);
                    lVar18 = 0;
                    if (uVar129 != 0) {
                      for (; (uVar129 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                      }
                    }
                    local_860 = (uint)lVar18;
                    uStack_85c = (undefined4)((ulong)lVar18 >> 0x20);
                    local_800._0_8_ = uVar129;
                    local_7c0._0_4_ = (int)CONCAT71((int7)(uVar129 >> 8),iVar127 != 0);
                    if (iVar127 != 0) {
                      _auStack_810 = auVar339._16_16_;
                      _local_820 = local_540;
                      _auStack_650 = auVar248._16_16_;
                      _local_660 = local_4d0;
                      _local_6e0 = local_4e0;
                      _auStack_6f0 = auVar181;
                      _local_700 = *local_6a0;
                      _local_740 = auVar30;
                      local_29c = uVar15;
                      do {
                        local_760._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        lVar18 = CONCAT44(uStack_85c,local_860);
                        local_440 = local_220[lVar18];
                        local_430 = *(undefined4 *)((long)&local_200 + lVar18 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1e0 + lVar18 * 4);
                        fVar175 = 1.0 - local_440;
                        fVar309 = local_440 * fVar175 * 4.0;
                        auVar243 = ZEXT416((uint)(local_440 * local_440 * 0.5));
                        auVar243 = vshufps_avx(auVar243,auVar243,0);
                        auVar181 = ZEXT416((uint)((fVar175 * fVar175 + fVar309) * 0.5));
                        auVar181 = vshufps_avx(auVar181,auVar181,0);
                        auVar227 = ZEXT416((uint)((-local_440 * local_440 - fVar309) * 0.5));
                        auVar227 = vshufps_avx(auVar227,auVar227,0);
                        local_690.context = context->user;
                        auVar202 = ZEXT416((uint)(fVar175 * -fVar175 * 0.5));
                        auVar202 = vshufps_avx(auVar202,auVar202,0);
                        auVar182._0_4_ =
                             auVar202._0_4_ * (float)local_6b0._0_4_ +
                             auVar227._0_4_ * (float)local_820._0_4_ +
                             auVar243._0_4_ * (float)local_6e0._0_4_ +
                             auVar181._0_4_ * (float)local_660._0_4_;
                        auVar182._4_4_ =
                             auVar202._4_4_ * (float)local_6b0._4_4_ +
                             auVar227._4_4_ * (float)local_820._4_4_ +
                             auVar243._4_4_ * (float)local_6e0._4_4_ +
                             auVar181._4_4_ * (float)local_660._4_4_;
                        auVar182._8_4_ =
                             auVar202._8_4_ * (float)uStack_6a8 +
                             auVar227._8_4_ * (float)uStack_818 +
                             auVar243._8_4_ * (float)uStack_6d8 + auVar181._8_4_ * (float)uStack_658
                        ;
                        auVar182._12_4_ =
                             auVar202._12_4_ * uStack_6a8._4_4_ +
                             auVar227._12_4_ * uStack_818._4_4_ +
                             auVar243._12_4_ * uStack_6d8._4_4_ + auVar181._12_4_ * uStack_658._4_4_
                        ;
                        local_470 = (RTCHitN  [16])vshufps_avx(auVar182,auVar182,0);
                        local_460 = vshufps_avx(auVar182,auVar182,0x55);
                        auVar210 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar182,auVar182,0xaa);
                        local_420 = local_5d0._0_8_;
                        uStack_418 = local_5d0._8_8_;
                        local_410 = local_320._0_8_;
                        uStack_408 = local_320._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3fc = (local_690.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_690.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_840 = local_700;
                        uStack_838 = uStack_6f8;
                        local_690.valid = (int *)&local_840;
                        local_690.geometryUserPtr = *(void **)(local_780._0_8_ + 0x18);
                        local_690.hit = local_470;
                        local_690.N = 4;
                        local_690.ray = (RTCRayN *)ray;
                        fStack_43c = local_440;
                        fStack_438 = local_440;
                        fStack_434 = local_440;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        if (*(code **)(local_780._0_8_ + 0x48) != (code *)0x0) {
                          auVar210 = ZEXT1664(local_460);
                          (**(code **)(local_780._0_8_ + 0x48))(&local_690);
                        }
                        auVar112._8_8_ = uStack_838;
                        auVar112._0_8_ = local_840;
                        if (auVar112 == (undefined1  [16])0x0) {
                          auVar243 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar243 = auVar243 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var19 = context->args->filter;
                          if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_780._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar210 = ZEXT1664(auVar210._0_16_);
                            (*p_Var19)(&local_690);
                          }
                          auVar113._8_8_ = uStack_838;
                          auVar113._0_8_ = local_840;
                          auVar181 = vpcmpeqd_avx((undefined1  [16])0x0,auVar113);
                          auVar243 = auVar181 ^ _DAT_01febe20;
                          auVar183._8_4_ = 0xff800000;
                          auVar183._0_8_ = 0xff800000ff800000;
                          auVar183._12_4_ = 0xff800000;
                          auVar181 = vblendvps_avx(auVar183,*(undefined1 (*) [16])
                                                             (local_690.ray + 0x80),auVar181);
                          *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar181;
                        }
                        auVar148 = ZEXT1664(auVar243);
                        auVar164._8_8_ = 0x100000001;
                        auVar164._0_8_ = 0x100000001;
                        auVar173 = ZEXT1664(auVar164);
                        if ((auVar164 & auVar243) != (undefined1  [16])0x0) break;
                        auVar148 = ZEXT464((uint)local_760._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_760._0_4_;
                        uVar129 = local_800._0_8_ ^ 1L << ((ulong)local_860 & 0x3f);
                        lVar18 = 0;
                        if (uVar129 != 0) {
                          for (; (uVar129 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                          }
                        }
                        local_860 = (uint)lVar18;
                        uStack_85c = (undefined4)((ulong)lVar18 >> 0x20);
                        local_800._0_8_ = uVar129;
                        local_7c0._0_4_ = (int)CONCAT71((int7)(uVar129 >> 8),uVar129 != 0);
                      } while (uVar129 != 0);
                    }
                    pRVar128 = (RTCIntersectArguments *)(ulong)(local_7c0[0] & 1);
                    auVar318 = ZEXT3264(_local_7a0);
                    uVar129 = (ulong)(uint)local_7e0._0_4_;
                  }
                }
                uVar129 = CONCAT71((int7)(uVar129 >> 8),(byte)uVar129 | (byte)pRVar128);
                fVar309 = (float)local_620._0_4_;
                fVar175 = (float)local_620._4_4_;
                fVar192 = fStack_618;
                fVar254 = fStack_614;
                fVar196 = fStack_610;
                fVar211 = fStack_60c;
                fVar214 = fStack_608;
                fVar215 = (float)local_5a0._0_4_;
                fVar222 = (float)local_5a0._4_4_;
                fVar233 = fStack_598;
                fVar235 = fStack_594;
                fVar237 = fStack_590;
                fVar241 = fStack_58c;
                fVar251 = fStack_588;
                fVar252 = (float)local_5c0._0_4_;
                fVar253 = (float)local_5c0._4_4_;
                fVar313 = fStack_5b8;
                fVar340 = fStack_5b4;
                fVar341 = fStack_5b0;
                fVar218 = fStack_5ac;
                fVar314 = fStack_5a8;
              }
            }
          }
          lVar135 = lVar135 + 8;
        } while ((int)lVar135 < (int)uVar15);
      }
      if ((uVar129 & 1) != 0) {
        return local_86d;
      }
      uVar284 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar140._4_4_ = uVar284;
      auVar140._0_4_ = uVar284;
      auVar140._8_4_ = uVar284;
      auVar140._12_4_ = uVar284;
      auVar243 = vcmpps_avx(local_310,auVar140,2);
      uVar130 = vmovmskps_avx(auVar243);
      uVar126 = uVar126 & uVar126 + 0xf & uVar130;
      local_86d = uVar126 != 0;
    } while (local_86d);
  }
  return local_86d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }